

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  Primitive PVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  __int_type_conflict _Var12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  ulong uVar118;
  RTCIntersectArguments *pRVar119;
  uint uVar120;
  ulong uVar121;
  long lVar122;
  long lVar123;
  ulong uVar124;
  Geometry *pGVar125;
  undefined4 uVar126;
  undefined8 unaff_R13;
  long lVar127;
  float fVar128;
  float fVar129;
  float fVar142;
  float fVar145;
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar143;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar144;
  float fVar147;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar172;
  undefined1 auVar166 [32];
  undefined1 auVar162 [16];
  float fVar173;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar174;
  float fVar188;
  float fVar189;
  vint4 bi_2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar191;
  undefined1 auVar186 [32];
  float fVar190;
  undefined1 auVar187 [32];
  float fVar192;
  float fVar204;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar205;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar195 [16];
  float fVar208;
  float fVar209;
  float fVar211;
  undefined1 auVar199 [32];
  float fVar207;
  float fVar210;
  float fVar212;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar223;
  float fVar224;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar225;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  vint4 bi_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar234;
  float fVar235;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar246;
  float fVar249;
  vint4 ai_2;
  undefined1 auVar239 [16];
  float fVar252;
  undefined1 auVar240 [16];
  float fVar247;
  float fVar250;
  float fVar253;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar248;
  float fVar251;
  float fVar254;
  undefined1 auVar245 [32];
  float fVar258;
  float fVar263;
  float fVar264;
  undefined1 auVar259 [16];
  float fVar265;
  undefined1 auVar260 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar262 [32];
  float fVar270;
  float fVar271;
  float fVar276;
  float fVar277;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar283;
  float fVar291;
  float fVar292;
  float fVar294;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar295;
  float fVar297;
  undefined1 auVar293 [12];
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar304;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  undefined1 auVar307 [32];
  float fVar309;
  float fVar312;
  undefined1 auVar308 [32];
  float fVar314;
  float fVar323;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar319 [64];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  float fVar327;
  undefined1 auVar326 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_7c0 [16];
  Precalculations *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 (*local_6b8) [16];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [8];
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_510;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar165 [24];
  undefined1 auVar261 [32];
  
  PVar8 = prim[1];
  uVar118 = (ulong)(byte)PVar8;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  lVar122 = uVar118 * 0x25;
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x11 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 6)));
  auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar196 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar196 = vinsertps_avx(auVar196,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar258 = *(float *)(prim + lVar122 + 0x12);
  auVar183 = vsubps_avx(auVar183,*(undefined1 (*) [16])(prim + lVar122 + 6));
  local_7a0._4_4_ = fVar258 * auVar183._4_4_;
  local_7a0._0_4_ = fVar258 * auVar183._0_4_;
  fStack_798 = fVar258 * auVar183._8_4_;
  fStack_794 = fVar258 * auVar183._12_4_;
  auVar284._0_4_ = fVar258 * auVar196._0_4_;
  auVar284._4_4_ = fVar258 * auVar196._4_4_;
  auVar284._8_4_ = fVar258 * auVar196._8_4_;
  auVar284._12_4_ = fVar258 * auVar196._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar198);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 6)));
  auVar196 = vshufps_avx(auVar284,auVar284,0x55);
  auVar198 = vshufps_avx(auVar284,auVar284,0xaa);
  fVar323 = auVar198._0_4_;
  fVar191 = auVar198._4_4_;
  fVar304 = auVar198._8_4_;
  fVar205 = auVar198._12_4_;
  fVar264 = auVar196._0_4_;
  fVar294 = auVar196._4_4_;
  fVar265 = auVar196._8_4_;
  fVar296 = auVar196._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar197);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar130 = vcvtdq2ps_avx(auVar183);
  auVar183 = vshufps_avx(auVar284,auVar284,0);
  fVar258 = auVar183._0_4_;
  fVar282 = auVar183._4_4_;
  fVar263 = auVar183._8_4_;
  fVar291 = auVar183._12_4_;
  auVar305._0_4_ = auVar18._0_4_ * fVar258 + fVar264 * auVar17._0_4_ + fVar323 * auVar19._0_4_;
  auVar305._4_4_ = auVar18._4_4_ * fVar282 + fVar294 * auVar17._4_4_ + fVar191 * auVar19._4_4_;
  auVar305._8_4_ = auVar18._8_4_ * fVar263 + fVar265 * auVar17._8_4_ + fVar304 * auVar19._8_4_;
  auVar305._12_4_ = auVar18._12_4_ * fVar291 + fVar296 * auVar17._12_4_ + fVar205 * auVar19._12_4_;
  auVar285._0_4_ = auVar20._0_4_ * fVar258 + fVar323 * auVar22._0_4_ + fVar264 * auVar21._0_4_;
  auVar285._4_4_ = auVar20._4_4_ * fVar282 + fVar191 * auVar22._4_4_ + fVar294 * auVar21._4_4_;
  auVar285._8_4_ = auVar20._8_4_ * fVar263 + fVar304 * auVar22._8_4_ + fVar265 * auVar21._8_4_;
  auVar285._12_4_ = auVar20._12_4_ * fVar291 + fVar205 * auVar22._12_4_ + fVar296 * auVar21._12_4_;
  local_840._4_4_ = fVar294 * auVar24._4_4_ + fVar191 * auVar130._4_4_ + fVar282 * auVar23._4_4_;
  local_840._0_4_ = fVar264 * auVar24._0_4_ + fVar323 * auVar130._0_4_ + fVar258 * auVar23._0_4_;
  fStack_838 = fVar265 * auVar24._8_4_ + fVar304 * auVar130._8_4_ + fVar263 * auVar23._8_4_;
  fStack_834 = fVar296 * auVar24._12_4_ + fVar205 * auVar130._12_4_ + fVar291 * auVar23._12_4_;
  auVar183 = vshufps_avx(_local_7a0,_local_7a0,0x55);
  auVar196 = vshufps_avx(_local_7a0,_local_7a0,0xaa);
  fVar323 = auVar196._0_4_;
  fVar191 = auVar196._4_4_;
  fVar304 = auVar196._8_4_;
  fVar205 = auVar196._12_4_;
  fVar258 = auVar183._0_4_;
  fVar263 = auVar183._4_4_;
  fVar264 = auVar183._8_4_;
  fVar265 = auVar183._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar183);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 6);
  auVar132 = vpmovsxwd_avx(auVar196);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar160 = vpmovsxwd_avx(auVar197);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 6);
  auVar198 = vpmovsxwd_avx(auVar198);
  auVar183 = vpermilps_avx(_local_7a0,0);
  fVar282 = auVar183._0_4_;
  fVar291 = auVar183._4_4_;
  fVar294 = auVar183._8_4_;
  fVar296 = auVar183._12_4_;
  auVar301._0_4_ = auVar17._0_4_ * fVar258 + fVar323 * auVar19._0_4_ + auVar18._0_4_ * fVar282;
  auVar301._4_4_ = auVar17._4_4_ * fVar263 + fVar191 * auVar19._4_4_ + auVar18._4_4_ * fVar291;
  auVar301._8_4_ = auVar17._8_4_ * fVar264 + fVar304 * auVar19._8_4_ + auVar18._8_4_ * fVar294;
  auVar301._12_4_ = auVar17._12_4_ * fVar265 + fVar205 * auVar19._12_4_ + auVar18._12_4_ * fVar296;
  auVar272._0_4_ = auVar22._0_4_ * fVar323 + fVar258 * auVar21._0_4_ + auVar20._0_4_ * fVar282;
  auVar272._4_4_ = auVar22._4_4_ * fVar191 + fVar263 * auVar21._4_4_ + auVar20._4_4_ * fVar291;
  auVar272._8_4_ = auVar22._8_4_ * fVar304 + fVar264 * auVar21._8_4_ + auVar20._8_4_ * fVar294;
  auVar272._12_4_ = auVar22._12_4_ * fVar205 + fVar265 * auVar21._12_4_ + auVar20._12_4_ * fVar296;
  auVar213._0_4_ = fVar258 * auVar24._0_4_ + fVar323 * auVar130._0_4_ + fVar282 * auVar23._0_4_;
  auVar213._4_4_ = fVar263 * auVar24._4_4_ + fVar191 * auVar130._4_4_ + fVar291 * auVar23._4_4_;
  auVar213._8_4_ = fVar264 * auVar24._8_4_ + fVar304 * auVar130._8_4_ + fVar294 * auVar23._8_4_;
  auVar213._12_4_ = fVar265 * auVar24._12_4_ + fVar205 * auVar130._12_4_ + fVar296 * auVar23._12_4_;
  auVar324._8_4_ = 0x7fffffff;
  auVar324._0_8_ = 0x7fffffff7fffffff;
  auVar324._12_4_ = 0x7fffffff;
  auVar183 = vandps_avx(auVar305,auVar324);
  auVar239._8_4_ = 0x219392ef;
  auVar239._0_8_ = 0x219392ef219392ef;
  auVar239._12_4_ = 0x219392ef;
  auVar183 = vcmpps_avx(auVar183,auVar239,1);
  auVar196 = vblendvps_avx(auVar305,auVar239,auVar183);
  auVar183 = vandps_avx(auVar285,auVar324);
  auVar183 = vcmpps_avx(auVar183,auVar239,1);
  auVar197 = vblendvps_avx(auVar285,auVar239,auVar183);
  auVar183 = vandps_avx(auVar324,_local_840);
  auVar183 = vcmpps_avx(auVar183,auVar239,1);
  auVar183 = vblendvps_avx(_local_840,auVar239,auVar183);
  auVar17 = vrcpps_avx(auVar196);
  fVar236 = auVar17._0_4_;
  auVar158._0_4_ = fVar236 * auVar196._0_4_;
  fVar246 = auVar17._4_4_;
  auVar158._4_4_ = fVar246 * auVar196._4_4_;
  fVar249 = auVar17._8_4_;
  auVar158._8_4_ = fVar249 * auVar196._8_4_;
  fVar252 = auVar17._12_4_;
  auVar158._12_4_ = fVar252 * auVar196._12_4_;
  auVar286._8_4_ = 0x3f800000;
  auVar286._0_8_ = 0x3f8000003f800000;
  auVar286._12_4_ = 0x3f800000;
  auVar196 = vsubps_avx(auVar286,auVar158);
  fVar236 = fVar236 + fVar236 * auVar196._0_4_;
  fVar246 = fVar246 + fVar246 * auVar196._4_4_;
  fVar249 = fVar249 + fVar249 * auVar196._8_4_;
  fVar252 = fVar252 + fVar252 * auVar196._12_4_;
  auVar196 = vrcpps_avx(auVar197);
  fVar258 = auVar196._0_4_;
  auVar259._0_4_ = fVar258 * auVar197._0_4_;
  fVar263 = auVar196._4_4_;
  auVar259._4_4_ = fVar263 * auVar197._4_4_;
  fVar264 = auVar196._8_4_;
  auVar259._8_4_ = fVar264 * auVar197._8_4_;
  fVar265 = auVar196._12_4_;
  auVar259._12_4_ = fVar265 * auVar197._12_4_;
  auVar196 = vsubps_avx(auVar286,auVar259);
  fVar258 = fVar258 + fVar258 * auVar196._0_4_;
  fVar263 = fVar263 + fVar263 * auVar196._4_4_;
  fVar264 = fVar264 + fVar264 * auVar196._8_4_;
  fVar265 = fVar265 + fVar265 * auVar196._12_4_;
  auVar196 = vrcpps_avx(auVar183);
  fVar282 = auVar196._0_4_;
  auVar175._0_4_ = fVar282 * auVar183._0_4_;
  fVar291 = auVar196._4_4_;
  auVar175._4_4_ = fVar291 * auVar183._4_4_;
  fVar294 = auVar196._8_4_;
  auVar175._8_4_ = fVar294 * auVar183._8_4_;
  fVar296 = auVar196._12_4_;
  auVar175._12_4_ = fVar296 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar286,auVar175);
  fVar282 = fVar282 + fVar282 * auVar183._0_4_;
  fVar291 = fVar291 + fVar291 * auVar183._4_4_;
  fVar294 = fVar294 + fVar294 * auVar183._8_4_;
  fVar296 = fVar296 + fVar296 * auVar183._12_4_;
  auVar197 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar122 + 0x16)) *
                                         *(float *)(prim + lVar122 + 0x1a))),0);
  auVar183 = vcvtdq2ps_avx(auVar131);
  auVar196 = vcvtdq2ps_avx(auVar132);
  auVar196 = vsubps_avx(auVar196,auVar183);
  fVar323 = auVar197._0_4_;
  fVar191 = auVar197._4_4_;
  fVar304 = auVar197._8_4_;
  fVar205 = auVar197._12_4_;
  auVar159._0_4_ = fVar323 * auVar196._0_4_ + auVar183._0_4_;
  auVar159._4_4_ = fVar191 * auVar196._4_4_ + auVar183._4_4_;
  auVar159._8_4_ = fVar304 * auVar196._8_4_ + auVar183._8_4_;
  auVar159._12_4_ = fVar205 * auVar196._12_4_ + auVar183._12_4_;
  auVar183 = vcvtdq2ps_avx(auVar160);
  auVar196 = vcvtdq2ps_avx(auVar198);
  auVar196 = vsubps_avx(auVar196,auVar183);
  auVar130._0_4_ = fVar323 * auVar196._0_4_ + auVar183._0_4_;
  auVar130._4_4_ = fVar191 * auVar196._4_4_ + auVar183._4_4_;
  auVar130._8_4_ = fVar304 * auVar196._8_4_ + auVar183._8_4_;
  auVar130._12_4_ = fVar205 * auVar196._12_4_ + auVar183._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 6);
  auVar183 = vpmovsxwd_avx(auVar17);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 * 0x16 + 6);
  auVar196 = vpmovsxwd_avx(auVar19);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar197 = vsubps_avx(auVar196,auVar183);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar118 * 0x14 + 6);
  auVar196 = vpmovsxwd_avx(auVar21);
  auVar193._0_4_ = fVar323 * auVar197._0_4_ + auVar183._0_4_;
  auVar193._4_4_ = fVar191 * auVar197._4_4_ + auVar183._4_4_;
  auVar193._8_4_ = fVar304 * auVar197._8_4_ + auVar183._8_4_;
  auVar193._12_4_ = fVar205 * auVar197._12_4_ + auVar183._12_4_;
  auVar183 = vcvtdq2ps_avx(auVar196);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 6);
  auVar196 = vpmovsxwd_avx(auVar22);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar183);
  auVar226._0_4_ = auVar196._0_4_ * fVar323 + auVar183._0_4_;
  auVar226._4_4_ = auVar196._4_4_ * fVar191 + auVar183._4_4_;
  auVar226._8_4_ = auVar196._8_4_ * fVar304 + auVar183._8_4_;
  auVar226._12_4_ = auVar196._12_4_ * fVar205 + auVar183._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 6);
  auVar183 = vpmovsxwd_avx(auVar18);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar118 * 0x21 + 6);
  auVar196 = vpmovsxwd_avx(auVar20);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar183);
  auVar306._0_4_ = auVar196._0_4_ * fVar323 + auVar183._0_4_;
  auVar306._4_4_ = auVar196._4_4_ * fVar191 + auVar183._4_4_;
  auVar306._8_4_ = auVar196._8_4_ * fVar304 + auVar183._8_4_;
  auVar306._12_4_ = auVar196._12_4_ * fVar205 + auVar183._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar118 * 0x1f + 6);
  auVar183 = vpmovsxwd_avx(auVar23);
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 6);
  auVar196 = vpmovsxwd_avx(auVar24);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar196 = vsubps_avx(auVar196,auVar183);
  auVar176._0_4_ = auVar183._0_4_ + auVar196._0_4_ * fVar323;
  auVar176._4_4_ = auVar183._4_4_ + auVar196._4_4_ * fVar191;
  auVar176._8_4_ = auVar183._8_4_ + auVar196._8_4_ * fVar304;
  auVar176._12_4_ = auVar183._12_4_ + auVar196._12_4_ * fVar205;
  auVar183 = vsubps_avx(auVar159,auVar301);
  auVar160._0_4_ = fVar236 * auVar183._0_4_;
  auVar160._4_4_ = fVar246 * auVar183._4_4_;
  auVar160._8_4_ = fVar249 * auVar183._8_4_;
  auVar160._12_4_ = fVar252 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar130,auVar301);
  auVar131._0_4_ = fVar236 * auVar183._0_4_;
  auVar131._4_4_ = fVar246 * auVar183._4_4_;
  auVar131._8_4_ = fVar249 * auVar183._8_4_;
  auVar131._12_4_ = fVar252 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar193,auVar272);
  auVar194._0_4_ = fVar258 * auVar183._0_4_;
  auVar194._4_4_ = fVar263 * auVar183._4_4_;
  auVar194._8_4_ = fVar264 * auVar183._8_4_;
  auVar194._12_4_ = fVar265 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar226,auVar272);
  auVar227._0_4_ = fVar258 * auVar183._0_4_;
  auVar227._4_4_ = fVar263 * auVar183._4_4_;
  auVar227._8_4_ = fVar264 * auVar183._8_4_;
  auVar227._12_4_ = fVar265 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar306,auVar213);
  auVar240._0_4_ = fVar282 * auVar183._0_4_;
  auVar240._4_4_ = fVar291 * auVar183._4_4_;
  auVar240._8_4_ = fVar294 * auVar183._8_4_;
  auVar240._12_4_ = fVar296 * auVar183._12_4_;
  auVar183 = vsubps_avx(auVar176,auVar213);
  auVar177._0_4_ = fVar282 * auVar183._0_4_;
  auVar177._4_4_ = fVar291 * auVar183._4_4_;
  auVar177._8_4_ = fVar294 * auVar183._8_4_;
  auVar177._12_4_ = fVar296 * auVar183._12_4_;
  auVar183 = vpminsd_avx(auVar160,auVar131);
  auVar196 = vpminsd_avx(auVar194,auVar227);
  auVar183 = vmaxps_avx(auVar183,auVar196);
  auVar196 = vpminsd_avx(auVar240,auVar177);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar273._4_4_ = uVar126;
  auVar273._0_4_ = uVar126;
  auVar273._8_4_ = uVar126;
  auVar273._12_4_ = uVar126;
  auVar196 = vmaxps_avx(auVar196,auVar273);
  auVar183 = vmaxps_avx(auVar183,auVar196);
  local_2f0._0_4_ = auVar183._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar183._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar183._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar183._12_4_ * 0.99999964;
  auVar183 = vpmaxsd_avx(auVar160,auVar131);
  auVar196 = vpmaxsd_avx(auVar194,auVar227);
  auVar183 = vminps_avx(auVar183,auVar196);
  auVar196 = vpmaxsd_avx(auVar240,auVar177);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar178._4_4_ = uVar126;
  auVar178._0_4_ = uVar126;
  auVar178._8_4_ = uVar126;
  auVar178._12_4_ = uVar126;
  auVar196 = vminps_avx(auVar196,auVar178);
  auVar183 = vminps_avx(auVar183,auVar196);
  auVar132._0_4_ = auVar183._0_4_ * 1.0000004;
  auVar132._4_4_ = auVar183._4_4_ * 1.0000004;
  auVar132._8_4_ = auVar183._8_4_ * 1.0000004;
  auVar132._12_4_ = auVar183._12_4_ * 1.0000004;
  auVar183 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar196 = vpcmpgtd_avx(auVar183,_DAT_01f4ad30);
  auVar183 = vcmpps_avx(local_2f0,auVar132,2);
  auVar183 = vandps_avx(auVar183,auVar196);
  uVar126 = vmovmskps_avx(auVar183);
  local_510 = pre->ray_space + k;
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_6b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7b0 = pre;
  local_508 = prim;
  for (uVar118 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar126); uVar118 != 0;
      uVar118 = (ulong)((uint)uVar118 & (uint)uVar118 + 0xf & uVar120)) {
    lVar122 = 0;
    if (uVar118 != 0) {
      for (; (uVar118 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
      }
    }
    uVar9 = *(uint *)(local_508 + 2);
    local_7a8 = (ulong)uVar9;
    uVar10 = *(uint *)(local_508 + lVar122 * 4 + 6);
    pGVar125 = (context->scene->geometries).items[local_7a8].ptr;
    uVar121 = (ulong)*(uint *)(*(long *)&pGVar125->field_0x58 +
                              (ulong)uVar10 *
                              pGVar125[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar258 = (pGVar125->time_range).lower;
    fVar258 = pGVar125->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar258) / ((pGVar125->time_range).upper - fVar258)
              );
    auVar183 = vroundss_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),9);
    auVar183 = vminss_avx(auVar183,ZEXT416((uint)(pGVar125->fnumTimeSegments + -1.0)));
    auVar183 = vmaxss_avx(ZEXT816(0) << 0x20,auVar183);
    fVar258 = fVar258 - auVar183._0_4_;
    _Var12 = pGVar125[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar123 = (long)(int)auVar183._0_4_ * 0x38;
    lVar122 = *(long *)(_Var12 + 0x10 + lVar123);
    lVar127 = *(long *)(_Var12 + 0x38 + lVar123);
    lVar13 = *(long *)(_Var12 + 0x48 + lVar123);
    auVar183 = vshufps_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),0);
    pfVar1 = (float *)(lVar127 + uVar121 * lVar13);
    fVar264 = auVar183._0_4_;
    fVar294 = auVar183._4_4_;
    fVar265 = auVar183._8_4_;
    fVar296 = auVar183._12_4_;
    pfVar2 = (float *)(lVar127 + (uVar121 + 1) * lVar13);
    uVar124 = (uVar121 + 2) * lVar13;
    pfVar3 = (float *)(lVar127 + uVar124);
    pfVar4 = (float *)(lVar127 + lVar13 * (uVar121 + 3));
    lVar127 = *(long *)(_Var12 + lVar123);
    auVar183 = vshufps_avx(ZEXT416((uint)(1.0 - fVar258)),ZEXT416((uint)(1.0 - fVar258)),0);
    pfVar5 = (float *)(lVar127 + lVar122 * uVar121);
    fVar258 = auVar183._0_4_;
    fVar282 = auVar183._4_4_;
    fVar263 = auVar183._8_4_;
    fVar291 = auVar183._12_4_;
    pfVar6 = (float *)(lVar127 + lVar122 * (uVar121 + 1));
    local_6d0 = (undefined1  [8])
                CONCAT44(fVar294 * pfVar1[1] + fVar282 * pfVar5[1],
                         fVar264 * *pfVar1 + fVar258 * *pfVar5);
    uStack_6c8._0_4_ = fVar265 * pfVar1[2] + fVar263 * pfVar5[2];
    uStack_6c8._4_4_ = fVar296 * pfVar1[3] + fVar291 * pfVar5[3];
    pfVar1 = (float *)(lVar127 + lVar122 * (uVar121 + 2));
    local_6e0 = (undefined1  [8])
                CONCAT44(fVar282 * pfVar6[1] + fVar294 * pfVar2[1],
                         fVar258 * *pfVar6 + fVar264 * *pfVar2);
    uStack_6d8._0_4_ = fVar263 * pfVar6[2] + fVar265 * pfVar2[2];
    uStack_6d8._4_4_ = fVar291 * pfVar6[3] + fVar296 * pfVar2[3];
    local_5b0 = (undefined1  [8])
                CONCAT44(fVar282 * pfVar1[1] + fVar294 * pfVar3[1],
                         fVar258 * *pfVar1 + fVar264 * *pfVar3);
    uStack_5a8._0_4_ = fVar263 * pfVar1[2] + fVar265 * pfVar3[2];
    uStack_5a8._4_4_ = fVar291 * pfVar1[3] + fVar296 * pfVar3[3];
    pfVar1 = (float *)(lVar127 + lVar122 * (uVar121 + 3));
    local_5c0 = (undefined1  [8])
                CONCAT44(fVar282 * pfVar1[1] + fVar294 * pfVar4[1],
                         fVar258 * *pfVar1 + fVar264 * *pfVar4);
    uStack_5b8._0_4_ = fVar263 * pfVar1[2] + fVar265 * pfVar4[2];
    uStack_5b8._4_4_ = fVar291 * pfVar1[3] + fVar296 * pfVar4[3];
    auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar11 = (uint)pGVar125[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar198 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar197 = vsubps_avx(_local_6d0,auVar198);
    auVar183 = vshufps_avx(auVar197,auVar197,0);
    auVar196 = vshufps_avx(auVar197,auVar197,0x55);
    auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
    fVar258 = (local_510->vx).field_0.m128[0];
    fVar282 = (local_510->vx).field_0.m128[1];
    fVar263 = (local_510->vx).field_0.m128[2];
    fVar291 = (local_510->vx).field_0.m128[3];
    fVar264 = (local_510->vy).field_0.m128[0];
    fVar294 = (local_510->vy).field_0.m128[1];
    fVar265 = (local_510->vy).field_0.m128[2];
    fVar296 = (local_510->vy).field_0.m128[3];
    fVar323 = (local_510->vz).field_0.m128[0];
    fVar191 = (local_510->vz).field_0.m128[1];
    fVar304 = (local_510->vz).field_0.m128[2];
    fVar205 = (local_510->vz).field_0.m128[3];
    auVar214._0_4_ = auVar183._0_4_ * fVar258 + auVar196._0_4_ * fVar264 + fVar323 * auVar197._0_4_;
    auVar214._4_4_ = auVar183._4_4_ * fVar282 + auVar196._4_4_ * fVar294 + fVar191 * auVar197._4_4_;
    auVar214._8_4_ = auVar183._8_4_ * fVar263 + auVar196._8_4_ * fVar265 + fVar304 * auVar197._8_4_;
    auVar214._12_4_ =
         auVar183._12_4_ * fVar291 + auVar196._12_4_ * fVar296 + fVar205 * auVar197._12_4_;
    auVar183 = vblendps_avx(auVar214,_local_6d0,8);
    auVar17 = vsubps_avx(_local_6e0,auVar198);
    auVar196 = vshufps_avx(auVar17,auVar17,0);
    auVar197 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar215._0_8_ =
         CONCAT44(auVar196._4_4_ * fVar282 + auVar197._4_4_ * fVar294 + fVar191 * auVar17._4_4_,
                  auVar196._0_4_ * fVar258 + auVar197._0_4_ * fVar264 + fVar323 * auVar17._0_4_);
    auVar215._8_4_ = auVar196._8_4_ * fVar263 + auVar197._8_4_ * fVar265 + fVar304 * auVar17._8_4_;
    auVar215._12_4_ =
         auVar196._12_4_ * fVar291 + auVar197._12_4_ * fVar296 + fVar205 * auVar17._12_4_;
    auVar196 = vblendps_avx(auVar215,_local_6e0,8);
    auVar19 = vsubps_avx(_local_5b0,auVar198);
    auVar197 = vshufps_avx(auVar19,auVar19,0);
    auVar17 = vshufps_avx(auVar19,auVar19,0x55);
    auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar216._0_4_ = auVar197._0_4_ * fVar258 + auVar17._0_4_ * fVar264 + fVar323 * auVar19._0_4_;
    auVar216._4_4_ = auVar197._4_4_ * fVar282 + auVar17._4_4_ * fVar294 + fVar191 * auVar19._4_4_;
    auVar216._8_4_ = auVar197._8_4_ * fVar263 + auVar17._8_4_ * fVar265 + fVar304 * auVar19._8_4_;
    auVar216._12_4_ =
         auVar197._12_4_ * fVar291 + auVar17._12_4_ * fVar296 + fVar205 * auVar19._12_4_;
    auVar197 = vblendps_avx(auVar216,_local_5b0,8);
    auVar19 = vsubps_avx(_local_5c0,auVar198);
    auVar198 = vshufps_avx(auVar19,auVar19,0);
    auVar17 = vshufps_avx(auVar19,auVar19,0x55);
    auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar161._0_4_ = auVar198._0_4_ * fVar258 + auVar17._0_4_ * fVar264 + fVar323 * auVar19._0_4_;
    auVar161._4_4_ = auVar198._4_4_ * fVar282 + auVar17._4_4_ * fVar294 + fVar191 * auVar19._4_4_;
    auVar161._8_4_ = auVar198._8_4_ * fVar263 + auVar17._8_4_ * fVar265 + fVar304 * auVar19._8_4_;
    auVar161._12_4_ =
         auVar198._12_4_ * fVar291 + auVar17._12_4_ * fVar296 + fVar205 * auVar19._12_4_;
    auVar198 = vblendps_avx(auVar161,_local_5c0,8);
    auVar195._8_4_ = 0x7fffffff;
    auVar195._0_8_ = 0x7fffffff7fffffff;
    auVar195._12_4_ = 0x7fffffff;
    auVar183 = vandps_avx(auVar183,auVar195);
    auVar196 = vandps_avx(auVar196,auVar195);
    auVar17 = vmaxps_avx(auVar183,auVar196);
    auVar183 = vandps_avx(auVar197,auVar195);
    auVar196 = vandps_avx(auVar198,auVar195);
    auVar183 = vmaxps_avx(auVar183,auVar196);
    auVar183 = vmaxps_avx(auVar17,auVar183);
    auVar196 = vmovshdup_avx(auVar183);
    auVar196 = vmaxss_avx(auVar196,auVar183);
    auVar183 = vshufpd_avx(auVar183,auVar183,1);
    auVar183 = vmaxss_avx(auVar183,auVar196);
    lVar122 = (long)(int)uVar11 * 0x44;
    fVar296 = *(float *)(catmullrom_basis0 + lVar122 + 0x908);
    fVar323 = *(float *)(catmullrom_basis0 + lVar122 + 0x90c);
    fVar191 = *(float *)(catmullrom_basis0 + lVar122 + 0x910);
    fVar304 = *(float *)(catmullrom_basis0 + lVar122 + 0x914);
    fStack_490 = *(float *)(catmullrom_basis0 + lVar122 + 0x918);
    fStack_48c = *(float *)(catmullrom_basis0 + lVar122 + 0x91c);
    fStack_488 = *(float *)(catmullrom_basis0 + lVar122 + 0x920);
    fStack_484 = *(float *)(catmullrom_basis0 + lVar122 + 0x924);
    local_760._0_16_ = auVar216;
    auVar196 = vshufps_avx(auVar216,auVar216,0);
    register0x000012d0 = auVar196;
    _local_600 = auVar196;
    auVar197 = vshufps_avx(auVar216,auVar216,0x55);
    register0x00001290 = auVar197;
    _local_7a0 = auVar197;
    fVar258 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0xd8c);
    fVar282 = *(float *)(catmullrom_basis0 + lVar122 + 0xd90);
    fVar263 = *(float *)(catmullrom_basis0 + lVar122 + 0xd94);
    fVar291 = *(float *)(catmullrom_basis0 + lVar122 + 0xd98);
    fVar264 = *(float *)(catmullrom_basis0 + lVar122 + 0xd9c);
    fVar294 = *(float *)(catmullrom_basis0 + lVar122 + 0xda0);
    fVar265 = *(float *)(catmullrom_basis0 + lVar122 + 0xda4);
    auVar114 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0xd8c);
    auVar198 = vshufps_avx(auVar161,auVar161,0);
    register0x00001550 = auVar198;
    _local_440 = auVar198;
    fVar257 = auVar198._0_4_;
    fVar266 = auVar198._4_4_;
    fVar267 = auVar198._8_4_;
    fVar268 = auVar198._12_4_;
    fVar152 = auVar196._0_4_;
    fVar154 = auVar196._4_4_;
    fVar156 = auVar196._8_4_;
    fVar157 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar161,auVar161,0x55);
    fVar314 = auVar196._0_4_;
    fVar320 = auVar196._4_4_;
    fVar321 = auVar196._8_4_;
    fVar322 = auVar196._12_4_;
    fVar129 = auVar197._0_4_;
    fVar144 = auVar197._4_4_;
    fVar147 = auVar197._8_4_;
    fVar150 = auVar197._12_4_;
    auVar196 = vshufps_avx(_local_5b0,_local_5b0,0xff);
    register0x00001490 = auVar196;
    _local_160 = auVar196;
    auVar197 = vshufps_avx(_local_5c0,_local_5c0,0xff);
    register0x00001410 = auVar197;
    _local_80 = auVar197;
    fVar223 = auVar197._0_4_;
    fVar224 = auVar197._4_4_;
    fVar225 = auVar197._8_4_;
    fVar173 = auVar197._12_4_;
    fVar254 = auVar196._0_4_;
    fVar255 = auVar196._4_4_;
    fVar256 = auVar196._8_4_;
    auVar105._8_4_ = auVar215._8_4_;
    auVar105._0_8_ = auVar215._0_8_;
    auVar105._12_4_ = auVar215._12_4_;
    auVar197 = vshufps_avx(auVar105,auVar105,0);
    register0x000015d0 = auVar197;
    _local_460 = auVar197;
    fVar205 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0x484);
    fVar236 = *(float *)(catmullrom_basis0 + lVar122 + 0x488);
    fVar246 = *(float *)(catmullrom_basis0 + lVar122 + 0x48c);
    fVar249 = *(float *)(catmullrom_basis0 + lVar122 + 0x490);
    fVar252 = *(float *)(catmullrom_basis0 + lVar122 + 0x494);
    fVar309 = *(float *)(catmullrom_basis0 + lVar122 + 0x498);
    fVar234 = *(float *)(catmullrom_basis0 + lVar122 + 0x49c);
    auVar115 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar122 + 0x484);
    fVar297 = auVar197._0_4_;
    fVar298 = auVar197._4_4_;
    fVar299 = auVar197._8_4_;
    fVar300 = auVar197._12_4_;
    auVar197 = vshufps_avx(auVar105,auVar105,0x55);
    register0x00001210 = auVar197;
    _local_700 = auVar197;
    fVar128 = auVar197._0_4_;
    fVar142 = auVar197._4_4_;
    fVar145 = auVar197._8_4_;
    fVar148 = auVar197._12_4_;
    auVar197 = vpermilps_avx(_local_6e0,0xff);
    register0x00001590 = auVar197;
    _local_a0 = auVar197;
    fVar269 = auVar197._0_4_;
    fVar283 = auVar197._4_4_;
    fVar292 = auVar197._8_4_;
    fVar295 = auVar197._12_4_;
    fVar235 = fVar157 + 0.0 + 0.0;
    auVar197 = vshufps_avx(auVar214,auVar214,0);
    register0x00001390 = auVar197;
    _local_140 = auVar197;
    fVar310 = *(float *)(catmullrom_basis0 + lVar122);
    fVar278 = *(float *)(catmullrom_basis0 + lVar122 + 4);
    fVar312 = *(float *)(catmullrom_basis0 + lVar122 + 8);
    fVar311 = *(float *)(catmullrom_basis0 + lVar122 + 0xc);
    fVar313 = *(float *)(catmullrom_basis0 + lVar122 + 0x10);
    fVar279 = *(float *)(catmullrom_basis0 + lVar122 + 0x14);
    fVar270 = *(float *)(catmullrom_basis0 + lVar122 + 0x18);
    fVar237 = auVar197._0_4_;
    fVar247 = auVar197._4_4_;
    fVar250 = auVar197._8_4_;
    fVar253 = auVar197._12_4_;
    auVar260._0_4_ = fVar237 * fVar310 + fVar297 * fVar205 + fVar152 * fVar296 + fVar257 * fVar258;
    auVar260._4_4_ = fVar247 * fVar278 + fVar298 * fVar236 + fVar154 * fVar323 + fVar266 * fVar282;
    auVar260._8_4_ = fVar250 * fVar312 + fVar299 * fVar246 + fVar156 * fVar191 + fVar267 * fVar263;
    auVar260._12_4_ = fVar253 * fVar311 + fVar300 * fVar249 + fVar157 * fVar304 + fVar268 * fVar291;
    auVar261._16_4_ =
         fVar237 * fVar313 + fVar297 * fVar252 + fVar152 * fStack_490 + fVar257 * fVar264;
    auVar261._0_16_ = auVar260;
    auVar261._20_4_ =
         fVar247 * fVar279 + fVar298 * fVar309 + fVar154 * fStack_48c + fVar266 * fVar294;
    auVar261._24_4_ =
         fVar250 * fVar270 + fVar299 * fVar234 + fVar156 * fStack_488 + fVar267 * fVar265;
    auVar261._28_4_ = fVar253 + 0.0;
    auVar197 = vshufps_avx(auVar214,auVar214,0x55);
    auVar186._16_16_ = auVar197;
    auVar186._0_16_ = auVar197;
    fVar174 = auVar197._0_4_;
    fVar188 = auVar197._4_4_;
    fVar189 = auVar197._8_4_;
    fVar190 = auVar197._12_4_;
    auVar307._0_4_ = fVar174 * fVar310 + fVar128 * fVar205 + fVar129 * fVar296 + fVar314 * fVar258;
    auVar307._4_4_ = fVar188 * fVar278 + fVar142 * fVar236 + fVar144 * fVar323 + fVar320 * fVar282;
    auVar307._8_4_ = fVar189 * fVar312 + fVar145 * fVar246 + fVar147 * fVar191 + fVar321 * fVar263;
    auVar307._12_4_ = fVar190 * fVar311 + fVar148 * fVar249 + fVar150 * fVar304 + fVar322 * fVar291;
    auVar307._16_4_ =
         fVar174 * fVar313 + fVar128 * fVar252 + fVar129 * fStack_490 + fVar314 * fVar264;
    auVar307._20_4_ =
         fVar188 * fVar279 + fVar142 * fVar309 + fVar144 * fStack_48c + fVar320 * fVar294;
    auVar307._24_4_ =
         fVar189 * fVar270 + fVar145 * fVar234 + fVar147 * fStack_488 + fVar321 * fVar265;
    auVar307._28_4_ = fVar148 + fVar150 + 0.0 + 0.0;
    auVar197 = vpermilps_avx(_local_6d0,0xff);
    register0x00001450 = auVar197;
    _local_c0 = auVar197;
    fVar238 = auVar197._0_4_;
    fVar248 = auVar197._4_4_;
    fVar251 = auVar197._8_4_;
    local_840._0_4_ = fVar238 * fVar310 + fVar269 * fVar205 + fVar254 * fVar296 + fVar223 * fVar258;
    local_840._4_4_ = fVar248 * fVar278 + fVar283 * fVar236 + fVar255 * fVar323 + fVar224 * fVar282;
    fStack_838 = fVar251 * fVar312 + fVar292 * fVar246 + fVar256 * fVar191 + fVar225 * fVar263;
    fStack_834 = auVar197._12_4_ * fVar311 +
                 fVar295 * fVar249 + auVar196._12_4_ * fVar304 + fVar173 * fVar291;
    fStack_830 = fVar238 * fVar313 + fVar269 * fVar252 + fVar254 * fStack_490 + fVar223 * fVar264;
    fStack_82c = fVar248 * fVar279 + fVar283 * fVar309 + fVar255 * fStack_48c + fVar224 * fVar294;
    fStack_828 = fVar251 * fVar270 + fVar292 * fVar234 + fVar256 * fStack_488 + fVar225 * fVar265;
    fStack_824 = fVar235 + 0.0;
    fVar205 = *(float *)(catmullrom_basis1 + lVar122 + 0x908);
    fVar236 = *(float *)(catmullrom_basis1 + lVar122 + 0x90c);
    fVar246 = *(float *)(catmullrom_basis1 + lVar122 + 0x910);
    fVar249 = *(float *)(catmullrom_basis1 + lVar122 + 0x914);
    fVar252 = *(float *)(catmullrom_basis1 + lVar122 + 0x918);
    fVar309 = *(float *)(catmullrom_basis1 + lVar122 + 0x91c);
    fVar234 = *(float *)(catmullrom_basis1 + lVar122 + 0x920);
    fVar271 = *(float *)(catmullrom_basis1 + lVar122 + 0xd8c);
    fVar210 = *(float *)(catmullrom_basis1 + lVar122 + 0xd90);
    fVar280 = *(float *)(catmullrom_basis1 + lVar122 + 0xd94);
    fVar276 = *(float *)(catmullrom_basis1 + lVar122 + 0xd98);
    fVar277 = *(float *)(catmullrom_basis1 + lVar122 + 0xd9c);
    fVar212 = *(float *)(catmullrom_basis1 + lVar122 + 0xda0);
    fVar172 = *(float *)(catmullrom_basis1 + lVar122 + 0xda4);
    fVar281 = *(float *)(catmullrom_basis1 + lVar122 + 0x484);
    fVar143 = *(float *)(catmullrom_basis1 + lVar122 + 0x488);
    fVar146 = *(float *)(catmullrom_basis1 + lVar122 + 0x48c);
    fVar149 = *(float *)(catmullrom_basis1 + lVar122 + 0x490);
    fVar151 = *(float *)(catmullrom_basis1 + lVar122 + 0x494);
    fVar153 = *(float *)(catmullrom_basis1 + lVar122 + 0x498);
    fVar155 = *(float *)(catmullrom_basis1 + lVar122 + 0x49c);
    fVar192 = *(float *)(catmullrom_basis1 + lVar122);
    fVar204 = *(float *)(catmullrom_basis1 + lVar122 + 4);
    fVar206 = *(float *)(catmullrom_basis1 + lVar122 + 8);
    fVar207 = *(float *)(catmullrom_basis1 + lVar122 + 0xc);
    fVar208 = *(float *)(catmullrom_basis1 + lVar122 + 0x10);
    fVar209 = *(float *)(catmullrom_basis1 + lVar122 + 0x14);
    fVar211 = *(float *)(catmullrom_basis1 + lVar122 + 0x18);
    auVar217._0_4_ = fVar237 * fVar192 + fVar297 * fVar281 + fVar152 * fVar205 + fVar257 * fVar271;
    auVar217._4_4_ = fVar247 * fVar204 + fVar298 * fVar143 + fVar154 * fVar236 + fVar266 * fVar210;
    auVar217._8_4_ = fVar250 * fVar206 + fVar299 * fVar146 + fVar156 * fVar246 + fVar267 * fVar280;
    auVar217._12_4_ = fVar253 * fVar207 + fVar300 * fVar149 + fVar157 * fVar249 + fVar268 * fVar276;
    auVar217._16_4_ = fVar237 * fVar208 + fVar297 * fVar151 + fVar152 * fVar252 + fVar257 * fVar277;
    auVar217._20_4_ = fVar247 * fVar209 + fVar298 * fVar153 + fVar154 * fVar309 + fVar266 * fVar212;
    auVar217._24_4_ = fVar250 * fVar211 + fVar299 * fVar155 + fVar156 * fVar234 + fVar267 * fVar172;
    auVar217._28_4_ = fVar295 + fVar268 + fVar235 + 0.0;
    local_480._0_4_ = fVar192 * fVar174 + fVar128 * fVar281 + fVar205 * fVar129 + fVar314 * fVar271;
    local_480._4_4_ = fVar204 * fVar188 + fVar142 * fVar143 + fVar236 * fVar144 + fVar320 * fVar210;
    fStack_478 = fVar206 * fVar189 + fVar145 * fVar146 + fVar246 * fVar147 + fVar321 * fVar280;
    fStack_474 = fVar207 * fVar190 + fVar148 * fVar149 + fVar249 * fVar150 + fVar322 * fVar276;
    fStack_470 = fVar208 * fVar174 + fVar128 * fVar151 + fVar252 * fVar129 + fVar314 * fVar277;
    fStack_46c = fVar209 * fVar188 + fVar142 * fVar153 + fVar309 * fVar144 + fVar320 * fVar212;
    fStack_468 = fVar211 * fVar189 + fVar145 * fVar155 + fVar234 * fVar147 + fVar321 * fVar172;
    fStack_464 = fVar190 + fVar268 + fVar253 + 0.0;
    local_780._0_4_ = fVar269 * fVar281 + fVar254 * fVar205 + fVar223 * fVar271 + fVar238 * fVar192;
    local_780._4_4_ = fVar283 * fVar143 + fVar255 * fVar236 + fVar224 * fVar210 + fVar248 * fVar204;
    local_780._8_4_ = fVar292 * fVar146 + fVar256 * fVar246 + fVar225 * fVar280 + fVar251 * fVar206;
    local_780._12_4_ =
         fVar295 * fVar149 + auVar196._12_4_ * fVar249 + fVar173 * fVar276 +
         auVar197._12_4_ * fVar207;
    local_780._16_4_ = fVar269 * fVar151 + fVar254 * fVar252 + fVar223 * fVar277 + fVar238 * fVar208
    ;
    local_780._20_4_ = fVar283 * fVar153 + fVar255 * fVar309 + fVar224 * fVar212 + fVar248 * fVar209
    ;
    local_780._24_4_ = fVar292 * fVar155 + fVar256 * fVar234 + fVar225 * fVar172 + fVar251 * fVar211
    ;
    local_780._28_4_ = fVar268 + fVar173 + fVar253 + fVar190;
    local_340 = vsubps_avx(auVar217,auVar261);
    auVar25 = vsubps_avx(_local_480,auVar307);
    fVar258 = local_340._0_4_;
    fVar282 = local_340._4_4_;
    auVar170._4_4_ = auVar307._4_4_ * fVar282;
    auVar170._0_4_ = auVar307._0_4_ * fVar258;
    fVar263 = local_340._8_4_;
    auVar170._8_4_ = auVar307._8_4_ * fVar263;
    fVar291 = local_340._12_4_;
    auVar170._12_4_ = auVar307._12_4_ * fVar291;
    fVar264 = local_340._16_4_;
    auVar170._16_4_ = auVar307._16_4_ * fVar264;
    fVar294 = local_340._20_4_;
    auVar170._20_4_ = auVar307._20_4_ * fVar294;
    fVar265 = local_340._24_4_;
    auVar170._24_4_ = auVar307._24_4_ * fVar265;
    auVar170._28_4_ = fVar190;
    fVar235 = auVar25._0_4_;
    fVar223 = auVar25._4_4_;
    auVar26._4_4_ = fVar223 * auVar260._4_4_;
    auVar26._0_4_ = fVar235 * auVar260._0_4_;
    fVar224 = auVar25._8_4_;
    auVar26._8_4_ = fVar224 * auVar260._8_4_;
    fVar225 = auVar25._12_4_;
    auVar26._12_4_ = fVar225 * auVar260._12_4_;
    fVar173 = auVar25._16_4_;
    auVar26._16_4_ = fVar173 * auVar261._16_4_;
    fVar238 = auVar25._20_4_;
    auVar26._20_4_ = fVar238 * auVar261._20_4_;
    fVar248 = auVar25._24_4_;
    auVar26._24_4_ = fVar248 * auVar261._24_4_;
    auVar26._28_4_ = fStack_464;
    auVar26 = vsubps_avx(auVar170,auVar26);
    auVar170 = vmaxps_avx(_local_840,local_780);
    auVar33._4_4_ = auVar170._4_4_ * auVar170._4_4_ * (fVar282 * fVar282 + fVar223 * fVar223);
    auVar33._0_4_ = auVar170._0_4_ * auVar170._0_4_ * (fVar258 * fVar258 + fVar235 * fVar235);
    auVar33._8_4_ = auVar170._8_4_ * auVar170._8_4_ * (fVar263 * fVar263 + fVar224 * fVar224);
    auVar33._12_4_ = auVar170._12_4_ * auVar170._12_4_ * (fVar291 * fVar291 + fVar225 * fVar225);
    auVar33._16_4_ = auVar170._16_4_ * auVar170._16_4_ * (fVar264 * fVar264 + fVar173 * fVar173);
    auVar33._20_4_ = auVar170._20_4_ * auVar170._20_4_ * (fVar294 * fVar294 + fVar238 * fVar238);
    auVar33._24_4_ = auVar170._24_4_ * auVar170._24_4_ * (fVar265 * fVar265 + fVar248 * fVar248);
    auVar33._28_4_ = auVar217._28_4_ + fStack_464;
    auVar27._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar27._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar27._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar27._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar27._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar27._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar27._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar27._28_4_ = auVar26._28_4_;
    local_5d0._0_4_ = (undefined4)(int)uVar11;
    local_5d0._4_12_ = auVar260._4_12_;
    auVar170 = vcmpps_avx(auVar27,auVar33,2);
    auVar196 = vshufps_avx(local_5d0,local_5d0,0);
    auVar199._16_16_ = auVar196;
    auVar199._0_16_ = auVar196;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar199,1);
    auVar203 = ZEXT3264(auVar26);
    auVar196 = vpermilps_avx(auVar214,0xaa);
    register0x00001450 = auVar196;
    _local_640 = auVar196;
    auVar106._8_4_ = auVar215._8_4_;
    auVar106._0_8_ = auVar215._0_8_;
    auVar106._12_4_ = auVar215._12_4_;
    auVar197 = vpermilps_avx(auVar106,0xaa);
    register0x00001550 = auVar197;
    _local_e0 = auVar197;
    auVar198 = vpermilps_avx(auVar216,0xaa);
    register0x00001590 = auVar198;
    _local_100 = auVar198;
    auVar17 = vpermilps_avx(auVar161,0xaa);
    auVar218._16_16_ = auVar17;
    auVar218._0_16_ = auVar17;
    auVar33 = auVar26 & auVar170;
    local_660._0_16_ = ZEXT416(uVar10);
    uVar120 = *(uint *)(ray + k * 4 + 0x30);
    auVar183 = ZEXT416((uint)(auVar183._0_4_ * 4.7683716e-07));
    fVar258 = fVar128;
    fVar282 = fVar142;
    fVar263 = fVar145;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0x7f,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar33 >> 0xbf,0) == '\0') &&
        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f]) {
      uVar124 = 0;
      auVar319 = ZEXT3264(_local_7a0);
      auVar171 = ZEXT1664(auVar183);
    }
    else {
      local_320 = vandps_avx(auVar170,auVar26);
      fVar173 = auVar196._0_4_;
      fVar238 = auVar196._4_4_;
      fVar248 = auVar196._8_4_;
      fVar251 = auVar196._12_4_;
      fVar254 = auVar197._0_4_;
      fVar255 = auVar197._4_4_;
      fVar256 = auVar197._8_4_;
      fVar269 = auVar197._12_4_;
      fVar283 = auVar198._0_4_;
      fVar292 = auVar198._4_4_;
      fVar295 = auVar198._8_4_;
      fVar327 = auVar198._12_4_;
      fVar235 = auVar17._0_4_;
      fVar223 = auVar17._4_4_;
      fVar224 = auVar17._8_4_;
      fVar225 = auVar17._12_4_;
      fVar291 = auVar26._28_4_ + *(float *)(catmullrom_basis1 + lVar122 + 0x924) + 0.0;
      local_4e0 = fVar173 * fVar192 + fVar254 * fVar281 + fVar283 * fVar205 + fVar235 * fVar271;
      fStack_4dc = fVar238 * fVar204 + fVar255 * fVar143 + fVar292 * fVar236 + fVar223 * fVar210;
      fStack_4d8 = fVar248 * fVar206 + fVar256 * fVar146 + fVar295 * fVar246 + fVar224 * fVar280;
      fStack_4d4 = fVar251 * fVar207 + fVar269 * fVar149 + fVar327 * fVar249 + fVar225 * fVar276;
      fStack_4d0 = fVar173 * fVar208 + fVar254 * fVar151 + fVar283 * fVar252 + fVar235 * fVar277;
      fStack_4cc = fVar238 * fVar209 + fVar255 * fVar153 + fVar292 * fVar309 + fVar223 * fVar212;
      fStack_4c8 = fVar248 * fVar211 + fVar256 * fVar155 + fVar295 * fVar234 + fVar224 * fVar172;
      fStack_4c4 = local_320._28_4_ + fVar291;
      local_580._0_4_ = auVar115._0_4_;
      local_580._4_4_ = auVar115._4_4_;
      fStack_578 = auVar115._8_4_;
      fStack_574 = auVar115._12_4_;
      fStack_570 = auVar115._16_4_;
      fStack_56c = auVar115._20_4_;
      fStack_568 = auVar115._24_4_;
      local_5a0._0_4_ = auVar114._0_4_;
      local_5a0._4_4_ = auVar114._4_4_;
      fStack_598 = auVar114._8_4_;
      fStack_594 = auVar114._12_4_;
      fStack_590 = auVar114._16_4_;
      fStack_58c = auVar114._20_4_;
      fStack_588 = auVar114._24_4_;
      local_4a0 = fVar173 * fVar310 +
                  fVar254 * (float)local_580._0_4_ +
                  fVar283 * fVar296 + fVar235 * (float)local_5a0._0_4_;
      fStack_49c = fVar238 * fVar278 +
                   fVar255 * (float)local_580._4_4_ +
                   fVar292 * fVar323 + fVar223 * (float)local_5a0._4_4_;
      fStack_498 = fVar248 * fVar312 +
                   fVar256 * fStack_578 + fVar295 * fVar191 + fVar224 * fStack_598;
      fStack_494 = fVar251 * fVar311 +
                   fVar269 * fStack_574 + fVar327 * fVar304 + fVar225 * fStack_594;
      fStack_490 = fVar173 * fVar313 +
                   fVar254 * fStack_570 + fVar283 * fStack_490 + fVar235 * fStack_590;
      fStack_48c = fVar238 * fVar279 +
                   fVar255 * fStack_56c + fVar292 * fStack_48c + fVar223 * fStack_58c;
      fStack_488 = fVar248 * fVar270 +
                   fVar256 * fStack_568 + fVar295 * fStack_488 + fVar224 * fStack_588;
      fStack_484 = fStack_4c4 + fVar291 + local_320._28_4_ + auVar26._28_4_;
      fVar291 = *(float *)(catmullrom_basis0 + lVar122 + 0x1210);
      fVar264 = *(float *)(catmullrom_basis0 + lVar122 + 0x1214);
      fVar294 = *(float *)(catmullrom_basis0 + lVar122 + 0x1218);
      fVar265 = *(float *)(catmullrom_basis0 + lVar122 + 0x121c);
      fVar296 = *(float *)(catmullrom_basis0 + lVar122 + 0x1220);
      fVar323 = *(float *)(catmullrom_basis0 + lVar122 + 0x1224);
      fVar191 = *(float *)(catmullrom_basis0 + lVar122 + 0x1228);
      fVar304 = *(float *)(catmullrom_basis0 + lVar122 + 0x1694);
      fVar205 = *(float *)(catmullrom_basis0 + lVar122 + 0x1698);
      fVar236 = *(float *)(catmullrom_basis0 + lVar122 + 0x169c);
      fVar246 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a0);
      fVar249 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a4);
      fVar252 = *(float *)(catmullrom_basis0 + lVar122 + 0x16a8);
      fVar309 = *(float *)(catmullrom_basis0 + lVar122 + 0x16ac);
      fVar234 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b18);
      fVar310 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b1c);
      fVar278 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b20);
      fVar312 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b24);
      fVar311 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b28);
      fVar313 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b2c);
      fVar279 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b30);
      fVar270 = *(float *)(catmullrom_basis0 + lVar122 + 0x1f9c);
      fVar271 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa0);
      fVar210 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa4);
      fVar280 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fa8);
      fVar276 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fac);
      fVar277 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fb0);
      fVar212 = *(float *)(catmullrom_basis0 + lVar122 + 0x1fb4);
      local_760._0_16_ = auVar183;
      fVar172 = *(float *)(catmullrom_basis0 + lVar122 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar122 + 0x1fb8);
      fVar281 = *(float *)(catmullrom_basis0 + lVar122 + 0x16b0) + fVar172;
      local_580._4_4_ =
           fVar247 * fVar264 + fVar298 * fVar205 + fVar154 * fVar310 + fVar266 * fVar271;
      local_580._0_4_ =
           fVar237 * fVar291 + fVar297 * fVar304 + fVar152 * fVar234 + fVar257 * fVar270;
      fStack_578 = fVar250 * fVar294 + fVar299 * fVar236 + fVar156 * fVar278 + fVar267 * fVar210;
      fStack_574 = fVar253 * fVar265 + fVar300 * fVar246 + fVar157 * fVar312 + fVar268 * fVar280;
      fStack_570 = fVar237 * fVar296 + fVar297 * fVar249 + fVar152 * fVar311 + fVar257 * fVar276;
      fStack_56c = fVar247 * fVar323 + fVar298 * fVar252 + fVar154 * fVar313 + fVar266 * fVar277;
      fStack_568 = fVar250 * fVar191 + fVar299 * fVar309 + fVar156 * fVar279 + fVar267 * fVar212;
      fStack_564 = *(float *)(catmullrom_basis0 + lVar122 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar122 + 0x1fb8) +
                   fVar251 + *(float *)(catmullrom_basis1 + lVar122 + 0x4a0);
      auVar241._0_4_ = fVar174 * fVar291 + fVar129 * fVar234 + fVar314 * fVar270 + fVar128 * fVar304
      ;
      auVar241._4_4_ = fVar188 * fVar264 + fVar144 * fVar310 + fVar320 * fVar271 + fVar142 * fVar205
      ;
      auVar241._8_4_ = fVar189 * fVar294 + fVar147 * fVar278 + fVar321 * fVar210 + fVar145 * fVar236
      ;
      auVar241._12_4_ =
           fVar190 * fVar265 + fVar150 * fVar312 + fVar322 * fVar280 + fVar148 * fVar246;
      auVar241._16_4_ =
           fVar174 * fVar296 + fVar129 * fVar311 + fVar314 * fVar276 + fVar128 * fVar249;
      auVar241._20_4_ =
           fVar188 * fVar323 + fVar144 * fVar313 + fVar320 * fVar277 + fVar142 * fVar252;
      auVar241._24_4_ =
           fVar189 * fVar191 + fVar147 * fVar279 + fVar321 * fVar212 + fVar145 * fVar309;
      auVar241._28_4_ =
           fVar172 + fVar251 + *(float *)(catmullrom_basis1 + lVar122 + 0x1c) +
                     fVar251 + *(float *)(catmullrom_basis1 + lVar122 + 0x4a0);
      local_4c0 = fVar254 * fVar304 + fVar283 * fVar234 + fVar235 * fVar270 + fVar173 * fVar291;
      fStack_4bc = fVar255 * fVar205 + fVar292 * fVar310 + fVar223 * fVar271 + fVar238 * fVar264;
      fStack_4b8 = fVar256 * fVar236 + fVar295 * fVar278 + fVar224 * fVar210 + fVar248 * fVar294;
      fStack_4b4 = fVar269 * fVar246 + fVar327 * fVar312 + fVar225 * fVar280 + fVar251 * fVar265;
      fStack_4b0 = fVar254 * fVar249 + fVar283 * fVar311 + fVar235 * fVar276 + fVar173 * fVar296;
      fStack_4ac = fVar255 * fVar252 + fVar292 * fVar313 + fVar223 * fVar277 + fVar238 * fVar323;
      fStack_4a8 = fVar256 * fVar309 + fVar295 * fVar279 + fVar224 * fVar212 + fVar248 * fVar191;
      fStack_4a4 = fVar281 + *(float *)(catmullrom_basis0 + lVar122 + 0x122c);
      fVar291 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b18);
      fVar264 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b1c);
      fVar294 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b20);
      fVar265 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b24);
      fVar296 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b28);
      fVar323 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b2c);
      fVar191 = *(float *)(catmullrom_basis1 + lVar122 + 0x1b30);
      fVar304 = *(float *)(catmullrom_basis1 + lVar122 + 0x1f9c);
      fVar205 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa0);
      fVar236 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa4);
      fVar246 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fa8);
      fVar249 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fac);
      fVar252 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fb0);
      fVar309 = *(float *)(catmullrom_basis1 + lVar122 + 0x1fb4);
      fVar234 = *(float *)(catmullrom_basis1 + lVar122 + 0x1694);
      fVar310 = *(float *)(catmullrom_basis1 + lVar122 + 0x1698);
      fVar278 = *(float *)(catmullrom_basis1 + lVar122 + 0x169c);
      fVar312 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a0);
      fVar311 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a4);
      fVar313 = *(float *)(catmullrom_basis1 + lVar122 + 0x16a8);
      fVar279 = *(float *)(catmullrom_basis1 + lVar122 + 0x16ac);
      fVar270 = *(float *)(catmullrom_basis1 + lVar122 + 0x1210);
      fVar271 = *(float *)(catmullrom_basis1 + lVar122 + 0x1214);
      fVar210 = *(float *)(catmullrom_basis1 + lVar122 + 0x1218);
      fVar280 = *(float *)(catmullrom_basis1 + lVar122 + 0x121c);
      fVar276 = *(float *)(catmullrom_basis1 + lVar122 + 0x1220);
      fVar277 = *(float *)(catmullrom_basis1 + lVar122 + 0x1224);
      fVar212 = *(float *)(catmullrom_basis1 + lVar122 + 0x1228);
      auVar274._0_4_ = fVar237 * fVar270 + fVar297 * fVar234 + fVar152 * fVar291 + fVar257 * fVar304
      ;
      auVar274._4_4_ = fVar247 * fVar271 + fVar298 * fVar310 + fVar154 * fVar264 + fVar266 * fVar205
      ;
      auVar274._8_4_ = fVar250 * fVar210 + fVar299 * fVar278 + fVar156 * fVar294 + fVar267 * fVar236
      ;
      auVar274._12_4_ =
           fVar253 * fVar280 + fVar300 * fVar312 + fVar157 * fVar265 + fVar268 * fVar246;
      auVar274._16_4_ =
           fVar237 * fVar276 + fVar297 * fVar311 + fVar152 * fVar296 + fVar257 * fVar249;
      auVar274._20_4_ =
           fVar247 * fVar277 + fVar298 * fVar313 + fVar154 * fVar323 + fVar266 * fVar252;
      auVar274._24_4_ =
           fVar250 * fVar212 + fVar299 * fVar279 + fVar156 * fVar191 + fVar267 * fVar309;
      auVar274._28_4_ = fVar150 + fVar150 + fVar251 + fVar281;
      auVar287._0_4_ = fVar174 * fVar270 + fVar128 * fVar234 + fVar129 * fVar291 + fVar314 * fVar304
      ;
      auVar287._4_4_ = fVar188 * fVar271 + fVar142 * fVar310 + fVar144 * fVar264 + fVar320 * fVar205
      ;
      auVar287._8_4_ = fVar189 * fVar210 + fVar145 * fVar278 + fVar147 * fVar294 + fVar321 * fVar236
      ;
      auVar287._12_4_ =
           fVar190 * fVar280 + fVar148 * fVar312 + fVar150 * fVar265 + fVar322 * fVar246;
      auVar287._16_4_ =
           fVar174 * fVar276 + fVar128 * fVar311 + fVar129 * fVar296 + fVar314 * fVar249;
      auVar287._20_4_ =
           fVar188 * fVar277 + fVar142 * fVar313 + fVar144 * fVar323 + fVar320 * fVar252;
      auVar287._24_4_ =
           fVar189 * fVar212 + fVar145 * fVar279 + fVar147 * fVar191 + fVar321 * fVar309;
      auVar287._28_4_ = fVar150 + fVar150 + fVar150 + fVar251;
      auVar187._0_4_ = fVar173 * fVar270 + fVar254 * fVar234 + fVar283 * fVar291 + fVar304 * fVar235
      ;
      auVar187._4_4_ = fVar238 * fVar271 + fVar255 * fVar310 + fVar292 * fVar264 + fVar205 * fVar223
      ;
      auVar187._8_4_ = fVar248 * fVar210 + fVar256 * fVar278 + fVar295 * fVar294 + fVar236 * fVar224
      ;
      auVar187._12_4_ =
           fVar251 * fVar280 + fVar269 * fVar312 + fVar327 * fVar265 + fVar246 * fVar225;
      auVar187._16_4_ =
           fVar173 * fVar276 + fVar254 * fVar311 + fVar283 * fVar296 + fVar249 * fVar235;
      auVar187._20_4_ =
           fVar238 * fVar277 + fVar255 * fVar313 + fVar292 * fVar323 + fVar252 * fVar223;
      auVar187._24_4_ =
           fVar248 * fVar212 + fVar256 * fVar279 + fVar295 * fVar191 + fVar309 * fVar224;
      auVar187._28_4_ =
           *(float *)(catmullrom_basis1 + lVar122 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar122 + 0x1fb8);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar219._16_4_ = 0x7fffffff;
      auVar219._20_4_ = 0x7fffffff;
      auVar219._24_4_ = 0x7fffffff;
      auVar219._28_4_ = 0x7fffffff;
      auVar170 = vandps_avx(_local_580,auVar219);
      auVar26 = vandps_avx(auVar241,auVar219);
      auVar26 = vmaxps_avx(auVar170,auVar26);
      auVar110._4_4_ = fStack_4bc;
      auVar110._0_4_ = local_4c0;
      auVar110._8_4_ = fStack_4b8;
      auVar110._12_4_ = fStack_4b4;
      auVar110._16_4_ = fStack_4b0;
      auVar110._20_4_ = fStack_4ac;
      auVar110._24_4_ = fStack_4a8;
      auVar110._28_4_ = fStack_4a4;
      auVar170 = vandps_avx(auVar219,auVar110);
      auVar170 = vmaxps_avx(auVar26,auVar170);
      auVar196 = vpermilps_avx(auVar183,0);
      auVar242._16_16_ = auVar196;
      auVar242._0_16_ = auVar196;
      auVar170 = vcmpps_avx(auVar170,auVar242,1);
      auVar33 = vblendvps_avx(_local_580,local_340,auVar170);
      auVar27 = vblendvps_avx(auVar241,auVar25,auVar170);
      auVar170 = vandps_avx(auVar274,auVar219);
      auVar26 = vandps_avx(auVar287,auVar219);
      auVar199 = vmaxps_avx(auVar170,auVar26);
      auVar170 = vandps_avx(auVar187,auVar219);
      auVar170 = vmaxps_avx(auVar199,auVar170);
      auVar199 = vcmpps_avx(auVar170,auVar242,1);
      auVar170 = vblendvps_avx(auVar274,local_340,auVar199);
      auVar25 = vblendvps_avx(auVar287,auVar25,auVar199);
      fVar281 = auVar33._0_4_;
      fVar143 = auVar33._4_4_;
      fVar146 = auVar33._8_4_;
      fVar149 = auVar33._12_4_;
      fVar151 = auVar33._16_4_;
      fVar153 = auVar33._20_4_;
      fVar155 = auVar33._24_4_;
      fVar192 = auVar170._0_4_;
      fVar204 = auVar170._4_4_;
      fVar206 = auVar170._8_4_;
      fVar207 = auVar170._12_4_;
      fVar208 = auVar170._16_4_;
      fVar209 = auVar170._20_4_;
      fVar211 = auVar170._24_4_;
      fVar129 = -auVar170._28_4_;
      fVar291 = auVar27._0_4_;
      fVar296 = auVar27._4_4_;
      fVar205 = auVar27._8_4_;
      fVar252 = auVar27._12_4_;
      fVar278 = auVar27._16_4_;
      fVar279 = auVar27._20_4_;
      fVar280 = auVar27._24_4_;
      auVar135._0_4_ = fVar291 * fVar291 + fVar281 * fVar281;
      auVar135._4_4_ = fVar296 * fVar296 + fVar143 * fVar143;
      auVar135._8_4_ = fVar205 * fVar205 + fVar146 * fVar146;
      auVar135._12_4_ = fVar252 * fVar252 + fVar149 * fVar149;
      auVar135._16_4_ = fVar278 * fVar278 + fVar151 * fVar151;
      auVar135._20_4_ = fVar279 * fVar279 + fVar153 * fVar153;
      auVar135._24_4_ = fVar280 * fVar280 + fVar155 * fVar155;
      auVar135._28_4_ = auVar287._28_4_ + auVar33._28_4_;
      auVar33 = vrsqrtps_avx(auVar135);
      fVar264 = auVar33._0_4_;
      fVar294 = auVar33._4_4_;
      auVar15._4_4_ = fVar294 * 1.5;
      auVar15._0_4_ = fVar264 * 1.5;
      fVar265 = auVar33._8_4_;
      auVar15._8_4_ = fVar265 * 1.5;
      fVar323 = auVar33._12_4_;
      auVar15._12_4_ = fVar323 * 1.5;
      fVar191 = auVar33._16_4_;
      auVar15._16_4_ = fVar191 * 1.5;
      fVar304 = auVar33._20_4_;
      auVar15._20_4_ = fVar304 * 1.5;
      fVar236 = auVar33._24_4_;
      fVar172 = auVar26._28_4_;
      auVar15._24_4_ = fVar236 * 1.5;
      auVar15._28_4_ = fVar172;
      auVar16._4_4_ = fVar294 * fVar294 * fVar294 * auVar135._4_4_ * 0.5;
      auVar16._0_4_ = fVar264 * fVar264 * fVar264 * auVar135._0_4_ * 0.5;
      auVar16._8_4_ = fVar265 * fVar265 * fVar265 * auVar135._8_4_ * 0.5;
      auVar16._12_4_ = fVar323 * fVar323 * fVar323 * auVar135._12_4_ * 0.5;
      auVar16._16_4_ = fVar191 * fVar191 * fVar191 * auVar135._16_4_ * 0.5;
      auVar16._20_4_ = fVar304 * fVar304 * fVar304 * auVar135._20_4_ * 0.5;
      auVar16._24_4_ = fVar236 * fVar236 * fVar236 * auVar135._24_4_ * 0.5;
      auVar16._28_4_ = auVar135._28_4_;
      auVar26 = vsubps_avx(auVar15,auVar16);
      fVar264 = auVar26._0_4_;
      fVar323 = auVar26._4_4_;
      fVar236 = auVar26._8_4_;
      fVar309 = auVar26._12_4_;
      fVar312 = auVar26._16_4_;
      fVar270 = auVar26._20_4_;
      fVar276 = auVar26._24_4_;
      fVar294 = auVar25._0_4_;
      fVar191 = auVar25._4_4_;
      fVar246 = auVar25._8_4_;
      fVar234 = auVar25._12_4_;
      fVar311 = auVar25._16_4_;
      fVar271 = auVar25._20_4_;
      fVar277 = auVar25._24_4_;
      auVar136._0_4_ = fVar294 * fVar294 + fVar192 * fVar192;
      auVar136._4_4_ = fVar191 * fVar191 + fVar204 * fVar204;
      auVar136._8_4_ = fVar246 * fVar246 + fVar206 * fVar206;
      auVar136._12_4_ = fVar234 * fVar234 + fVar207 * fVar207;
      auVar136._16_4_ = fVar311 * fVar311 + fVar208 * fVar208;
      auVar136._20_4_ = fVar271 * fVar271 + fVar209 * fVar209;
      auVar136._24_4_ = fVar277 * fVar277 + fVar211 * fVar211;
      auVar136._28_4_ = auVar170._28_4_ + auVar26._28_4_;
      auVar170 = vrsqrtps_avx(auVar136);
      fVar265 = auVar170._0_4_;
      fVar304 = auVar170._4_4_;
      auVar28._4_4_ = fVar304 * 1.5;
      auVar28._0_4_ = fVar265 * 1.5;
      fVar249 = auVar170._8_4_;
      auVar28._8_4_ = fVar249 * 1.5;
      fVar310 = auVar170._12_4_;
      auVar28._12_4_ = fVar310 * 1.5;
      fVar313 = auVar170._16_4_;
      auVar28._16_4_ = fVar313 * 1.5;
      fVar210 = auVar170._20_4_;
      auVar28._20_4_ = fVar210 * 1.5;
      fVar212 = auVar170._24_4_;
      auVar28._24_4_ = fVar212 * 1.5;
      auVar28._28_4_ = fVar172;
      auVar29._4_4_ = fVar304 * fVar304 * fVar304 * auVar136._4_4_ * 0.5;
      auVar29._0_4_ = fVar265 * fVar265 * fVar265 * auVar136._0_4_ * 0.5;
      auVar29._8_4_ = fVar249 * fVar249 * fVar249 * auVar136._8_4_ * 0.5;
      auVar29._12_4_ = fVar310 * fVar310 * fVar310 * auVar136._12_4_ * 0.5;
      auVar29._16_4_ = fVar313 * fVar313 * fVar313 * auVar136._16_4_ * 0.5;
      auVar29._20_4_ = fVar210 * fVar210 * fVar210 * auVar136._20_4_ * 0.5;
      auVar29._24_4_ = fVar212 * fVar212 * fVar212 * auVar136._24_4_ * 0.5;
      auVar29._28_4_ = auVar136._28_4_;
      auVar170 = vsubps_avx(auVar28,auVar29);
      fVar265 = auVar170._0_4_;
      fVar304 = auVar170._4_4_;
      fVar249 = auVar170._8_4_;
      fVar310 = auVar170._12_4_;
      fVar313 = auVar170._16_4_;
      fVar210 = auVar170._20_4_;
      fVar212 = auVar170._24_4_;
      fVar291 = (float)local_840._0_4_ * fVar291 * fVar264;
      fVar296 = (float)local_840._4_4_ * fVar296 * fVar323;
      auVar30._4_4_ = fVar296;
      auVar30._0_4_ = fVar291;
      fVar205 = fStack_838 * fVar205 * fVar236;
      auVar30._8_4_ = fVar205;
      fVar252 = fStack_834 * fVar252 * fVar309;
      auVar30._12_4_ = fVar252;
      fVar278 = fStack_830 * fVar278 * fVar312;
      auVar30._16_4_ = fVar278;
      fVar279 = fStack_82c * fVar279 * fVar270;
      auVar30._20_4_ = fVar279;
      fVar280 = fStack_828 * fVar280 * fVar276;
      auVar30._24_4_ = fVar280;
      auVar30._28_4_ = fVar129;
      local_5a0._4_4_ = fVar296 + auVar260._4_4_;
      local_5a0._0_4_ = fVar291 + auVar260._0_4_;
      fStack_598 = fVar205 + auVar260._8_4_;
      fStack_594 = fVar252 + auVar260._12_4_;
      fStack_590 = fVar278 + auVar261._16_4_;
      fStack_58c = fVar279 + auVar261._20_4_;
      fStack_588 = fVar280 + auVar261._24_4_;
      fStack_584 = fVar129 + auVar261._28_4_;
      fVar291 = (float)local_840._0_4_ * fVar264 * -fVar281;
      fVar296 = (float)local_840._4_4_ * fVar323 * -fVar143;
      auVar32._4_4_ = fVar296;
      auVar32._0_4_ = fVar291;
      fVar205 = fStack_838 * fVar236 * -fVar146;
      auVar32._8_4_ = fVar205;
      fVar252 = fStack_834 * fVar309 * -fVar149;
      auVar32._12_4_ = fVar252;
      fVar278 = fStack_830 * fVar312 * -fVar151;
      auVar32._16_4_ = fVar278;
      fVar279 = fStack_82c * fVar270 * -fVar153;
      auVar32._20_4_ = fVar279;
      fVar280 = fStack_828 * fVar276 * -fVar155;
      auVar32._24_4_ = fVar280;
      auVar32._28_4_ = fVar172;
      local_580._4_4_ = fVar296 + auVar307._4_4_;
      local_580._0_4_ = fVar291 + auVar307._0_4_;
      fStack_578 = fVar205 + auVar307._8_4_;
      fStack_574 = fVar252 + auVar307._12_4_;
      fStack_570 = fVar278 + auVar307._16_4_;
      fStack_56c = fVar279 + auVar307._20_4_;
      fStack_568 = fVar280 + auVar307._24_4_;
      fStack_564 = fVar172 + auVar307._28_4_;
      fVar291 = fVar264 * 0.0 * (float)local_840._0_4_;
      fVar264 = fVar323 * 0.0 * (float)local_840._4_4_;
      auVar31._4_4_ = fVar264;
      auVar31._0_4_ = fVar291;
      fVar296 = fVar236 * 0.0 * fStack_838;
      auVar31._8_4_ = fVar296;
      fVar323 = fVar309 * 0.0 * fStack_834;
      auVar31._12_4_ = fVar323;
      fVar205 = fVar312 * 0.0 * fStack_830;
      auVar31._16_4_ = fVar205;
      fVar236 = fVar270 * 0.0 * fStack_82c;
      auVar31._20_4_ = fVar236;
      fVar252 = fVar276 * 0.0 * fStack_828;
      auVar31._24_4_ = fVar252;
      auVar31._28_4_ = fVar322;
      auVar113._4_4_ = fStack_49c;
      auVar113._0_4_ = local_4a0;
      auVar113._8_4_ = fStack_498;
      auVar113._12_4_ = fStack_494;
      auVar113._16_4_ = fStack_490;
      auVar113._20_4_ = fStack_48c;
      auVar113._24_4_ = fStack_488;
      auVar113._28_4_ = fStack_484;
      auVar243._0_4_ = fVar291 + local_4a0;
      auVar243._4_4_ = fVar264 + fStack_49c;
      auVar243._8_4_ = fVar296 + fStack_498;
      auVar243._12_4_ = fVar323 + fStack_494;
      auVar243._16_4_ = fVar205 + fStack_490;
      auVar243._20_4_ = fVar236 + fStack_48c;
      auVar243._24_4_ = fVar252 + fStack_488;
      auVar243._28_4_ = fVar322 + fStack_484;
      fVar291 = (float)local_780._0_4_ * fVar294 * fVar265;
      fVar264 = local_780._4_4_ * fVar191 * fVar304;
      auVar34._4_4_ = fVar264;
      auVar34._0_4_ = fVar291;
      fVar294 = local_780._8_4_ * fVar246 * fVar249;
      auVar34._8_4_ = fVar294;
      fVar296 = local_780._12_4_ * fVar234 * fVar310;
      auVar34._12_4_ = fVar296;
      fVar323 = local_780._16_4_ * fVar311 * fVar313;
      auVar34._16_4_ = fVar323;
      fVar191 = local_780._20_4_ * fVar271 * fVar210;
      auVar34._20_4_ = fVar191;
      fVar205 = local_780._24_4_ * fVar277 * fVar212;
      auVar34._24_4_ = fVar205;
      auVar34._28_4_ = auVar25._28_4_;
      auVar16 = vsubps_avx(auVar261,auVar30);
      auVar288._0_4_ = auVar217._0_4_ + fVar291;
      auVar288._4_4_ = auVar217._4_4_ + fVar264;
      auVar288._8_4_ = auVar217._8_4_ + fVar294;
      auVar288._12_4_ = auVar217._12_4_ + fVar296;
      auVar288._16_4_ = auVar217._16_4_ + fVar323;
      auVar288._20_4_ = auVar217._20_4_ + fVar191;
      auVar288._24_4_ = auVar217._24_4_ + fVar205;
      auVar288._28_4_ = auVar217._28_4_ + auVar25._28_4_;
      fVar291 = (float)local_780._0_4_ * -fVar192 * fVar265;
      fVar264 = local_780._4_4_ * -fVar204 * fVar304;
      auVar25._4_4_ = fVar264;
      auVar25._0_4_ = fVar291;
      fVar294 = local_780._8_4_ * -fVar206 * fVar249;
      auVar25._8_4_ = fVar294;
      fVar296 = local_780._12_4_ * -fVar207 * fVar310;
      auVar25._12_4_ = fVar296;
      fVar323 = local_780._16_4_ * -fVar208 * fVar313;
      auVar25._16_4_ = fVar323;
      fVar191 = local_780._20_4_ * -fVar209 * fVar210;
      auVar25._20_4_ = fVar191;
      fVar205 = local_780._24_4_ * -fVar211 * fVar212;
      auVar25._24_4_ = fVar205;
      auVar25._28_4_ = fVar269;
      auVar307 = vsubps_avx(auVar307,auVar32);
      auVar302._0_4_ = fVar291 + (float)local_480._0_4_;
      auVar302._4_4_ = fVar264 + (float)local_480._4_4_;
      auVar302._8_4_ = fVar294 + fStack_478;
      auVar302._12_4_ = fVar296 + fStack_474;
      auVar302._16_4_ = fVar323 + fStack_470;
      auVar302._20_4_ = fVar191 + fStack_46c;
      auVar302._24_4_ = fVar205 + fStack_468;
      auVar302._28_4_ = fVar269 + fStack_464;
      fVar291 = fVar265 * 0.0 * (float)local_780._0_4_;
      fVar264 = fVar304 * 0.0 * local_780._4_4_;
      auVar35._4_4_ = fVar264;
      auVar35._0_4_ = fVar291;
      fVar294 = fVar249 * 0.0 * local_780._8_4_;
      auVar35._8_4_ = fVar294;
      fVar265 = fVar310 * 0.0 * local_780._12_4_;
      auVar35._12_4_ = fVar265;
      fVar296 = fVar313 * 0.0 * local_780._16_4_;
      auVar35._16_4_ = fVar296;
      fVar323 = fVar210 * 0.0 * local_780._20_4_;
      auVar35._20_4_ = fVar323;
      fVar191 = fVar212 * 0.0 * local_780._24_4_;
      auVar35._24_4_ = fVar191;
      auVar35._28_4_ = 0x3f000000;
      auVar28 = vsubps_avx(auVar113,auVar31);
      auVar108._4_4_ = fStack_4dc;
      auVar108._0_4_ = local_4e0;
      auVar108._8_4_ = fStack_4d8;
      auVar108._12_4_ = fStack_4d4;
      auVar108._16_4_ = fStack_4d0;
      auVar108._20_4_ = fStack_4cc;
      auVar108._24_4_ = fStack_4c8;
      auVar108._28_4_ = fStack_4c4;
      auVar326._0_4_ = fVar291 + local_4e0;
      auVar326._4_4_ = fVar264 + fStack_4dc;
      auVar326._8_4_ = fVar294 + fStack_4d8;
      auVar326._12_4_ = fVar265 + fStack_4d4;
      auVar326._16_4_ = fVar296 + fStack_4d0;
      auVar326._20_4_ = fVar323 + fStack_4cc;
      auVar326._24_4_ = fVar191 + fStack_4c8;
      auVar326._28_4_ = fStack_4c4 + 0.5;
      auVar170 = vsubps_avx(auVar217,auVar34);
      auVar26 = vsubps_avx(_local_480,auVar25);
      auVar29 = vsubps_avx(auVar108,auVar35);
      auVar25 = vsubps_avx(auVar302,auVar307);
      auVar33 = vsubps_avx(auVar326,auVar28);
      auVar36._4_4_ = auVar28._4_4_ * auVar25._4_4_;
      auVar36._0_4_ = auVar28._0_4_ * auVar25._0_4_;
      auVar36._8_4_ = auVar28._8_4_ * auVar25._8_4_;
      auVar36._12_4_ = auVar28._12_4_ * auVar25._12_4_;
      auVar36._16_4_ = auVar28._16_4_ * auVar25._16_4_;
      auVar36._20_4_ = auVar28._20_4_ * auVar25._20_4_;
      auVar36._24_4_ = auVar28._24_4_ * auVar25._24_4_;
      auVar36._28_4_ = fVar148;
      auVar37._4_4_ = auVar307._4_4_ * auVar33._4_4_;
      auVar37._0_4_ = auVar307._0_4_ * auVar33._0_4_;
      auVar37._8_4_ = auVar307._8_4_ * auVar33._8_4_;
      auVar37._12_4_ = auVar307._12_4_ * auVar33._12_4_;
      auVar37._16_4_ = auVar307._16_4_ * auVar33._16_4_;
      auVar37._20_4_ = auVar307._20_4_ * auVar33._20_4_;
      auVar37._24_4_ = auVar307._24_4_ * auVar33._24_4_;
      auVar37._28_4_ = fStack_464;
      auVar27 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = auVar16._4_4_ * auVar33._4_4_;
      auVar38._0_4_ = auVar16._0_4_ * auVar33._0_4_;
      auVar38._8_4_ = auVar16._8_4_ * auVar33._8_4_;
      auVar38._12_4_ = auVar16._12_4_ * auVar33._12_4_;
      auVar38._16_4_ = auVar16._16_4_ * auVar33._16_4_;
      auVar38._20_4_ = auVar16._20_4_ * auVar33._20_4_;
      auVar38._24_4_ = auVar16._24_4_ * auVar33._24_4_;
      auVar38._28_4_ = auVar33._28_4_;
      auVar199 = vsubps_avx(auVar288,auVar16);
      auVar39._4_4_ = auVar199._4_4_ * auVar28._4_4_;
      auVar39._0_4_ = auVar199._0_4_ * auVar28._0_4_;
      auVar39._8_4_ = auVar199._8_4_ * auVar28._8_4_;
      auVar39._12_4_ = auVar199._12_4_ * auVar28._12_4_;
      auVar39._16_4_ = auVar199._16_4_ * auVar28._16_4_;
      auVar39._20_4_ = auVar199._20_4_ * auVar28._20_4_;
      auVar39._24_4_ = auVar199._24_4_ * auVar28._24_4_;
      auVar39._28_4_ = auVar217._28_4_;
      auVar217 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar199._4_4_ * auVar307._4_4_;
      auVar40._0_4_ = auVar199._0_4_ * auVar307._0_4_;
      auVar40._8_4_ = auVar199._8_4_ * auVar307._8_4_;
      auVar40._12_4_ = auVar199._12_4_ * auVar307._12_4_;
      auVar40._16_4_ = auVar199._16_4_ * auVar307._16_4_;
      auVar40._20_4_ = auVar199._20_4_ * auVar307._20_4_;
      auVar40._24_4_ = auVar199._24_4_ * auVar307._24_4_;
      auVar40._28_4_ = auVar33._28_4_;
      auVar41._4_4_ = auVar16._4_4_ * auVar25._4_4_;
      auVar41._0_4_ = auVar16._0_4_ * auVar25._0_4_;
      auVar41._8_4_ = auVar16._8_4_ * auVar25._8_4_;
      auVar41._12_4_ = auVar16._12_4_ * auVar25._12_4_;
      auVar41._16_4_ = auVar16._16_4_ * auVar25._16_4_;
      auVar41._20_4_ = auVar16._20_4_ * auVar25._20_4_;
      auVar41._24_4_ = auVar16._24_4_ * auVar25._24_4_;
      auVar41._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar40);
      auVar137._0_4_ = auVar27._0_4_ * 0.0 + auVar25._0_4_ + auVar217._0_4_ * 0.0;
      auVar137._4_4_ = auVar27._4_4_ * 0.0 + auVar25._4_4_ + auVar217._4_4_ * 0.0;
      auVar137._8_4_ = auVar27._8_4_ * 0.0 + auVar25._8_4_ + auVar217._8_4_ * 0.0;
      auVar137._12_4_ = auVar27._12_4_ * 0.0 + auVar25._12_4_ + auVar217._12_4_ * 0.0;
      auVar137._16_4_ = auVar27._16_4_ * 0.0 + auVar25._16_4_ + auVar217._16_4_ * 0.0;
      auVar137._20_4_ = auVar27._20_4_ * 0.0 + auVar25._20_4_ + auVar217._20_4_ * 0.0;
      auVar137._24_4_ = auVar27._24_4_ * 0.0 + auVar25._24_4_ + auVar217._24_4_ * 0.0;
      auVar137._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar217._28_4_;
      auVar15 = vcmpps_avx(auVar137,ZEXT432(0) << 0x20,2);
      auVar170 = vblendvps_avx(auVar170,_local_5a0,auVar15);
      auVar26 = vblendvps_avx(auVar26,_local_580,auVar15);
      auVar25 = vblendvps_avx(auVar29,auVar243,auVar15);
      auVar33 = vblendvps_avx(auVar16,auVar288,auVar15);
      auVar27 = vblendvps_avx(auVar307,auVar302,auVar15);
      auVar199 = vblendvps_avx(auVar28,auVar326,auVar15);
      auVar217 = vblendvps_avx(auVar288,auVar16,auVar15);
      auVar307 = vblendvps_avx(auVar302,auVar307,auVar15);
      _local_680 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      _auStack_670 = auVar261._16_16_;
      auVar261 = vblendvps_avx(auVar326,auVar28,auVar15);
      auVar217 = vsubps_avx(auVar217,auVar170);
      auVar16 = vsubps_avx(auVar307,auVar26);
      auVar261 = vsubps_avx(auVar261,auVar25);
      auVar28 = vsubps_avx(auVar26,auVar27);
      fVar291 = auVar16._0_4_;
      fVar155 = auVar25._0_4_;
      fVar323 = auVar16._4_4_;
      fVar192 = auVar25._4_4_;
      auVar42._4_4_ = fVar192 * fVar323;
      auVar42._0_4_ = fVar155 * fVar291;
      fVar246 = auVar16._8_4_;
      fVar204 = auVar25._8_4_;
      auVar42._8_4_ = fVar204 * fVar246;
      fVar310 = auVar16._12_4_;
      fVar206 = auVar25._12_4_;
      auVar42._12_4_ = fVar206 * fVar310;
      fVar279 = auVar16._16_4_;
      fVar207 = auVar25._16_4_;
      auVar42._16_4_ = fVar207 * fVar279;
      fVar276 = auVar16._20_4_;
      fVar208 = auVar25._20_4_;
      auVar42._20_4_ = fVar208 * fVar276;
      fVar143 = auVar16._24_4_;
      fVar209 = auVar25._24_4_;
      auVar42._24_4_ = fVar209 * fVar143;
      auVar42._28_4_ = auVar307._28_4_;
      fVar264 = auVar26._0_4_;
      fVar156 = auVar261._0_4_;
      fVar191 = auVar26._4_4_;
      fVar157 = auVar261._4_4_;
      auVar43._4_4_ = fVar157 * fVar191;
      auVar43._0_4_ = fVar156 * fVar264;
      fVar249 = auVar26._8_4_;
      fVar235 = auVar261._8_4_;
      auVar43._8_4_ = fVar235 * fVar249;
      fVar278 = auVar26._12_4_;
      fVar237 = auVar261._12_4_;
      auVar43._12_4_ = fVar237 * fVar278;
      fVar270 = auVar26._16_4_;
      fVar247 = auVar261._16_4_;
      auVar43._16_4_ = fVar247 * fVar270;
      fVar277 = auVar26._20_4_;
      fVar250 = auVar261._20_4_;
      auVar43._20_4_ = fVar250 * fVar277;
      fVar146 = auVar26._24_4_;
      fVar253 = auVar261._24_4_;
      uVar126 = auVar29._28_4_;
      auVar43._24_4_ = fVar253 * fVar146;
      auVar43._28_4_ = uVar126;
      auVar307 = vsubps_avx(auVar43,auVar42);
      fVar294 = auVar170._0_4_;
      fVar304 = auVar170._4_4_;
      auVar44._4_4_ = fVar157 * fVar304;
      auVar44._0_4_ = fVar156 * fVar294;
      fVar252 = auVar170._8_4_;
      auVar44._8_4_ = fVar235 * fVar252;
      fVar312 = auVar170._12_4_;
      auVar44._12_4_ = fVar237 * fVar312;
      fVar271 = auVar170._16_4_;
      auVar44._16_4_ = fVar247 * fVar271;
      fVar212 = auVar170._20_4_;
      auVar44._20_4_ = fVar250 * fVar212;
      fVar149 = auVar170._24_4_;
      auVar44._24_4_ = fVar253 * fVar149;
      auVar44._28_4_ = uVar126;
      fVar265 = auVar217._0_4_;
      fVar205 = auVar217._4_4_;
      auVar45._4_4_ = fVar192 * fVar205;
      auVar45._0_4_ = fVar155 * fVar265;
      fVar309 = auVar217._8_4_;
      auVar45._8_4_ = fVar204 * fVar309;
      fVar311 = auVar217._12_4_;
      auVar45._12_4_ = fVar206 * fVar311;
      fVar210 = auVar217._16_4_;
      auVar45._16_4_ = fVar207 * fVar210;
      fVar172 = auVar217._20_4_;
      auVar45._20_4_ = fVar208 * fVar172;
      fVar151 = auVar217._24_4_;
      auVar45._24_4_ = fVar209 * fVar151;
      auVar45._28_4_ = auVar326._28_4_;
      auVar29 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = fVar191 * fVar205;
      auVar46._0_4_ = fVar264 * fVar265;
      auVar46._8_4_ = fVar249 * fVar309;
      auVar46._12_4_ = fVar278 * fVar311;
      auVar46._16_4_ = fVar270 * fVar210;
      auVar46._20_4_ = fVar277 * fVar172;
      auVar46._24_4_ = fVar146 * fVar151;
      auVar46._28_4_ = uVar126;
      auVar328._0_4_ = fVar294 * fVar291;
      auVar328._4_4_ = fVar304 * fVar323;
      auVar328._8_4_ = fVar252 * fVar246;
      auVar328._12_4_ = fVar312 * fVar310;
      auVar328._16_4_ = fVar271 * fVar279;
      auVar328._20_4_ = fVar212 * fVar276;
      auVar328._24_4_ = fVar149 * fVar143;
      auVar328._28_4_ = 0;
      auVar30 = vsubps_avx(auVar328,auVar46);
      auVar32 = vsubps_avx(auVar25,auVar199);
      fVar296 = auVar30._28_4_ + auVar29._28_4_;
      auVar166._0_4_ = auVar30._0_4_ + auVar29._0_4_ * 0.0 + auVar307._0_4_ * 0.0;
      auVar166._4_4_ = auVar30._4_4_ + auVar29._4_4_ * 0.0 + auVar307._4_4_ * 0.0;
      auVar166._8_4_ = auVar30._8_4_ + auVar29._8_4_ * 0.0 + auVar307._8_4_ * 0.0;
      auVar166._12_4_ = auVar30._12_4_ + auVar29._12_4_ * 0.0 + auVar307._12_4_ * 0.0;
      auVar166._16_4_ = auVar30._16_4_ + auVar29._16_4_ * 0.0 + auVar307._16_4_ * 0.0;
      auVar166._20_4_ = auVar30._20_4_ + auVar29._20_4_ * 0.0 + auVar307._20_4_ * 0.0;
      auVar166._24_4_ = auVar30._24_4_ + auVar29._24_4_ * 0.0 + auVar307._24_4_ * 0.0;
      auVar166._28_4_ = fVar296 + auVar307._28_4_;
      fVar211 = auVar28._0_4_;
      fVar129 = auVar28._4_4_;
      auVar47._4_4_ = fVar129 * auVar199._4_4_;
      auVar47._0_4_ = fVar211 * auVar199._0_4_;
      fVar144 = auVar28._8_4_;
      auVar47._8_4_ = fVar144 * auVar199._8_4_;
      fVar147 = auVar28._12_4_;
      auVar47._12_4_ = fVar147 * auVar199._12_4_;
      fVar150 = auVar28._16_4_;
      auVar47._16_4_ = fVar150 * auVar199._16_4_;
      fVar152 = auVar28._20_4_;
      auVar47._20_4_ = fVar152 * auVar199._20_4_;
      fVar154 = auVar28._24_4_;
      auVar47._24_4_ = fVar154 * auVar199._24_4_;
      auVar47._28_4_ = fVar296;
      fVar296 = auVar32._0_4_;
      fVar236 = auVar32._4_4_;
      auVar48._4_4_ = auVar27._4_4_ * fVar236;
      auVar48._0_4_ = auVar27._0_4_ * fVar296;
      fVar234 = auVar32._8_4_;
      auVar48._8_4_ = auVar27._8_4_ * fVar234;
      fVar313 = auVar32._12_4_;
      auVar48._12_4_ = auVar27._12_4_ * fVar313;
      fVar280 = auVar32._16_4_;
      auVar48._16_4_ = auVar27._16_4_ * fVar280;
      fVar281 = auVar32._20_4_;
      auVar48._20_4_ = auVar27._20_4_ * fVar281;
      fVar153 = auVar32._24_4_;
      auVar48._24_4_ = auVar27._24_4_ * fVar153;
      auVar48._28_4_ = auVar30._28_4_;
      auVar28 = vsubps_avx(auVar48,auVar47);
      auVar29 = vsubps_avx(auVar170,auVar33);
      fVar223 = auVar29._0_4_;
      fVar224 = auVar29._4_4_;
      auVar49._4_4_ = fVar224 * auVar199._4_4_;
      auVar49._0_4_ = fVar223 * auVar199._0_4_;
      fVar225 = auVar29._8_4_;
      auVar49._8_4_ = fVar225 * auVar199._8_4_;
      fVar173 = auVar29._12_4_;
      auVar49._12_4_ = fVar173 * auVar199._12_4_;
      fVar238 = auVar29._16_4_;
      auVar49._16_4_ = fVar238 * auVar199._16_4_;
      fVar248 = auVar29._20_4_;
      auVar49._20_4_ = fVar248 * auVar199._20_4_;
      fVar251 = auVar29._24_4_;
      auVar49._24_4_ = fVar251 * auVar199._24_4_;
      auVar49._28_4_ = auVar199._28_4_;
      auVar50._4_4_ = auVar33._4_4_ * fVar236;
      auVar50._0_4_ = auVar33._0_4_ * fVar296;
      auVar50._8_4_ = auVar33._8_4_ * fVar234;
      auVar50._12_4_ = auVar33._12_4_ * fVar313;
      auVar50._16_4_ = auVar33._16_4_ * fVar280;
      auVar50._20_4_ = auVar33._20_4_ * fVar281;
      auVar50._24_4_ = auVar33._24_4_ * fVar153;
      auVar50._28_4_ = auVar307._28_4_;
      auVar307 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar27._4_4_ * fVar224;
      auVar51._0_4_ = auVar27._0_4_ * fVar223;
      auVar51._8_4_ = auVar27._8_4_ * fVar225;
      auVar51._12_4_ = auVar27._12_4_ * fVar173;
      auVar51._16_4_ = auVar27._16_4_ * fVar238;
      auVar51._20_4_ = auVar27._20_4_ * fVar248;
      auVar51._24_4_ = auVar27._24_4_ * fVar251;
      auVar51._28_4_ = auVar199._28_4_;
      auVar52._4_4_ = auVar33._4_4_ * fVar129;
      auVar52._0_4_ = auVar33._0_4_ * fVar211;
      auVar52._8_4_ = auVar33._8_4_ * fVar144;
      auVar52._12_4_ = auVar33._12_4_ * fVar147;
      auVar52._16_4_ = auVar33._16_4_ * fVar150;
      auVar52._20_4_ = auVar33._20_4_ * fVar152;
      auVar52._24_4_ = auVar33._24_4_ * fVar154;
      auVar52._28_4_ = auVar33._28_4_;
      auVar33 = vsubps_avx(auVar52,auVar51);
      auVar220._0_4_ = auVar28._0_4_ * 0.0 + auVar33._0_4_ + auVar307._0_4_ * 0.0;
      auVar220._4_4_ = auVar28._4_4_ * 0.0 + auVar33._4_4_ + auVar307._4_4_ * 0.0;
      auVar220._8_4_ = auVar28._8_4_ * 0.0 + auVar33._8_4_ + auVar307._8_4_ * 0.0;
      auVar220._12_4_ = auVar28._12_4_ * 0.0 + auVar33._12_4_ + auVar307._12_4_ * 0.0;
      auVar220._16_4_ = auVar28._16_4_ * 0.0 + auVar33._16_4_ + auVar307._16_4_ * 0.0;
      auVar220._20_4_ = auVar28._20_4_ * 0.0 + auVar33._20_4_ + auVar307._20_4_ * 0.0;
      auVar220._24_4_ = auVar28._24_4_ * 0.0 + auVar33._24_4_ + auVar307._24_4_ * 0.0;
      auVar220._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar307._28_4_;
      auVar33 = vmaxps_avx(auVar166,auVar220);
      auVar33 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,2);
      auVar196 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
      auVar196 = vpand_avx(auVar196,_local_680);
      auVar197 = vpmovsxwd_avx(auVar196);
      auVar198 = vpunpckhwd_avx(auVar196,auVar196);
      auVar200._16_16_ = auVar198;
      auVar200._0_16_ = auVar197;
      if ((((((((auVar200 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar200 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar200 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar200 >> 0x7f,0) == '\0') &&
            (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar198 >> 0x3f,0) == '\0') &&
          (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar198[0xf]
         ) {
LAB_0093daa6:
        auVar230._8_8_ = uStack_4f8;
        auVar230._0_8_ = local_500;
        auVar230._16_8_ = uStack_4f0;
        auVar230._24_8_ = uStack_4e8;
        auVar203 = ZEXT3264(auVar200);
        auVar171 = ZEXT3264(local_540);
        auVar233 = ZEXT3264(local_560);
      }
      else {
        auVar53._4_4_ = fVar236 * fVar323;
        auVar53._0_4_ = fVar296 * fVar291;
        auVar53._8_4_ = fVar234 * fVar246;
        auVar53._12_4_ = fVar313 * fVar310;
        auVar53._16_4_ = fVar280 * fVar279;
        auVar53._20_4_ = fVar281 * fVar276;
        auVar53._24_4_ = fVar153 * fVar143;
        auVar53._28_4_ = auVar198._12_4_;
        auVar315._0_4_ = fVar211 * fVar156;
        auVar315._4_4_ = fVar129 * fVar157;
        auVar315._8_4_ = fVar144 * fVar235;
        auVar315._12_4_ = fVar147 * fVar237;
        auVar315._16_4_ = fVar150 * fVar247;
        auVar315._20_4_ = fVar152 * fVar250;
        auVar315._24_4_ = fVar154 * fVar253;
        auVar315._28_4_ = 0;
        auVar33 = vsubps_avx(auVar315,auVar53);
        auVar54._4_4_ = fVar224 * fVar157;
        auVar54._0_4_ = fVar223 * fVar156;
        auVar54._8_4_ = fVar225 * fVar235;
        auVar54._12_4_ = fVar173 * fVar237;
        auVar54._16_4_ = fVar238 * fVar247;
        auVar54._20_4_ = fVar248 * fVar250;
        auVar54._24_4_ = fVar251 * fVar253;
        auVar54._28_4_ = auVar261._28_4_;
        auVar55._4_4_ = fVar236 * fVar205;
        auVar55._0_4_ = fVar296 * fVar265;
        auVar55._8_4_ = fVar234 * fVar309;
        auVar55._12_4_ = fVar313 * fVar311;
        auVar55._16_4_ = fVar280 * fVar210;
        auVar55._20_4_ = fVar281 * fVar172;
        auVar55._24_4_ = fVar153 * fVar151;
        auVar55._28_4_ = auVar32._28_4_;
        auVar199 = vsubps_avx(auVar55,auVar54);
        auVar56._4_4_ = fVar129 * fVar205;
        auVar56._0_4_ = fVar211 * fVar265;
        auVar56._8_4_ = fVar144 * fVar309;
        auVar56._12_4_ = fVar147 * fVar311;
        auVar56._16_4_ = fVar150 * fVar210;
        auVar56._20_4_ = fVar152 * fVar172;
        auVar56._24_4_ = fVar154 * fVar151;
        auVar56._28_4_ = auVar166._28_4_;
        auVar57._4_4_ = fVar224 * fVar323;
        auVar57._0_4_ = fVar223 * fVar291;
        auVar57._8_4_ = fVar225 * fVar246;
        auVar57._12_4_ = fVar173 * fVar310;
        auVar57._16_4_ = fVar238 * fVar279;
        auVar57._20_4_ = fVar248 * fVar276;
        auVar57._24_4_ = fVar251 * fVar143;
        auVar57._28_4_ = auVar16._28_4_;
        auVar261 = vsubps_avx(auVar57,auVar56);
        auVar262._0_4_ = auVar33._0_4_ * 0.0 + auVar261._0_4_ + auVar199._0_4_ * 0.0;
        auVar262._4_4_ = auVar33._4_4_ * 0.0 + auVar261._4_4_ + auVar199._4_4_ * 0.0;
        auVar262._8_4_ = auVar33._8_4_ * 0.0 + auVar261._8_4_ + auVar199._8_4_ * 0.0;
        auVar262._12_4_ = auVar33._12_4_ * 0.0 + auVar261._12_4_ + auVar199._12_4_ * 0.0;
        auVar262._16_4_ = auVar33._16_4_ * 0.0 + auVar261._16_4_ + auVar199._16_4_ * 0.0;
        auVar262._20_4_ = auVar33._20_4_ * 0.0 + auVar261._20_4_ + auVar199._20_4_ * 0.0;
        auVar262._24_4_ = auVar33._24_4_ * 0.0 + auVar261._24_4_ + auVar199._24_4_ * 0.0;
        auVar262._28_4_ = auVar16._28_4_ + auVar261._28_4_ + auVar166._28_4_;
        auVar27 = vrcpps_avx(auVar262);
        fVar291 = auVar27._0_4_;
        fVar265 = auVar27._4_4_;
        auVar58._4_4_ = auVar262._4_4_ * fVar265;
        auVar58._0_4_ = auVar262._0_4_ * fVar291;
        fVar296 = auVar27._8_4_;
        auVar58._8_4_ = auVar262._8_4_ * fVar296;
        fVar323 = auVar27._12_4_;
        auVar58._12_4_ = auVar262._12_4_ * fVar323;
        fVar205 = auVar27._16_4_;
        auVar58._16_4_ = auVar262._16_4_ * fVar205;
        fVar236 = auVar27._20_4_;
        auVar58._20_4_ = auVar262._20_4_ * fVar236;
        fVar246 = auVar27._24_4_;
        auVar58._24_4_ = auVar262._24_4_ * fVar246;
        auVar58._28_4_ = auVar32._28_4_;
        auVar316._8_4_ = 0x3f800000;
        auVar316._0_8_ = 0x3f8000003f800000;
        auVar316._12_4_ = 0x3f800000;
        auVar316._16_4_ = 0x3f800000;
        auVar316._20_4_ = 0x3f800000;
        auVar316._24_4_ = 0x3f800000;
        auVar316._28_4_ = 0x3f800000;
        auVar307 = vsubps_avx(auVar316,auVar58);
        fVar291 = auVar307._0_4_ * fVar291 + fVar291;
        fVar265 = auVar307._4_4_ * fVar265 + fVar265;
        fVar296 = auVar307._8_4_ * fVar296 + fVar296;
        fVar323 = auVar307._12_4_ * fVar323 + fVar323;
        fVar205 = auVar307._16_4_ * fVar205 + fVar205;
        fVar236 = auVar307._20_4_ * fVar236 + fVar236;
        fVar246 = auVar307._24_4_ * fVar246 + fVar246;
        auVar59._4_4_ =
             (auVar33._4_4_ * fVar304 + auVar199._4_4_ * fVar191 + auVar261._4_4_ * fVar192) *
             fVar265;
        auVar59._0_4_ =
             (auVar33._0_4_ * fVar294 + auVar199._0_4_ * fVar264 + auVar261._0_4_ * fVar155) *
             fVar291;
        auVar59._8_4_ =
             (auVar33._8_4_ * fVar252 + auVar199._8_4_ * fVar249 + auVar261._8_4_ * fVar204) *
             fVar296;
        auVar59._12_4_ =
             (auVar33._12_4_ * fVar312 + auVar199._12_4_ * fVar278 + auVar261._12_4_ * fVar206) *
             fVar323;
        auVar59._16_4_ =
             (auVar33._16_4_ * fVar271 + auVar199._16_4_ * fVar270 + auVar261._16_4_ * fVar207) *
             fVar205;
        auVar59._20_4_ =
             (auVar33._20_4_ * fVar212 + auVar199._20_4_ * fVar277 + auVar261._20_4_ * fVar208) *
             fVar236;
        auVar59._24_4_ =
             (auVar33._24_4_ * fVar149 + auVar199._24_4_ * fVar146 + auVar261._24_4_ * fVar209) *
             fVar246;
        auVar59._28_4_ = auVar170._28_4_ + auVar217._28_4_ + auVar25._28_4_;
        auVar197 = vpermilps_avx(ZEXT416(uVar120),0);
        auVar201._16_16_ = auVar197;
        auVar201._0_16_ = auVar197;
        auVar25 = vcmpps_avx(auVar201,auVar59,2);
        uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar228._4_4_ = uVar126;
        auVar228._0_4_ = uVar126;
        auVar228._8_4_ = uVar126;
        auVar228._12_4_ = uVar126;
        auVar228._16_4_ = uVar126;
        auVar228._20_4_ = uVar126;
        auVar228._24_4_ = uVar126;
        auVar228._28_4_ = uVar126;
        auVar33 = vcmpps_avx(auVar59,auVar228,2);
        auVar25 = vandps_avx(auVar33,auVar25);
        auVar197 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar196 = vpand_avx(auVar196,auVar197);
        auVar197 = vpmovsxwd_avx(auVar196);
        auVar198 = vpshufd_avx(auVar196,0xee);
        auVar198 = vpmovsxwd_avx(auVar198);
        auVar200._16_16_ = auVar198;
        auVar200._0_16_ = auVar197;
        if ((((((((auVar200 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar200 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar200 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar200 >> 0x7f,0) == '\0') &&
              (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar198 >> 0x3f,0) == '\0') &&
            (auVar200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar198[0xf]) goto LAB_0093daa6;
        auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,auVar262,4);
        auVar197 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar196 = vpand_avx(auVar196,auVar197);
        auVar197 = vpmovsxwd_avx(auVar196);
        auVar196 = vpunpckhwd_avx(auVar196,auVar196);
        auVar203 = ZEXT1664(auVar196);
        auVar244._16_16_ = auVar196;
        auVar244._0_16_ = auVar197;
        auVar230._8_8_ = uStack_4f8;
        auVar230._0_8_ = local_500;
        auVar230._16_8_ = uStack_4f0;
        auVar230._24_8_ = uStack_4e8;
        auVar171 = ZEXT3264(local_540);
        auVar233 = ZEXT3264(local_560);
        if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar244 >> 0x7f,0) != '\0') ||
              (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar196 >> 0x3f,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar196[0xf] < '\0') {
          auVar202._0_4_ = auVar166._0_4_ * fVar291;
          auVar202._4_4_ = auVar166._4_4_ * fVar265;
          auVar202._8_4_ = auVar166._8_4_ * fVar296;
          auVar202._12_4_ = auVar166._12_4_ * fVar323;
          auVar202._16_4_ = auVar166._16_4_ * fVar205;
          auVar202._20_4_ = auVar166._20_4_ * fVar236;
          auVar202._24_4_ = auVar166._24_4_ * fVar246;
          auVar202._28_4_ = 0;
          auVar60._4_4_ = auVar220._4_4_ * fVar265;
          auVar60._0_4_ = auVar220._0_4_ * fVar291;
          auVar60._8_4_ = auVar220._8_4_ * fVar296;
          auVar60._12_4_ = auVar220._12_4_ * fVar323;
          auVar60._16_4_ = auVar220._16_4_ * fVar205;
          auVar60._20_4_ = auVar220._20_4_ * fVar236;
          auVar60._24_4_ = auVar220._24_4_ * fVar246;
          auVar60._28_4_ = auVar307._28_4_ + auVar27._28_4_;
          auVar229._8_4_ = 0x3f800000;
          auVar229._0_8_ = 0x3f8000003f800000;
          auVar229._12_4_ = 0x3f800000;
          auVar229._16_4_ = 0x3f800000;
          auVar229._20_4_ = 0x3f800000;
          auVar229._24_4_ = 0x3f800000;
          auVar229._28_4_ = 0x3f800000;
          auVar25 = vsubps_avx(auVar229,auVar202);
          auVar25 = vblendvps_avx(auVar25,auVar202,auVar15);
          auVar171 = ZEXT3264(auVar25);
          auVar25 = vsubps_avx(auVar229,auVar60);
          auVar203 = ZEXT3264(auVar25);
          _local_360 = vblendvps_avx(auVar25,auVar60,auVar15);
          auVar233 = ZEXT3264(auVar59);
          auVar230 = auVar244;
        }
      }
      local_560 = auVar233._0_32_;
      local_540 = auVar171._0_32_;
      if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar230 >> 0x7f,0) != '\0') ||
            (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar230 >> 0xbf,0) != '\0') ||
          (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar230[0x1f] < '\0') {
        auVar25 = vsubps_avx(local_780,_local_840);
        local_840._0_4_ = (float)local_840._0_4_ + auVar171._0_4_ * auVar25._0_4_;
        local_840._4_4_ = (float)local_840._4_4_ + auVar171._4_4_ * auVar25._4_4_;
        fStack_838 = fStack_838 + auVar171._8_4_ * auVar25._8_4_;
        fStack_834 = fStack_834 + auVar171._12_4_ * auVar25._12_4_;
        fStack_830 = fStack_830 + auVar171._16_4_ * auVar25._16_4_;
        fStack_82c = fStack_82c + auVar171._20_4_ * auVar25._20_4_;
        fStack_828 = fStack_828 + auVar171._24_4_ * auVar25._24_4_;
        fStack_824 = fStack_824 + auVar25._28_4_;
        fVar291 = *(float *)((long)local_7b0->ray_space + k * 4 + -0x10);
        auVar61._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar291;
        auVar61._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar291;
        auVar61._8_4_ = (fStack_838 + fStack_838) * fVar291;
        auVar61._12_4_ = (fStack_834 + fStack_834) * fVar291;
        auVar61._16_4_ = (fStack_830 + fStack_830) * fVar291;
        auVar61._20_4_ = (fStack_82c + fStack_82c) * fVar291;
        auVar61._24_4_ = (fStack_828 + fStack_828) * fVar291;
        auVar61._28_4_ = fStack_824 + fStack_824;
        auVar25 = vcmpps_avx(local_560,auVar61,6);
        auVar33 = auVar230 & auVar25;
        auVar141 = ZEXT3264(auVar218);
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0x7f,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0xbf,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar33[0x1f] < '\0') {
          local_220 = vandps_avx(auVar25,auVar230);
          local_2c0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
          local_2c0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
          fStack_2b8 = (float)uStack_358 + (float)uStack_358 + -1.0;
          fStack_2b4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
          fStack_2b0 = (float)uStack_350 + (float)uStack_350 + -1.0;
          fStack_2ac = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
          fStack_2a8 = (float)uStack_348 + (float)uStack_348 + -1.0;
          fStack_2a4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
          local_280 = 0;
          uStack_268 = uStack_6c8;
          uStack_258 = uStack_6d8;
          uStack_248 = uStack_5a8;
          uStack_238 = uStack_5b8;
          local_360._4_4_ = local_2c0._4_4_;
          local_360._0_4_ = local_2c0._0_4_;
          uStack_358._0_4_ = fStack_2b8;
          uStack_358._4_4_ = fStack_2b4;
          uStack_350._0_4_ = fStack_2b0;
          uStack_350._4_4_ = fStack_2ac;
          auVar165 = _local_360;
          uStack_348._0_4_ = fStack_2a8;
          uStack_348._4_4_ = fStack_2a4;
          auVar25 = _local_360;
          if ((pGVar125->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar124 = 0;
            auVar319 = ZEXT3264(_local_7a0);
          }
          else {
            auVar319 = ZEXT3264(_local_7a0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar124 = CONCAT71((int7)(uVar124 >> 8),1),
               pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar179._0_4_ = 1.0 / (float)local_5d0._0_4_;
              auVar179._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar183 = vshufps_avx(auVar179,auVar179,0);
              local_200[0] = auVar183._0_4_ * (auVar171._0_4_ + 0.0);
              local_200[1] = auVar183._4_4_ * (auVar171._4_4_ + 1.0);
              local_200[2] = auVar183._8_4_ * (auVar171._8_4_ + 2.0);
              local_200[3] = auVar183._12_4_ * (auVar171._12_4_ + 3.0);
              fStack_1f0 = auVar183._0_4_ * (auVar171._16_4_ + 4.0);
              fStack_1ec = auVar183._4_4_ * (auVar171._20_4_ + 5.0);
              fStack_1e8 = auVar183._8_4_ * (auVar171._24_4_ + 6.0);
              fStack_1e4 = auVar171._28_4_ + 7.0;
              uStack_350 = auVar165._16_8_;
              uStack_348 = auVar25._24_8_;
              local_1e0 = local_360;
              uStack_1d8 = uStack_358;
              uStack_1d0 = uStack_350;
              uStack_1c8 = uStack_348;
              local_1c0 = local_560;
              uVar126 = vmovmskps_avx(local_220);
              uVar124 = CONCAT44((int)(uVar124 >> 0x20),uVar126);
              uVar121 = 0;
              if (uVar124 != 0) {
                for (; (uVar124 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                }
              }
              _local_620 = vshufps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0);
              _auStack_610 = auVar170._16_16_;
              _local_720 = vpermilps_avx(ZEXT416(uVar10),0);
              _auStack_710 = auVar26._16_16_;
              _local_740 = auVar218;
              _local_360 = auVar25;
              local_2e0 = local_540;
              local_2a0 = local_560;
              local_27c = uVar11;
              local_270 = local_6d0;
              local_260 = local_6e0;
              local_250 = local_5b0;
              local_240 = local_5c0;
              while( true ) {
                auVar218 = auVar141._0_32_;
                if (uVar124 == 0) break;
                uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_3e0 = local_200[uVar121];
                local_3d0 = *(undefined4 *)((long)&local_1e0 + uVar121 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar121 * 4);
                fVar264 = 1.0 - local_3e0;
                fVar291 = local_3e0 * 3.0;
                auVar183 = ZEXT416((uint)((fVar264 * -2.0 * local_3e0 + local_3e0 * local_3e0) * 0.5
                                         ));
                auVar183 = vshufps_avx(auVar183,auVar183,0);
                auVar196 = ZEXT416((uint)(((fVar264 + fVar264) * (fVar291 + 2.0) +
                                          fVar264 * fVar264 * -3.0) * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                auVar197 = ZEXT416((uint)(((local_3e0 + local_3e0) * (fVar291 + -5.0) +
                                          local_3e0 * fVar291) * 0.5));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                local_6b0.context = context->user;
                auVar198 = ZEXT416((uint)((local_3e0 * (fVar264 + fVar264) - fVar264 * fVar264) *
                                         0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                auVar180._0_4_ =
                     auVar198._0_4_ * (float)local_6d0._0_4_ +
                     auVar197._0_4_ * (float)local_6e0._0_4_ +
                     auVar183._0_4_ * (float)local_5c0._0_4_ +
                     auVar196._0_4_ * (float)local_5b0._0_4_;
                auVar180._4_4_ =
                     auVar198._4_4_ * (float)local_6d0._4_4_ +
                     auVar197._4_4_ * (float)local_6e0._4_4_ +
                     auVar183._4_4_ * (float)local_5c0._4_4_ +
                     auVar196._4_4_ * (float)local_5b0._4_4_;
                auVar180._8_4_ =
                     auVar198._8_4_ * (float)uStack_6c8 +
                     auVar197._8_4_ * (float)uStack_6d8 +
                     auVar183._8_4_ * (float)uStack_5b8 + auVar196._8_4_ * (float)uStack_5a8;
                auVar180._12_4_ =
                     auVar198._12_4_ * uStack_6c8._4_4_ +
                     auVar197._12_4_ * uStack_6d8._4_4_ +
                     auVar183._12_4_ * uStack_5b8._4_4_ + auVar196._12_4_ * uStack_5a8._4_4_;
                local_410 = (RTCHitN  [16])vshufps_avx(auVar180,auVar180,0);
                local_400 = vshufps_avx(auVar180,auVar180,0x55);
                auVar203 = ZEXT1664(local_400);
                local_3f0 = vshufps_avx(auVar180,auVar180,0xaa);
                local_3c0 = local_720;
                uStack_3b8 = uStack_718;
                local_3b0 = _local_620;
                vcmpps_avx(ZEXT1632(_local_620),ZEXT1632(_local_620),0xf);
                uStack_39c = (local_6b0.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_6b0.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_7c0 = *local_6b8;
                local_6b0.valid = (int *)local_7c0;
                local_6b0.geometryUserPtr = pGVar125->userPtr;
                local_6b0.hit = local_410;
                local_6b0.N = 4;
                local_780._0_8_ = uVar121;
                local_680._0_4_ = uVar126;
                local_6b0.ray = (RTCRayN *)ray;
                fStack_3dc = local_3e0;
                fStack_3d8 = local_3e0;
                fStack_3d4 = local_3e0;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                if (pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar203 = ZEXT1664(local_400);
                  (*pGVar125->occlusionFilterN)(&local_6b0);
                  auVar319 = ZEXT3264(_local_7a0);
                  auVar233 = ZEXT3264(local_560);
                  auVar171 = ZEXT3264(local_540);
                  uVar121 = local_780._0_8_;
                  uVar126 = local_680._0_4_;
                  fVar128 = (float)local_700._0_4_;
                  fVar142 = (float)local_700._4_4_;
                  fVar145 = fStack_6f8;
                  fVar148 = fStack_6f4;
                  fVar258 = fStack_6f0;
                  fVar282 = fStack_6ec;
                  fVar263 = fStack_6e8;
                }
                if (local_7c0 == (undefined1  [16])0x0) {
                  auVar183 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar183 = auVar183 ^ _DAT_01f46b70;
                  auVar141 = ZEXT3264(_local_740);
                }
                else {
                  p_Var14 = context->args->filter;
                  if (p_Var14 == (RTCFilterFunctionN)0x0) {
                    auVar141 = ZEXT3264(_local_740);
                  }
                  else {
                    auVar141 = ZEXT3264(_local_740);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar125->field_8).field_0x2 & 0x40) != 0)) {
                      auVar203 = ZEXT1664(auVar203._0_16_);
                      (*p_Var14)(&local_6b0);
                      auVar141 = ZEXT3264(_local_740);
                      auVar319 = ZEXT3264(_local_7a0);
                      auVar233 = ZEXT3264(local_560);
                      auVar171 = ZEXT3264(local_540);
                      uVar121 = local_780._0_8_;
                      uVar126 = local_680._0_4_;
                      fVar128 = (float)local_700._0_4_;
                      fVar142 = (float)local_700._4_4_;
                      fVar145 = fStack_6f8;
                      fVar148 = fStack_6f4;
                      fVar258 = fStack_6f0;
                      fVar282 = fStack_6ec;
                      fVar263 = fStack_6e8;
                    }
                  }
                  auVar196 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                  auVar183 = auVar196 ^ _DAT_01f46b70;
                  auVar181._8_4_ = 0xff800000;
                  auVar181._0_8_ = 0xff800000ff800000;
                  auVar181._12_4_ = 0xff800000;
                  auVar196 = vblendvps_avx(auVar181,*(undefined1 (*) [16])(local_6b0.ray + 0x80),
                                           auVar196);
                  *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar196;
                }
                auVar218 = auVar141._0_32_;
                auVar162._8_8_ = 0x100000001;
                auVar162._0_8_ = 0x100000001;
                if ((auVar162 & auVar183) != (undefined1  [16])0x0) {
                  uVar124 = CONCAT71((int7)(uVar124 >> 8),1);
                  local_540 = auVar171._0_32_;
                  local_560 = auVar233._0_32_;
                  goto LAB_0093cc23;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar126;
                uVar124 = uVar124 ^ 1L << (uVar121 & 0x3f);
                uVar121 = 0;
                if (uVar124 != 0) {
                  for (; (uVar124 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                  }
                }
              }
              uVar124 = 0;
              local_540 = auVar171._0_32_;
              local_560 = auVar233._0_32_;
            }
          }
LAB_0093cc23:
          auVar171 = ZEXT1664(local_760._0_16_);
          goto LAB_0093c650;
        }
      }
      uVar124 = 0;
      auVar171 = ZEXT1664(auVar183);
      auVar319 = ZEXT3264(_local_7a0);
    }
LAB_0093c650:
    auVar233 = ZEXT3264(auVar186);
    if (8 < (int)uVar11) {
      auVar183 = vpshufd_avx(ZEXT416(uVar11),0);
      local_4a0 = auVar183._0_4_;
      fStack_49c = auVar183._4_4_;
      fStack_498 = auVar183._8_4_;
      fStack_494 = auVar183._12_4_;
      auVar183 = vshufps_avx(auVar171._0_16_,auVar171._0_16_,0);
      local_320._16_16_ = auVar183;
      local_320._0_16_ = auVar183;
      auVar183 = vpermilps_avx(ZEXT416(uVar120),0);
      local_340._16_16_ = auVar183;
      local_340._0_16_ = auVar183;
      auVar134._0_4_ = 1.0 / (float)local_5d0._0_4_;
      auVar134._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar183 = vshufps_avx(auVar134,auVar134,0);
      register0x00001210 = auVar183;
      _local_120 = auVar183;
      local_5d0 = vshufps_avx(ZEXT416((uint)local_7a8),ZEXT416((uint)local_7a8),0);
      local_300 = vpermilps_avx(local_660._0_16_,0);
      auVar141 = ZEXT1664(local_300);
      fVar291 = (float)local_600._0_4_;
      fVar264 = (float)local_600._4_4_;
      fVar294 = fStack_5f8;
      fVar265 = fStack_5f4;
      fVar296 = fStack_5f0;
      fVar323 = fStack_5ec;
      fVar191 = fStack_5e8;
      _local_740 = auVar218;
      for (lVar127 = 8; lVar127 < (int)uVar11; lVar127 = lVar127 + 8) {
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar127 * 4 + lVar122);
        fVar304 = *(float *)*pauVar7;
        fVar236 = *(float *)(*pauVar7 + 4);
        fVar246 = *(float *)(*pauVar7 + 8);
        fVar252 = *(float *)(*pauVar7 + 0xc);
        fVar309 = *(float *)(*pauVar7 + 0x10);
        fVar310 = *(float *)(*pauVar7 + 0x14);
        fVar278 = *(float *)(*pauVar7 + 0x18);
        auVar117 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x22047f0 + lVar127 * 4);
        fVar311 = *(float *)*pauVar7;
        fVar313 = *(float *)(*pauVar7 + 4);
        fVar270 = *(float *)(*pauVar7 + 8);
        fVar271 = *(float *)(*pauVar7 + 0xc);
        fVar280 = *(float *)(*pauVar7 + 0x10);
        fVar276 = *(float *)(*pauVar7 + 0x14);
        fVar212 = *(float *)(*pauVar7 + 0x18);
        auVar116 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x2204c74 + lVar127 * 4);
        fVar172 = *(float *)*pauVar7;
        fVar281 = *(float *)(*pauVar7 + 4);
        fVar143 = *(float *)(*pauVar7 + 8);
        fVar146 = *(float *)(*pauVar7 + 0xc);
        fVar149 = *(float *)(*pauVar7 + 0x10);
        fVar151 = *(float *)(*pauVar7 + 0x14);
        fVar153 = *(float *)(*pauVar7 + 0x18);
        auVar115 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar122 + 0x22050f8 + lVar127 * 4);
        fVar155 = *(float *)*pauVar7;
        fVar192 = *(float *)(*pauVar7 + 4);
        fVar204 = *(float *)(*pauVar7 + 8);
        fVar206 = *(float *)(*pauVar7 + 0xc);
        fVar207 = *(float *)(*pauVar7 + 0x10);
        fVar208 = *(float *)(*pauVar7 + 0x14);
        fVar209 = *(float *)(*pauVar7 + 0x18);
        auVar114 = *pauVar7;
        fVar211 = auVar203._28_4_;
        fVar237 = auVar319._0_4_;
        fVar247 = auVar319._4_4_;
        fVar250 = auVar319._8_4_;
        fVar253 = auVar319._12_4_;
        fVar223 = auVar319._16_4_;
        fVar224 = auVar319._20_4_;
        fVar225 = auVar319._24_4_;
        fStack_824 = fVar211 + *(float *)pauVar7[1];
        fVar235 = fVar211 + fStack_824;
        local_840._0_4_ =
             (float)local_140._0_4_ * fVar304 +
             fVar311 * (float)local_460._0_4_ + fVar291 * fVar172 + (float)local_440._0_4_ * fVar155
        ;
        local_840._4_4_ =
             (float)local_140._4_4_ * fVar236 +
             fVar313 * (float)local_460._4_4_ + fVar264 * fVar281 + (float)local_440._4_4_ * fVar192
        ;
        fStack_838 = fStack_138 * fVar246 +
                     fVar270 * fStack_458 + fVar294 * fVar143 + fStack_438 * fVar204;
        fStack_834 = fStack_134 * fVar252 +
                     fVar271 * fStack_454 + fVar265 * fVar146 + fStack_434 * fVar206;
        fStack_830 = fStack_130 * fVar309 +
                     fVar280 * fStack_450 + fVar296 * fVar149 + fStack_430 * fVar207;
        fStack_82c = fStack_12c * fVar310 +
                     fVar276 * fStack_44c + fVar323 * fVar151 + fStack_42c * fVar208;
        fStack_828 = fStack_128 * fVar278 +
                     fVar212 * fStack_448 + fVar191 * fVar153 + fStack_428 * fVar209;
        fStack_824 = fStack_824 + fVar211 + fVar211 + auVar141._28_4_;
        fVar205 = auVar233._0_4_;
        fVar249 = auVar233._4_4_;
        fVar234 = auVar233._8_4_;
        fVar312 = auVar233._12_4_;
        fVar279 = auVar233._16_4_;
        fVar210 = auVar233._20_4_;
        fVar277 = auVar233._24_4_;
        local_760._0_4_ =
             fVar304 * fVar205 + fVar128 * fVar311 + fVar237 * fVar172 + fVar314 * fVar155;
        local_760._4_4_ =
             fVar236 * fVar249 + fVar142 * fVar313 + fVar247 * fVar281 + fVar320 * fVar192;
        local_760._8_4_ =
             fVar246 * fVar234 + fVar145 * fVar270 + fVar250 * fVar143 + fVar321 * fVar204;
        local_760._12_4_ =
             fVar252 * fVar312 + fVar148 * fVar271 + fVar253 * fVar146 + fVar322 * fVar206;
        local_760._16_4_ =
             fVar309 * fVar279 + fVar258 * fVar280 + fVar223 * fVar149 + fVar314 * fVar207;
        local_760._20_4_ =
             fVar310 * fVar210 + fVar282 * fVar276 + fVar224 * fVar151 + fVar320 * fVar208;
        local_760._24_4_ =
             fVar278 * fVar277 + fVar263 * fVar212 + fVar225 * fVar153 + fVar321 * fVar209;
        local_760._28_4_ = fStack_824 + fVar211 + fVar211 + auVar171._28_4_;
        auVar203 = ZEXT3264(local_760);
        fVar129 = fVar304 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar311 +
                  fVar172 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar155;
        fVar144 = fVar236 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar313 +
                  fVar281 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar192;
        fVar147 = fVar246 * fStack_b8 +
                  fStack_98 * fVar270 + fVar143 * fStack_158 + fStack_78 * fVar204;
        fVar150 = fVar252 * fStack_b4 +
                  fStack_94 * fVar271 + fVar146 * fStack_154 + fStack_74 * fVar206;
        fVar152 = fVar309 * fStack_b0 +
                  fStack_90 * fVar280 + fVar149 * fStack_150 + fStack_70 * fVar207;
        fVar154 = fVar310 * fStack_ac +
                  fStack_8c * fVar276 + fVar151 * fStack_14c + fStack_6c * fVar208;
        fVar156 = fVar278 * fStack_a8 +
                  fStack_88 * fVar212 + fVar153 * fStack_148 + fStack_68 * fVar209;
        fVar157 = fStack_824 + fVar235;
        pfVar1 = (float *)(catmullrom_basis1 + lVar127 * 4 + lVar122);
        fVar281 = *pfVar1;
        fVar143 = pfVar1[1];
        fVar146 = pfVar1[2];
        fVar149 = pfVar1[3];
        fVar151 = pfVar1[4];
        fVar153 = pfVar1[5];
        fVar155 = pfVar1[6];
        pfVar2 = (float *)(lVar122 + 0x2206c10 + lVar127 * 4);
        fVar192 = *pfVar2;
        fVar204 = pfVar2[1];
        fVar206 = pfVar2[2];
        fVar207 = pfVar2[3];
        fVar208 = pfVar2[4];
        fVar209 = pfVar2[5];
        fVar211 = pfVar2[6];
        auVar170 = *(undefined1 (*) [32])(lVar122 + 0x2207094 + lVar127 * 4);
        auVar141 = ZEXT3264(auVar170);
        auVar26 = *(undefined1 (*) [32])(lVar122 + 0x2207518 + lVar127 * 4);
        auVar171 = ZEXT3264(auVar26);
        fVar236 = auVar26._0_4_;
        fVar252 = auVar26._4_4_;
        fVar310 = auVar26._8_4_;
        fVar311 = auVar26._12_4_;
        fVar270 = auVar26._16_4_;
        fVar280 = auVar26._20_4_;
        fVar212 = auVar26._24_4_;
        fVar246 = auVar170._0_4_;
        fVar309 = auVar170._4_4_;
        fVar278 = auVar170._8_4_;
        fVar313 = auVar170._12_4_;
        fVar271 = auVar170._16_4_;
        fVar276 = auVar170._20_4_;
        fVar172 = auVar170._24_4_;
        fVar304 = auVar233._28_4_;
        fVar235 = fVar322 + fVar322 + fVar235;
        local_660._0_4_ =
             (float)local_140._0_4_ * fVar281 +
             fVar192 * (float)local_460._0_4_ + fVar291 * fVar246 + (float)local_440._0_4_ * fVar236
        ;
        local_660._4_4_ =
             (float)local_140._4_4_ * fVar143 +
             fVar204 * (float)local_460._4_4_ + fVar264 * fVar309 + (float)local_440._4_4_ * fVar252
        ;
        local_660._8_4_ =
             fStack_138 * fVar146 + fVar206 * fStack_458 + fVar294 * fVar278 + fStack_438 * fVar310;
        local_660._12_4_ =
             fStack_134 * fVar149 + fVar207 * fStack_454 + fVar265 * fVar313 + fStack_434 * fVar311;
        local_660._16_4_ =
             fStack_130 * fVar151 + fVar208 * fStack_450 + fVar296 * fVar271 + fStack_430 * fVar270;
        local_660._20_4_ =
             fStack_12c * fVar153 + fVar209 * fStack_44c + fVar323 * fVar276 + fStack_42c * fVar280;
        local_660._24_4_ =
             fStack_128 * fVar155 + fVar211 * fStack_448 + fVar191 * fVar172 + fStack_428 * fVar212;
        local_660._28_4_ = fVar322 + fStack_64 + fVar235;
        auVar231._0_4_ =
             fVar205 * fVar281 + fVar128 * fVar192 + fVar237 * fVar246 + fVar314 * fVar236;
        auVar231._4_4_ =
             fVar249 * fVar143 + fVar142 * fVar204 + fVar247 * fVar309 + fVar320 * fVar252;
        auVar231._8_4_ =
             fVar234 * fVar146 + fVar145 * fVar206 + fVar250 * fVar278 + fVar321 * fVar310;
        auVar231._12_4_ =
             fVar312 * fVar149 + fVar148 * fVar207 + fVar253 * fVar313 + fVar322 * fVar311;
        auVar231._16_4_ =
             fVar279 * fVar151 + fVar258 * fVar208 + fVar223 * fVar271 + fVar314 * fVar270;
        auVar231._20_4_ =
             fVar210 * fVar153 + fVar282 * fVar209 + fVar224 * fVar276 + fVar320 * fVar280;
        auVar231._24_4_ =
             fVar277 * fVar155 + fVar263 * fVar211 + fVar225 * fVar172 + fVar321 * fVar212;
        auVar231._28_4_ = fVar235 + fVar322 + fVar322 + fVar304;
        local_5a0._0_4_ =
             (float)local_a0._0_4_ * fVar192 +
             fVar246 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar236 +
             fVar281 * (float)local_c0._0_4_;
        local_5a0._4_4_ =
             (float)local_a0._4_4_ * fVar204 +
             fVar309 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar252 +
             fVar143 * (float)local_c0._4_4_;
        fStack_598 = fStack_98 * fVar206 + fVar278 * fStack_158 + fStack_78 * fVar310 +
                     fVar146 * fStack_b8;
        fStack_594 = fStack_94 * fVar207 + fVar313 * fStack_154 + fStack_74 * fVar311 +
                     fVar149 * fStack_b4;
        fStack_590 = fStack_90 * fVar208 + fVar271 * fStack_150 + fStack_70 * fVar270 +
                     fVar151 * fStack_b0;
        fStack_58c = fStack_8c * fVar209 + fVar276 * fStack_14c + fStack_6c * fVar280 +
                     fVar153 * fStack_ac;
        fStack_588 = fStack_88 * fVar211 + fVar172 * fStack_148 + fStack_68 * fVar212 +
                     fVar155 * fStack_a8;
        fStack_584 = fVar322 + fVar322 + fStack_64 + fVar235;
        auVar33 = vsubps_avx(local_660,_local_840);
        auVar27 = vsubps_avx(auVar231,local_760);
        fVar258 = auVar33._0_4_;
        fVar282 = auVar33._4_4_;
        auVar62._4_4_ = local_760._4_4_ * fVar282;
        auVar62._0_4_ = (float)local_760._0_4_ * fVar258;
        fVar263 = auVar33._8_4_;
        auVar62._8_4_ = local_760._8_4_ * fVar263;
        fVar291 = auVar33._12_4_;
        auVar62._12_4_ = local_760._12_4_ * fVar291;
        fVar264 = auVar33._16_4_;
        auVar62._16_4_ = local_760._16_4_ * fVar264;
        fVar294 = auVar33._20_4_;
        auVar62._20_4_ = local_760._20_4_ * fVar294;
        fVar265 = auVar33._24_4_;
        auVar62._24_4_ = local_760._24_4_ * fVar265;
        auVar62._28_4_ = fVar235;
        fVar296 = auVar27._0_4_;
        fVar323 = auVar27._4_4_;
        auVar63._4_4_ = fVar323 * (float)local_840._4_4_;
        auVar63._0_4_ = fVar296 * (float)local_840._0_4_;
        fVar191 = auVar27._8_4_;
        auVar63._8_4_ = fVar191 * fStack_838;
        fVar128 = auVar27._12_4_;
        auVar63._12_4_ = fVar128 * fStack_834;
        fVar142 = auVar27._16_4_;
        auVar63._16_4_ = fVar142 * fStack_830;
        fVar145 = auVar27._20_4_;
        auVar63._20_4_ = fVar145 * fStack_82c;
        fVar148 = auVar27._24_4_;
        auVar63._24_4_ = fVar148 * fStack_828;
        auVar63._28_4_ = auVar231._28_4_;
        auVar199 = vsubps_avx(auVar62,auVar63);
        auVar107._4_4_ = fVar144;
        auVar107._0_4_ = fVar129;
        auVar107._8_4_ = fVar147;
        auVar107._12_4_ = fVar150;
        auVar107._16_4_ = fVar152;
        auVar107._20_4_ = fVar154;
        auVar107._24_4_ = fVar156;
        auVar107._28_4_ = fVar157;
        auVar25 = vmaxps_avx(auVar107,_local_5a0);
        auVar64._4_4_ = auVar25._4_4_ * auVar25._4_4_ * (fVar282 * fVar282 + fVar323 * fVar323);
        auVar64._0_4_ = auVar25._0_4_ * auVar25._0_4_ * (fVar258 * fVar258 + fVar296 * fVar296);
        auVar64._8_4_ = auVar25._8_4_ * auVar25._8_4_ * (fVar263 * fVar263 + fVar191 * fVar191);
        auVar64._12_4_ = auVar25._12_4_ * auVar25._12_4_ * (fVar291 * fVar291 + fVar128 * fVar128);
        auVar64._16_4_ = auVar25._16_4_ * auVar25._16_4_ * (fVar264 * fVar264 + fVar142 * fVar142);
        auVar64._20_4_ = auVar25._20_4_ * auVar25._20_4_ * (fVar294 * fVar294 + fVar145 * fVar145);
        auVar64._24_4_ = auVar25._24_4_ * auVar25._24_4_ * (fVar265 * fVar265 + fVar148 * fVar148);
        auVar64._28_4_ = local_660._28_4_ + auVar231._28_4_;
        auVar65._4_4_ = auVar199._4_4_ * auVar199._4_4_;
        auVar65._0_4_ = auVar199._0_4_ * auVar199._0_4_;
        auVar65._8_4_ = auVar199._8_4_ * auVar199._8_4_;
        auVar65._12_4_ = auVar199._12_4_ * auVar199._12_4_;
        auVar65._16_4_ = auVar199._16_4_ * auVar199._16_4_;
        auVar65._20_4_ = auVar199._20_4_ * auVar199._20_4_;
        auVar65._24_4_ = auVar199._24_4_ * auVar199._24_4_;
        auVar65._28_4_ = auVar199._28_4_;
        auVar25 = vcmpps_avx(auVar65,auVar64,2);
        local_280 = (uint)lVar127;
        auVar196 = vpshufd_avx(ZEXT416(local_280),0);
        auVar183 = vpor_avx(auVar196,_DAT_01f4ad30);
        auVar196 = vpor_avx(auVar196,_DAT_01f7afa0);
        auVar112._4_4_ = fStack_49c;
        auVar112._0_4_ = local_4a0;
        auVar112._8_4_ = fStack_498;
        auVar112._12_4_ = fStack_494;
        auVar183 = vpcmpgtd_avx(auVar112,auVar183);
        auVar196 = vpcmpgtd_avx(auVar112,auVar196);
        register0x00001290 = auVar196;
        _local_580 = auVar183;
        auVar199 = _local_580 & auVar25;
        fVar291 = (float)local_600._0_4_;
        fVar264 = (float)local_600._4_4_;
        fVar294 = fStack_5f8;
        fVar265 = fStack_5f4;
        fVar296 = fStack_5f0;
        fVar323 = fStack_5ec;
        fVar191 = fStack_5e8;
        fVar128 = (float)local_700._0_4_;
        fVar142 = (float)local_700._4_4_;
        fVar145 = fStack_6f8;
        fVar148 = fStack_6f4;
        fVar258 = fStack_6f0;
        fVar282 = fStack_6ec;
        fVar263 = fStack_6e8;
        if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar199 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar199 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar199 >> 0x7f,0) == '\0') &&
              (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar199 >> 0xbf,0) == '\0') &&
            (auVar199 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar199[0x1f]) {
          auVar319 = ZEXT3264(auVar319._0_32_);
          auVar233 = ZEXT3264(auVar233._0_32_);
        }
        else {
          local_4c0 = fVar281 * (float)local_640._0_4_ +
                      fVar192 * (float)local_e0._0_4_ +
                      (float)local_100._0_4_ * fVar246 + (float)local_740._0_4_ * fVar236;
          fStack_4bc = fVar143 * (float)local_640._4_4_ +
                       fVar204 * (float)local_e0._4_4_ +
                       (float)local_100._4_4_ * fVar309 + (float)local_740._4_4_ * fVar252;
          fStack_4b8 = fVar146 * fStack_638 +
                       fVar206 * fStack_d8 + fStack_f8 * fVar278 + fStack_738 * fVar310;
          fStack_4b4 = fVar149 * fStack_634 +
                       fVar207 * fStack_d4 + fStack_f4 * fVar313 + fStack_734 * fVar311;
          fStack_4b0 = fVar151 * fStack_630 +
                       fVar208 * fStack_d0 + fStack_f0 * fVar271 + fStack_730 * fVar270;
          fStack_4ac = fVar153 * fStack_62c +
                       fVar209 * fStack_cc + fStack_ec * fVar276 + fStack_72c * fVar280;
          fStack_4a8 = fVar155 * fStack_628 +
                       fVar211 * fStack_c8 + fStack_e8 * fVar172 + fStack_728 * fVar212;
          fStack_4a4 = pfVar1[7] + auVar170._28_4_ + auVar26._28_4_ + 0.0;
          local_620._0_4_ = auVar116._0_4_;
          local_620._4_4_ = auVar116._4_4_;
          fStack_618 = auVar116._8_4_;
          fStack_614 = auVar116._12_4_;
          auStack_610._0_4_ = auVar116._16_4_;
          auStack_610._4_4_ = auVar116._20_4_;
          fStack_608 = auVar116._24_4_;
          local_720._0_4_ = auVar115._0_4_;
          local_720._4_4_ = auVar115._4_4_;
          uStack_718._0_4_ = auVar115._8_4_;
          uStack_718._4_4_ = auVar115._12_4_;
          auStack_710._0_4_ = auVar115._16_4_;
          auStack_710._4_4_ = auVar115._20_4_;
          fStack_708 = auVar115._24_4_;
          local_480._0_4_ = auVar114._0_4_;
          local_480._4_4_ = auVar114._4_4_;
          fStack_478 = auVar114._8_4_;
          fStack_474 = auVar114._12_4_;
          fStack_470 = auVar114._16_4_;
          fStack_46c = auVar114._20_4_;
          fStack_468 = auVar114._24_4_;
          fVar238 = (float)local_740._0_4_ * (float)local_480._0_4_;
          fVar248 = (float)local_740._4_4_ * (float)local_480._4_4_;
          fVar251 = fStack_738 * fStack_478;
          fVar254 = fStack_734 * fStack_474;
          fVar255 = fStack_730 * fStack_470;
          fVar256 = fStack_72c * fStack_46c;
          fVar257 = fStack_728 * fStack_468;
          pfVar1 = (float *)(lVar122 + 0x2205e84 + lVar127 * 4);
          fVar236 = *pfVar1;
          fVar246 = pfVar1[1];
          fVar252 = pfVar1[2];
          fVar309 = pfVar1[3];
          fVar310 = pfVar1[4];
          fVar278 = pfVar1[5];
          fVar311 = pfVar1[6];
          pfVar2 = (float *)(lVar122 + 0x2206308 + lVar127 * 4);
          fVar313 = *pfVar2;
          fVar270 = pfVar2[1];
          fVar271 = pfVar2[2];
          fVar280 = pfVar2[3];
          fVar276 = pfVar2[4];
          fVar212 = pfVar2[5];
          fVar172 = pfVar2[6];
          pfVar3 = (float *)(lVar122 + 0x2205a00 + lVar127 * 4);
          fVar281 = *pfVar3;
          fVar143 = pfVar3[1];
          fVar146 = pfVar3[2];
          fVar149 = pfVar3[3];
          fVar151 = pfVar3[4];
          fVar153 = pfVar3[5];
          fVar155 = pfVar3[6];
          fVar235 = pfVar1[7] + pfVar2[7];
          fVar173 = pfVar2[7] + fVar304 + 0.0;
          fStack_4c4 = fVar304 + 0.0 + fVar304 + auVar25._28_4_;
          pfVar1 = (float *)(lVar122 + 0x220557c + lVar127 * 4);
          fVar192 = *pfVar1;
          fVar204 = pfVar1[1];
          fVar206 = pfVar1[2];
          fVar207 = pfVar1[3];
          fVar208 = pfVar1[4];
          fVar209 = pfVar1[5];
          fVar211 = pfVar1[6];
          local_480._4_4_ =
               (float)local_140._4_4_ * fVar204 +
               fVar143 * (float)local_460._4_4_ +
               (float)local_600._4_4_ * fVar246 + (float)local_440._4_4_ * fVar270;
          local_480._0_4_ =
               (float)local_140._0_4_ * fVar192 +
               fVar281 * (float)local_460._0_4_ +
               (float)local_600._0_4_ * fVar236 + (float)local_440._0_4_ * fVar313;
          fStack_478 = fStack_138 * fVar206 +
                       fVar146 * fStack_458 + fStack_5f8 * fVar252 + fStack_438 * fVar271;
          fStack_474 = fStack_134 * fVar207 +
                       fVar149 * fStack_454 + fStack_5f4 * fVar309 + fStack_434 * fVar280;
          fStack_470 = fStack_130 * fVar208 +
                       fVar151 * fStack_450 + fStack_5f0 * fVar310 + fStack_430 * fVar276;
          fStack_46c = fStack_12c * fVar209 +
                       fVar153 * fStack_44c + fStack_5ec * fVar278 + fStack_42c * fVar212;
          fStack_468 = fStack_128 * fVar211 +
                       fVar155 * fStack_448 + fStack_5e8 * fVar311 + fStack_428 * fVar172;
          fStack_464 = fVar235 + fVar173;
          auVar167._0_4_ =
               fVar205 * fVar192 +
               fVar281 * (float)local_700._0_4_ + fVar237 * fVar236 + fVar314 * fVar313;
          auVar167._4_4_ =
               fVar249 * fVar204 +
               fVar143 * (float)local_700._4_4_ + fVar247 * fVar246 + fVar320 * fVar270;
          auVar167._8_4_ =
               fVar234 * fVar206 + fVar146 * fStack_6f8 + fVar250 * fVar252 + fVar321 * fVar271;
          auVar167._12_4_ =
               fVar312 * fVar207 + fVar149 * fStack_6f4 + fVar253 * fVar309 + fVar322 * fVar280;
          auVar167._16_4_ =
               fVar279 * fVar208 + fVar151 * fStack_6f0 + fVar223 * fVar310 + fVar314 * fVar276;
          auVar167._20_4_ =
               fVar210 * fVar209 + fVar153 * fStack_6ec + fVar224 * fVar278 + fVar320 * fVar212;
          auVar167._24_4_ =
               fVar277 * fVar211 + fVar155 * fStack_6e8 + fVar225 * fVar311 + fVar321 * fVar172;
          auVar167._28_4_ = fVar173 + fStack_4c4;
          local_4e0 = fVar281 * (float)local_e0._0_4_ +
                      (float)local_100._0_4_ * fVar236 + (float)local_740._0_4_ * fVar313 +
                      (float)local_640._0_4_ * fVar192;
          fStack_4dc = fVar143 * (float)local_e0._4_4_ +
                       (float)local_100._4_4_ * fVar246 + (float)local_740._4_4_ * fVar270 +
                       (float)local_640._4_4_ * fVar204;
          fStack_4d8 = fVar146 * fStack_d8 + fStack_f8 * fVar252 + fStack_738 * fVar271 +
                       fStack_638 * fVar206;
          fStack_4d4 = fVar149 * fStack_d4 + fStack_f4 * fVar309 + fStack_734 * fVar280 +
                       fStack_634 * fVar207;
          fStack_4d0 = fVar151 * fStack_d0 + fStack_f0 * fVar310 + fStack_730 * fVar276 +
                       fStack_630 * fVar208;
          fStack_4cc = fVar153 * fStack_cc + fStack_ec * fVar278 + fStack_72c * fVar212 +
                       fStack_62c * fVar209;
          fStack_4c8 = fVar155 * fStack_c8 + fStack_e8 * fVar311 + fStack_728 * fVar172 +
                       fStack_628 * fVar211;
          fStack_4c4 = pfVar3[7] + fVar235 + fStack_4c4;
          pfVar1 = (float *)(lVar122 + 0x22082a4 + lVar127 * 4);
          fVar205 = *pfVar1;
          fVar236 = pfVar1[1];
          fVar246 = pfVar1[2];
          fVar249 = pfVar1[3];
          fVar252 = pfVar1[4];
          fVar309 = pfVar1[5];
          fVar234 = pfVar1[6];
          pfVar2 = (float *)(lVar122 + 0x2208728 + lVar127 * 4);
          fVar310 = *pfVar2;
          fVar278 = pfVar2[1];
          fVar312 = pfVar2[2];
          fVar311 = pfVar2[3];
          fVar313 = pfVar2[4];
          fVar279 = pfVar2[5];
          fVar270 = pfVar2[6];
          pfVar3 = (float *)(lVar122 + 0x2207e20 + lVar127 * 4);
          fVar271 = *pfVar3;
          fVar210 = pfVar3[1];
          fVar280 = pfVar3[2];
          fVar276 = pfVar3[3];
          fVar277 = pfVar3[4];
          fVar212 = pfVar3[5];
          fVar172 = pfVar3[6];
          pfVar4 = (float *)(lVar122 + 0x220799c + lVar127 * 4);
          fVar281 = *pfVar4;
          fVar143 = pfVar4[1];
          fVar146 = pfVar4[2];
          fVar149 = pfVar4[3];
          fVar151 = pfVar4[4];
          fVar153 = pfVar4[5];
          fVar155 = pfVar4[6];
          auVar289._0_4_ =
               (float)local_140._0_4_ * fVar281 +
               fVar271 * (float)local_460._0_4_ +
               (float)local_600._0_4_ * fVar205 + (float)local_440._0_4_ * fVar310;
          auVar289._4_4_ =
               (float)local_140._4_4_ * fVar143 +
               fVar210 * (float)local_460._4_4_ +
               (float)local_600._4_4_ * fVar236 + (float)local_440._4_4_ * fVar278;
          auVar289._8_4_ =
               fStack_138 * fVar146 +
               fVar280 * fStack_458 + fStack_5f8 * fVar246 + fStack_438 * fVar312;
          auVar289._12_4_ =
               fStack_134 * fVar149 +
               fVar276 * fStack_454 + fStack_5f4 * fVar249 + fStack_434 * fVar311;
          auVar289._16_4_ =
               fStack_130 * fVar151 +
               fVar277 * fStack_450 + fStack_5f0 * fVar252 + fStack_430 * fVar313;
          auVar289._20_4_ =
               fStack_12c * fVar153 +
               fVar212 * fStack_44c + fStack_5ec * fVar309 + fStack_42c * fVar279;
          auVar289._24_4_ =
               fStack_128 * fVar155 +
               fVar172 * fStack_448 + fStack_5e8 * fVar234 + fStack_428 * fVar270;
          auVar289._28_4_ = fStack_424 + fStack_424 + fStack_5e4 + fStack_424;
          auVar317._0_4_ =
               fVar281 * fVar174 +
               fVar271 * (float)local_700._0_4_ + fVar237 * fVar205 + fVar314 * fVar310;
          auVar317._4_4_ =
               fVar143 * fVar188 +
               fVar210 * (float)local_700._4_4_ + fVar247 * fVar236 + fVar320 * fVar278;
          auVar317._8_4_ =
               fVar146 * fVar189 + fVar280 * fStack_6f8 + fVar250 * fVar246 + fVar321 * fVar312;
          auVar317._12_4_ =
               fVar149 * fVar190 + fVar276 * fStack_6f4 + fVar253 * fVar249 + fVar322 * fVar311;
          auVar317._16_4_ =
               fVar151 * fVar174 + fVar277 * fStack_6f0 + fVar223 * fVar252 + fVar314 * fVar313;
          auVar317._20_4_ =
               fVar153 * fVar188 + fVar212 * fStack_6ec + fVar224 * fVar309 + fVar320 * fVar279;
          auVar317._24_4_ =
               fVar155 * fVar189 + fVar172 * fStack_6e8 + fVar225 * fVar234 + fVar321 * fVar270;
          auVar317._28_4_ = fStack_424 + fStack_424 + fVar304 + fStack_424;
          auVar232._8_4_ = 0x7fffffff;
          auVar232._0_8_ = 0x7fffffff7fffffff;
          auVar232._12_4_ = 0x7fffffff;
          auVar232._16_4_ = 0x7fffffff;
          auVar232._20_4_ = 0x7fffffff;
          auVar232._24_4_ = 0x7fffffff;
          auVar232._28_4_ = 0x7fffffff;
          auVar170 = vandps_avx(_local_480,auVar232);
          auVar199 = vandps_avx(auVar167,auVar232);
          auVar199 = vmaxps_avx(auVar170,auVar199);
          auVar109._4_4_ = fStack_4dc;
          auVar109._0_4_ = local_4e0;
          auVar109._8_4_ = fStack_4d8;
          auVar109._12_4_ = fStack_4d4;
          auVar109._16_4_ = fStack_4d0;
          auVar109._20_4_ = fStack_4cc;
          auVar109._24_4_ = fStack_4c8;
          auVar109._28_4_ = fStack_4c4;
          auVar170 = vandps_avx(auVar232,auVar109);
          auVar199 = vmaxps_avx(auVar199,auVar170);
          auVar199 = vcmpps_avx(auVar199,local_320,1);
          auVar217 = vblendvps_avx(_local_480,auVar33,auVar199);
          auVar138._0_4_ =
               fVar281 * (float)local_640._0_4_ +
               fVar271 * (float)local_e0._0_4_ +
               fVar310 * (float)local_740._0_4_ + (float)local_100._0_4_ * fVar205;
          auVar138._4_4_ =
               fVar143 * (float)local_640._4_4_ +
               fVar210 * (float)local_e0._4_4_ +
               fVar278 * (float)local_740._4_4_ + (float)local_100._4_4_ * fVar236;
          auVar138._8_4_ =
               fVar146 * fStack_638 +
               fVar280 * fStack_d8 + fVar312 * fStack_738 + fStack_f8 * fVar246;
          auVar138._12_4_ =
               fVar149 * fStack_634 +
               fVar276 * fStack_d4 + fVar311 * fStack_734 + fStack_f4 * fVar249;
          auVar138._16_4_ =
               fVar151 * fStack_630 +
               fVar277 * fStack_d0 + fVar313 * fStack_730 + fStack_f0 * fVar252;
          auVar138._20_4_ =
               fVar153 * fStack_62c +
               fVar212 * fStack_cc + fVar279 * fStack_72c + fStack_ec * fVar309;
          auVar138._24_4_ =
               fVar155 * fStack_628 +
               fVar172 * fStack_c8 + fVar270 * fStack_728 + fStack_e8 * fVar234;
          auVar138._28_4_ = auVar170._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar218 = vblendvps_avx(auVar167,auVar27,auVar199);
          auVar170 = vandps_avx(auVar289,auVar232);
          auVar199 = vandps_avx(auVar317,auVar232);
          auVar261 = vmaxps_avx(auVar170,auVar199);
          auVar170 = vandps_avx(auVar138,auVar232);
          auVar170 = vmaxps_avx(auVar261,auVar170);
          local_680._0_4_ = auVar117._0_4_;
          local_680._4_4_ = auVar117._4_4_;
          fStack_678 = auVar117._8_4_;
          fStack_674 = auVar117._12_4_;
          auStack_670._0_4_ = auVar117._16_4_;
          auStack_670._4_4_ = auVar117._20_4_;
          fStack_668 = auVar117._24_4_;
          auVar199 = vcmpps_avx(auVar170,local_320,1);
          auVar170 = vblendvps_avx(auVar289,auVar33,auVar199);
          auVar139._0_4_ =
               (float)local_640._0_4_ * (float)local_680._0_4_ +
               (float)local_e0._0_4_ * (float)local_620._0_4_ +
               (float)local_100._0_4_ * (float)local_720._0_4_ + fVar238;
          auVar139._4_4_ =
               (float)local_640._4_4_ * (float)local_680._4_4_ +
               (float)local_e0._4_4_ * (float)local_620._4_4_ +
               (float)local_100._4_4_ * (float)local_720._4_4_ + fVar248;
          auVar139._8_4_ =
               fStack_638 * fStack_678 +
               fStack_d8 * fStack_618 + fStack_f8 * (float)uStack_718 + fVar251;
          auVar139._12_4_ =
               fStack_634 * fStack_674 +
               fStack_d4 * fStack_614 + fStack_f4 * uStack_718._4_4_ + fVar254;
          auVar139._16_4_ =
               fStack_630 * (float)auStack_670._0_4_ +
               fStack_d0 * (float)auStack_610._0_4_ + fStack_f0 * (float)auStack_710._0_4_ + fVar255
          ;
          auVar139._20_4_ =
               fStack_62c * (float)auStack_670._4_4_ +
               fStack_cc * (float)auStack_610._4_4_ + fStack_ec * (float)auStack_710._4_4_ + fVar256
          ;
          auVar139._24_4_ =
               fStack_628 * fStack_668 + fStack_c8 * fStack_608 + fStack_e8 * fStack_708 + fVar257;
          auVar139._28_4_ = auVar261._28_4_ + fStack_4a4 + auVar26._28_4_ + 0.0;
          auVar26 = vblendvps_avx(auVar317,auVar27,auVar199);
          fVar211 = auVar217._0_4_;
          fVar235 = auVar217._4_4_;
          fVar237 = auVar217._8_4_;
          fVar247 = auVar217._12_4_;
          fVar250 = auVar217._16_4_;
          fVar253 = auVar217._20_4_;
          fVar223 = auVar217._24_4_;
          fVar224 = auVar217._28_4_;
          fVar270 = auVar170._0_4_;
          fVar210 = auVar170._4_4_;
          fVar276 = auVar170._8_4_;
          fVar212 = auVar170._12_4_;
          fVar281 = auVar170._16_4_;
          fVar146 = auVar170._20_4_;
          fVar151 = auVar170._24_4_;
          fVar304 = auVar218._0_4_;
          fVar236 = auVar218._4_4_;
          fVar249 = auVar218._8_4_;
          fVar309 = auVar218._12_4_;
          fVar310 = auVar218._16_4_;
          fVar312 = auVar218._20_4_;
          fVar313 = auVar218._24_4_;
          auVar303._0_4_ = fVar304 * fVar304 + fVar211 * fVar211;
          auVar303._4_4_ = fVar236 * fVar236 + fVar235 * fVar235;
          auVar303._8_4_ = fVar249 * fVar249 + fVar237 * fVar237;
          auVar303._12_4_ = fVar309 * fVar309 + fVar247 * fVar247;
          auVar303._16_4_ = fVar310 * fVar310 + fVar250 * fVar250;
          auVar303._20_4_ = fVar312 * fVar312 + fVar253 * fVar253;
          auVar303._24_4_ = fVar313 * fVar313 + fVar223 * fVar223;
          auVar303._28_4_ = fVar322 + auVar27._28_4_;
          auVar33 = vrsqrtps_avx(auVar303);
          fVar205 = auVar33._0_4_;
          fVar246 = auVar33._4_4_;
          auVar66._4_4_ = fVar246 * 1.5;
          auVar66._0_4_ = fVar205 * 1.5;
          fVar252 = auVar33._8_4_;
          auVar66._8_4_ = fVar252 * 1.5;
          fVar234 = auVar33._12_4_;
          auVar66._12_4_ = fVar234 * 1.5;
          fVar278 = auVar33._16_4_;
          auVar66._16_4_ = fVar278 * 1.5;
          fVar311 = auVar33._20_4_;
          auVar66._20_4_ = fVar311 * 1.5;
          fVar279 = auVar33._24_4_;
          auVar66._24_4_ = fVar279 * 1.5;
          auVar66._28_4_ = auVar317._28_4_;
          auVar67._4_4_ = fVar246 * fVar246 * fVar246 * auVar303._4_4_ * 0.5;
          auVar67._0_4_ = fVar205 * fVar205 * fVar205 * auVar303._0_4_ * 0.5;
          auVar67._8_4_ = fVar252 * fVar252 * fVar252 * auVar303._8_4_ * 0.5;
          auVar67._12_4_ = fVar234 * fVar234 * fVar234 * auVar303._12_4_ * 0.5;
          auVar67._16_4_ = fVar278 * fVar278 * fVar278 * auVar303._16_4_ * 0.5;
          auVar67._20_4_ = fVar311 * fVar311 * fVar311 * auVar303._20_4_ * 0.5;
          auVar67._24_4_ = fVar279 * fVar279 * fVar279 * auVar303._24_4_ * 0.5;
          auVar67._28_4_ = auVar303._28_4_;
          auVar27 = vsubps_avx(auVar66,auVar67);
          fVar155 = auVar27._0_4_;
          fVar192 = auVar27._4_4_;
          fVar204 = auVar27._8_4_;
          fVar206 = auVar27._12_4_;
          fVar207 = auVar27._16_4_;
          fVar208 = auVar27._20_4_;
          fVar209 = auVar27._24_4_;
          fVar205 = auVar26._0_4_;
          fVar246 = auVar26._4_4_;
          fVar252 = auVar26._8_4_;
          fVar234 = auVar26._12_4_;
          fVar278 = auVar26._16_4_;
          fVar311 = auVar26._20_4_;
          fVar279 = auVar26._24_4_;
          auVar275._0_4_ = fVar205 * fVar205 + fVar270 * fVar270;
          auVar275._4_4_ = fVar246 * fVar246 + fVar210 * fVar210;
          auVar275._8_4_ = fVar252 * fVar252 + fVar276 * fVar276;
          auVar275._12_4_ = fVar234 * fVar234 + fVar212 * fVar212;
          auVar275._16_4_ = fVar278 * fVar278 + fVar281 * fVar281;
          auVar275._20_4_ = fVar311 * fVar311 + fVar146 * fVar146;
          auVar275._24_4_ = fVar279 * fVar279 + fVar151 * fVar151;
          auVar275._28_4_ = auVar33._28_4_ + auVar170._28_4_;
          auVar170 = vrsqrtps_avx(auVar275);
          fVar271 = auVar170._0_4_;
          fVar280 = auVar170._4_4_;
          auVar68._4_4_ = fVar280 * 1.5;
          auVar68._0_4_ = fVar271 * 1.5;
          fVar277 = auVar170._8_4_;
          auVar68._8_4_ = fVar277 * 1.5;
          fVar172 = auVar170._12_4_;
          auVar68._12_4_ = fVar172 * 1.5;
          fVar143 = auVar170._16_4_;
          auVar68._16_4_ = fVar143 * 1.5;
          fVar149 = auVar170._20_4_;
          auVar68._20_4_ = fVar149 * 1.5;
          fVar153 = auVar170._24_4_;
          auVar68._24_4_ = fVar153 * 1.5;
          auVar68._28_4_ = auVar317._28_4_;
          auVar69._4_4_ = fVar280 * fVar280 * fVar280 * auVar275._4_4_ * 0.5;
          auVar69._0_4_ = fVar271 * fVar271 * fVar271 * auVar275._0_4_ * 0.5;
          auVar69._8_4_ = fVar277 * fVar277 * fVar277 * auVar275._8_4_ * 0.5;
          auVar69._12_4_ = fVar172 * fVar172 * fVar172 * auVar275._12_4_ * 0.5;
          auVar69._16_4_ = fVar143 * fVar143 * fVar143 * auVar275._16_4_ * 0.5;
          auVar69._20_4_ = fVar149 * fVar149 * fVar149 * auVar275._20_4_ * 0.5;
          auVar69._24_4_ = fVar153 * fVar153 * fVar153 * auVar275._24_4_ * 0.5;
          auVar69._28_4_ = auVar275._28_4_;
          auVar26 = vsubps_avx(auVar68,auVar69);
          fVar271 = auVar26._0_4_;
          fVar280 = auVar26._4_4_;
          fVar277 = auVar26._8_4_;
          fVar172 = auVar26._12_4_;
          fVar143 = auVar26._16_4_;
          fVar149 = auVar26._20_4_;
          fVar153 = auVar26._24_4_;
          fVar304 = fVar129 * fVar155 * fVar304;
          fVar236 = fVar144 * fVar192 * fVar236;
          auVar70._4_4_ = fVar236;
          auVar70._0_4_ = fVar304;
          fVar249 = fVar147 * fVar204 * fVar249;
          auVar70._8_4_ = fVar249;
          fVar309 = fVar150 * fVar206 * fVar309;
          auVar70._12_4_ = fVar309;
          fVar310 = fVar152 * fVar207 * fVar310;
          auVar70._16_4_ = fVar310;
          fVar312 = fVar154 * fVar208 * fVar312;
          auVar70._20_4_ = fVar312;
          fVar313 = fVar156 * fVar209 * fVar313;
          auVar70._24_4_ = fVar313;
          auVar70._28_4_ = auVar170._28_4_;
          local_680._4_4_ = fVar236 + (float)local_840._4_4_;
          local_680._0_4_ = fVar304 + (float)local_840._0_4_;
          fStack_678 = fVar249 + fStack_838;
          fStack_674 = fVar309 + fStack_834;
          auStack_670._0_4_ = fVar310 + fStack_830;
          auStack_670._4_4_ = fVar312 + fStack_82c;
          fStack_668 = fVar313 + fStack_828;
          fStack_664 = auVar170._28_4_ + fStack_824;
          fVar304 = fVar129 * fVar155 * -fVar211;
          fVar236 = fVar144 * fVar192 * -fVar235;
          auVar71._4_4_ = fVar236;
          auVar71._0_4_ = fVar304;
          fVar249 = fVar147 * fVar204 * -fVar237;
          auVar71._8_4_ = fVar249;
          fVar309 = fVar150 * fVar206 * -fVar247;
          auVar71._12_4_ = fVar309;
          fVar310 = fVar152 * fVar207 * -fVar250;
          auVar71._16_4_ = fVar310;
          fVar312 = fVar154 * fVar208 * -fVar253;
          auVar71._20_4_ = fVar312;
          fVar313 = fVar156 * fVar209 * -fVar223;
          auVar71._24_4_ = fVar313;
          auVar71._28_4_ = -fVar224;
          local_720._4_4_ = local_760._4_4_ + fVar236;
          local_720._0_4_ = (float)local_760._0_4_ + fVar304;
          uStack_718._0_4_ = local_760._8_4_ + fVar249;
          uStack_718._4_4_ = local_760._12_4_ + fVar309;
          auStack_710._0_4_ = local_760._16_4_ + fVar310;
          auStack_710._4_4_ = local_760._20_4_ + fVar312;
          fStack_708 = local_760._24_4_ + fVar313;
          fStack_704 = local_760._28_4_ + -fVar224;
          fVar304 = fVar155 * 0.0 * fVar129;
          fVar236 = fVar192 * 0.0 * fVar144;
          auVar72._4_4_ = fVar236;
          auVar72._0_4_ = fVar304;
          fVar249 = fVar204 * 0.0 * fVar147;
          auVar72._8_4_ = fVar249;
          fVar309 = fVar206 * 0.0 * fVar150;
          auVar72._12_4_ = fVar309;
          fVar310 = fVar207 * 0.0 * fVar152;
          auVar72._16_4_ = fVar310;
          fVar312 = fVar208 * 0.0 * fVar154;
          auVar72._20_4_ = fVar312;
          fVar313 = fVar209 * 0.0 * fVar156;
          auVar72._24_4_ = fVar313;
          auVar72._28_4_ = fVar224;
          auVar170 = vsubps_avx(_local_840,auVar70);
          auVar329._0_4_ = fVar304 + auVar139._0_4_;
          auVar329._4_4_ = fVar236 + auVar139._4_4_;
          auVar329._8_4_ = fVar249 + auVar139._8_4_;
          auVar329._12_4_ = fVar309 + auVar139._12_4_;
          auVar329._16_4_ = fVar310 + auVar139._16_4_;
          auVar329._20_4_ = fVar312 + auVar139._20_4_;
          auVar329._24_4_ = fVar313 + auVar139._24_4_;
          auVar329._28_4_ = fVar224 + auVar139._28_4_;
          fVar304 = (float)local_5a0._0_4_ * fVar271 * fVar205;
          fVar205 = (float)local_5a0._4_4_ * fVar280 * fVar246;
          auVar73._4_4_ = fVar205;
          auVar73._0_4_ = fVar304;
          fVar236 = fStack_598 * fVar277 * fVar252;
          auVar73._8_4_ = fVar236;
          fVar246 = fStack_594 * fVar172 * fVar234;
          auVar73._12_4_ = fVar246;
          fVar249 = fStack_590 * fVar143 * fVar278;
          auVar73._16_4_ = fVar249;
          fVar252 = fStack_58c * fVar149 * fVar311;
          auVar73._20_4_ = fVar252;
          fVar309 = fStack_588 * fVar153 * fVar279;
          auVar73._24_4_ = fVar309;
          auVar73._28_4_ = fStack_824;
          auVar28 = vsubps_avx(local_760,auVar71);
          auVar325._0_4_ = local_660._0_4_ + fVar304;
          auVar325._4_4_ = local_660._4_4_ + fVar205;
          auVar325._8_4_ = local_660._8_4_ + fVar236;
          auVar325._12_4_ = local_660._12_4_ + fVar246;
          auVar325._16_4_ = local_660._16_4_ + fVar249;
          auVar325._20_4_ = local_660._20_4_ + fVar252;
          auVar325._24_4_ = local_660._24_4_ + fVar309;
          auVar325._28_4_ = local_660._28_4_ + fStack_824;
          fVar304 = fVar271 * -fVar270 * (float)local_5a0._0_4_;
          fVar205 = fVar280 * -fVar210 * (float)local_5a0._4_4_;
          auVar74._4_4_ = fVar205;
          auVar74._0_4_ = fVar304;
          fVar236 = fVar277 * -fVar276 * fStack_598;
          auVar74._8_4_ = fVar236;
          fVar246 = fVar172 * -fVar212 * fStack_594;
          auVar74._12_4_ = fVar246;
          fVar249 = fVar143 * -fVar281 * fStack_590;
          auVar74._16_4_ = fVar249;
          fVar252 = fVar149 * -fVar146 * fStack_58c;
          auVar74._20_4_ = fVar252;
          fVar309 = fVar153 * -fVar151 * fStack_588;
          auVar74._24_4_ = fVar309;
          auVar74._28_4_ = fVar157;
          auVar29 = vsubps_avx(auVar139,auVar72);
          auVar221._0_4_ = auVar231._0_4_ + fVar304;
          auVar221._4_4_ = auVar231._4_4_ + fVar205;
          auVar221._8_4_ = auVar231._8_4_ + fVar236;
          auVar221._12_4_ = auVar231._12_4_ + fVar246;
          auVar221._16_4_ = auVar231._16_4_ + fVar249;
          auVar221._20_4_ = auVar231._20_4_ + fVar252;
          auVar221._24_4_ = auVar231._24_4_ + fVar309;
          auVar221._28_4_ = auVar231._28_4_ + fVar157;
          fVar304 = fVar271 * 0.0 * (float)local_5a0._0_4_;
          fVar205 = fVar280 * 0.0 * (float)local_5a0._4_4_;
          auVar75._4_4_ = fVar205;
          auVar75._0_4_ = fVar304;
          fVar236 = fVar277 * 0.0 * fStack_598;
          auVar75._8_4_ = fVar236;
          fVar246 = fVar172 * 0.0 * fStack_594;
          auVar75._12_4_ = fVar246;
          fVar249 = fVar143 * 0.0 * fStack_590;
          auVar75._16_4_ = fVar249;
          fVar252 = fVar149 * 0.0 * fStack_58c;
          auVar75._20_4_ = fVar252;
          fVar309 = fVar153 * 0.0 * fStack_588;
          auVar75._24_4_ = fVar309;
          auVar75._28_4_ = auVar139._28_4_;
          auVar33 = vsubps_avx(local_660,auVar73);
          auVar111._4_4_ = fStack_4bc;
          auVar111._0_4_ = local_4c0;
          auVar111._8_4_ = fStack_4b8;
          auVar111._12_4_ = fStack_4b4;
          auVar111._16_4_ = fStack_4b0;
          auVar111._20_4_ = fStack_4ac;
          auVar111._24_4_ = fStack_4a8;
          auVar111._28_4_ = fStack_4a4;
          auVar290._0_4_ = local_4c0 + fVar304;
          auVar290._4_4_ = fStack_4bc + fVar205;
          auVar290._8_4_ = fStack_4b8 + fVar236;
          auVar290._12_4_ = fStack_4b4 + fVar246;
          auVar290._16_4_ = fStack_4b0 + fVar249;
          auVar290._20_4_ = fStack_4ac + fVar252;
          auVar290._24_4_ = fStack_4a8 + fVar309;
          auVar290._28_4_ = fStack_4a4 + auVar139._28_4_;
          auVar27 = vsubps_avx(auVar231,auVar74);
          auVar199 = vsubps_avx(auVar111,auVar75);
          auVar217 = vsubps_avx(auVar221,auVar28);
          auVar218 = vsubps_avx(auVar290,auVar29);
          auVar76._4_4_ = auVar29._4_4_ * auVar217._4_4_;
          auVar76._0_4_ = auVar29._0_4_ * auVar217._0_4_;
          auVar76._8_4_ = auVar29._8_4_ * auVar217._8_4_;
          auVar76._12_4_ = auVar29._12_4_ * auVar217._12_4_;
          auVar76._16_4_ = auVar29._16_4_ * auVar217._16_4_;
          auVar76._20_4_ = auVar29._20_4_ * auVar217._20_4_;
          auVar76._24_4_ = auVar29._24_4_ * auVar217._24_4_;
          auVar76._28_4_ = auVar317._28_4_;
          auVar77._4_4_ = auVar28._4_4_ * auVar218._4_4_;
          auVar77._0_4_ = auVar28._0_4_ * auVar218._0_4_;
          auVar77._8_4_ = auVar28._8_4_ * auVar218._8_4_;
          auVar77._12_4_ = auVar28._12_4_ * auVar218._12_4_;
          auVar77._16_4_ = auVar28._16_4_ * auVar218._16_4_;
          auVar77._20_4_ = auVar28._20_4_ * auVar218._20_4_;
          auVar77._24_4_ = auVar28._24_4_ * auVar218._24_4_;
          auVar77._28_4_ = fStack_4a4;
          auVar261 = vsubps_avx(auVar77,auVar76);
          auVar78._4_4_ = auVar170._4_4_ * auVar218._4_4_;
          auVar78._0_4_ = auVar170._0_4_ * auVar218._0_4_;
          auVar78._8_4_ = auVar170._8_4_ * auVar218._8_4_;
          auVar78._12_4_ = auVar170._12_4_ * auVar218._12_4_;
          auVar78._16_4_ = auVar170._16_4_ * auVar218._16_4_;
          auVar78._20_4_ = auVar170._20_4_ * auVar218._20_4_;
          auVar78._24_4_ = auVar170._24_4_ * auVar218._24_4_;
          auVar78._28_4_ = auVar218._28_4_;
          auVar218 = vsubps_avx(auVar325,auVar170);
          auVar79._4_4_ = auVar29._4_4_ * auVar218._4_4_;
          auVar79._0_4_ = auVar29._0_4_ * auVar218._0_4_;
          auVar79._8_4_ = auVar29._8_4_ * auVar218._8_4_;
          auVar79._12_4_ = auVar29._12_4_ * auVar218._12_4_;
          auVar79._16_4_ = auVar29._16_4_ * auVar218._16_4_;
          auVar79._20_4_ = auVar29._20_4_ * auVar218._20_4_;
          auVar79._24_4_ = auVar29._24_4_ * auVar218._24_4_;
          auVar79._28_4_ = auVar26._28_4_;
          auVar307 = vsubps_avx(auVar79,auVar78);
          auVar80._4_4_ = auVar28._4_4_ * auVar218._4_4_;
          auVar80._0_4_ = auVar28._0_4_ * auVar218._0_4_;
          auVar80._8_4_ = auVar28._8_4_ * auVar218._8_4_;
          auVar80._12_4_ = auVar28._12_4_ * auVar218._12_4_;
          auVar80._16_4_ = auVar28._16_4_ * auVar218._16_4_;
          auVar80._20_4_ = auVar28._20_4_ * auVar218._20_4_;
          auVar80._24_4_ = auVar28._24_4_ * auVar218._24_4_;
          auVar80._28_4_ = auVar26._28_4_;
          auVar81._4_4_ = auVar170._4_4_ * auVar217._4_4_;
          auVar81._0_4_ = auVar170._0_4_ * auVar217._0_4_;
          auVar81._8_4_ = auVar170._8_4_ * auVar217._8_4_;
          auVar81._12_4_ = auVar170._12_4_ * auVar217._12_4_;
          auVar81._16_4_ = auVar170._16_4_ * auVar217._16_4_;
          auVar81._20_4_ = auVar170._20_4_ * auVar217._20_4_;
          auVar81._24_4_ = auVar170._24_4_ * auVar217._24_4_;
          auVar81._28_4_ = auVar217._28_4_;
          auVar26 = vsubps_avx(auVar81,auVar80);
          auVar168._0_4_ = auVar261._0_4_ * 0.0 + auVar26._0_4_ + auVar307._0_4_ * 0.0;
          auVar168._4_4_ = auVar261._4_4_ * 0.0 + auVar26._4_4_ + auVar307._4_4_ * 0.0;
          auVar168._8_4_ = auVar261._8_4_ * 0.0 + auVar26._8_4_ + auVar307._8_4_ * 0.0;
          auVar168._12_4_ = auVar261._12_4_ * 0.0 + auVar26._12_4_ + auVar307._12_4_ * 0.0;
          auVar168._16_4_ = auVar261._16_4_ * 0.0 + auVar26._16_4_ + auVar307._16_4_ * 0.0;
          auVar168._20_4_ = auVar261._20_4_ * 0.0 + auVar26._20_4_ + auVar307._20_4_ * 0.0;
          auVar168._24_4_ = auVar261._24_4_ * 0.0 + auVar26._24_4_ + auVar307._24_4_ * 0.0;
          auVar168._28_4_ = auVar261._28_4_ + auVar26._28_4_ + auVar307._28_4_;
          auVar16 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
          auVar26 = vblendvps_avx(auVar33,_local_680,auVar16);
          auVar203 = ZEXT3264(auVar26);
          auVar33 = vblendvps_avx(auVar27,_local_720,auVar16);
          auVar27 = vblendvps_avx(auVar199,auVar329,auVar16);
          auVar199 = vblendvps_avx(auVar170,auVar325,auVar16);
          auVar217 = vblendvps_avx(auVar28,auVar221,auVar16);
          auVar218 = vblendvps_avx(auVar29,auVar290,auVar16);
          auVar261 = vblendvps_avx(auVar325,auVar170,auVar16);
          auVar307 = vblendvps_avx(auVar221,auVar28,auVar16);
          auVar15 = vblendvps_avx(auVar290,auVar29,auVar16);
          auVar170 = vandps_avx(auVar25,_local_580);
          auVar261 = vsubps_avx(auVar261,auVar26);
          auVar30 = vsubps_avx(auVar307,auVar33);
          auVar31 = vsubps_avx(auVar15,auVar27);
          auVar15 = vsubps_avx(auVar33,auVar217);
          fVar304 = auVar30._0_4_;
          fVar255 = auVar27._0_4_;
          fVar234 = auVar30._4_4_;
          fVar256 = auVar27._4_4_;
          auVar82._4_4_ = fVar256 * fVar234;
          auVar82._0_4_ = fVar255 * fVar304;
          fVar270 = auVar30._8_4_;
          fVar257 = auVar27._8_4_;
          auVar82._8_4_ = fVar257 * fVar270;
          fVar172 = auVar30._12_4_;
          fVar266 = auVar27._12_4_;
          auVar82._12_4_ = fVar266 * fVar172;
          fVar155 = auVar30._16_4_;
          fVar267 = auVar27._16_4_;
          auVar82._16_4_ = fVar267 * fVar155;
          fVar211 = auVar30._20_4_;
          fVar268 = auVar27._20_4_;
          auVar82._20_4_ = fVar268 * fVar211;
          fVar224 = auVar30._24_4_;
          fVar269 = auVar27._24_4_;
          auVar82._24_4_ = fVar269 * fVar224;
          auVar82._28_4_ = auVar307._28_4_;
          fVar205 = auVar33._0_4_;
          fVar283 = auVar31._0_4_;
          fVar310 = auVar33._4_4_;
          fVar292 = auVar31._4_4_;
          auVar83._4_4_ = fVar292 * fVar310;
          auVar83._0_4_ = fVar283 * fVar205;
          fVar271 = auVar33._8_4_;
          fVar295 = auVar31._8_4_;
          auVar83._8_4_ = fVar295 * fVar271;
          fVar281 = auVar33._12_4_;
          fVar297 = auVar31._12_4_;
          auVar83._12_4_ = fVar297 * fVar281;
          fVar192 = auVar33._16_4_;
          fVar298 = auVar31._16_4_;
          auVar83._16_4_ = fVar298 * fVar192;
          fVar235 = auVar33._20_4_;
          fVar299 = auVar31._20_4_;
          auVar83._20_4_ = fVar299 * fVar235;
          fVar225 = auVar33._24_4_;
          fVar300 = auVar31._24_4_;
          uVar126 = auVar28._28_4_;
          auVar83._24_4_ = fVar300 * fVar225;
          auVar83._28_4_ = uVar126;
          auVar307 = vsubps_avx(auVar83,auVar82);
          fVar236 = auVar26._0_4_;
          fVar278 = auVar26._4_4_;
          auVar84._4_4_ = fVar292 * fVar278;
          auVar84._0_4_ = fVar283 * fVar236;
          fVar210 = auVar26._8_4_;
          auVar84._8_4_ = fVar295 * fVar210;
          fVar143 = auVar26._12_4_;
          auVar84._12_4_ = fVar297 * fVar143;
          fVar204 = auVar26._16_4_;
          auVar84._16_4_ = fVar298 * fVar204;
          fVar237 = auVar26._20_4_;
          auVar84._20_4_ = fVar299 * fVar237;
          fVar173 = auVar26._24_4_;
          auVar84._24_4_ = fVar300 * fVar173;
          auVar84._28_4_ = uVar126;
          fVar246 = auVar261._0_4_;
          fVar312 = auVar261._4_4_;
          auVar85._4_4_ = fVar256 * fVar312;
          auVar85._0_4_ = fVar255 * fVar246;
          fVar280 = auVar261._8_4_;
          auVar85._8_4_ = fVar257 * fVar280;
          fVar146 = auVar261._12_4_;
          auVar85._12_4_ = fVar266 * fVar146;
          fVar206 = auVar261._16_4_;
          auVar85._16_4_ = fVar267 * fVar206;
          fVar247 = auVar261._20_4_;
          auVar85._20_4_ = fVar268 * fVar247;
          fVar238 = auVar261._24_4_;
          auVar85._24_4_ = fVar269 * fVar238;
          auVar85._28_4_ = auVar325._28_4_;
          auVar28 = vsubps_avx(auVar85,auVar84);
          auVar86._4_4_ = fVar310 * fVar312;
          auVar86._0_4_ = fVar205 * fVar246;
          auVar86._8_4_ = fVar271 * fVar280;
          auVar86._12_4_ = fVar281 * fVar146;
          auVar86._16_4_ = fVar192 * fVar206;
          auVar86._20_4_ = fVar235 * fVar247;
          auVar86._24_4_ = fVar225 * fVar238;
          auVar86._28_4_ = uVar126;
          auVar87._4_4_ = fVar278 * fVar234;
          auVar87._0_4_ = fVar236 * fVar304;
          auVar87._8_4_ = fVar210 * fVar270;
          auVar87._12_4_ = fVar143 * fVar172;
          auVar87._16_4_ = fVar204 * fVar155;
          auVar87._20_4_ = fVar237 * fVar211;
          auVar87._24_4_ = fVar173 * fVar224;
          auVar87._28_4_ = auVar29._28_4_;
          auVar29 = vsubps_avx(auVar87,auVar86);
          auVar32 = vsubps_avx(auVar27,auVar218);
          fVar252 = auVar29._28_4_ + auVar28._28_4_;
          local_760._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.0 + auVar307._0_4_ * 0.0;
          local_760._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.0 + auVar307._4_4_ * 0.0;
          local_760._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.0 + auVar307._8_4_ * 0.0;
          local_760._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.0 + auVar307._12_4_ * 0.0;
          local_760._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.0 + auVar307._16_4_ * 0.0;
          local_760._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.0 + auVar307._20_4_ * 0.0;
          local_760._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.0 + auVar307._24_4_ * 0.0;
          local_760._28_4_ = fVar252 + auVar307._28_4_;
          fVar249 = auVar15._0_4_;
          fVar311 = auVar15._4_4_;
          auVar88._4_4_ = auVar218._4_4_ * fVar311;
          auVar88._0_4_ = auVar218._0_4_ * fVar249;
          fVar276 = auVar15._8_4_;
          auVar88._8_4_ = auVar218._8_4_ * fVar276;
          fVar149 = auVar15._12_4_;
          auVar88._12_4_ = auVar218._12_4_ * fVar149;
          fVar207 = auVar15._16_4_;
          auVar88._16_4_ = auVar218._16_4_ * fVar207;
          fVar250 = auVar15._20_4_;
          auVar88._20_4_ = auVar218._20_4_ * fVar250;
          fVar248 = auVar15._24_4_;
          auVar88._24_4_ = auVar218._24_4_ * fVar248;
          auVar88._28_4_ = fVar252;
          fVar252 = auVar32._0_4_;
          fVar313 = auVar32._4_4_;
          auVar89._4_4_ = auVar217._4_4_ * fVar313;
          auVar89._0_4_ = auVar217._0_4_ * fVar252;
          fVar277 = auVar32._8_4_;
          auVar89._8_4_ = auVar217._8_4_ * fVar277;
          fVar151 = auVar32._12_4_;
          auVar89._12_4_ = auVar217._12_4_ * fVar151;
          fVar208 = auVar32._16_4_;
          auVar89._16_4_ = auVar217._16_4_ * fVar208;
          fVar253 = auVar32._20_4_;
          auVar89._20_4_ = auVar217._20_4_ * fVar253;
          fVar251 = auVar32._24_4_;
          auVar89._24_4_ = auVar217._24_4_ * fVar251;
          auVar89._28_4_ = auVar29._28_4_;
          auVar15 = vsubps_avx(auVar89,auVar88);
          auVar28 = vsubps_avx(auVar26,auVar199);
          fVar309 = auVar28._0_4_;
          fVar279 = auVar28._4_4_;
          auVar90._4_4_ = auVar218._4_4_ * fVar279;
          auVar90._0_4_ = auVar218._0_4_ * fVar309;
          fVar212 = auVar28._8_4_;
          auVar90._8_4_ = auVar218._8_4_ * fVar212;
          fVar153 = auVar28._12_4_;
          auVar90._12_4_ = auVar218._12_4_ * fVar153;
          fVar209 = auVar28._16_4_;
          auVar90._16_4_ = auVar218._16_4_ * fVar209;
          fVar223 = auVar28._20_4_;
          auVar90._20_4_ = auVar218._20_4_ * fVar223;
          fVar254 = auVar28._24_4_;
          auVar90._24_4_ = auVar218._24_4_ * fVar254;
          auVar90._28_4_ = auVar218._28_4_;
          auVar91._4_4_ = fVar313 * auVar199._4_4_;
          auVar91._0_4_ = fVar252 * auVar199._0_4_;
          auVar91._8_4_ = fVar277 * auVar199._8_4_;
          auVar91._12_4_ = fVar151 * auVar199._12_4_;
          auVar91._16_4_ = fVar208 * auVar199._16_4_;
          auVar91._20_4_ = fVar253 * auVar199._20_4_;
          auVar91._24_4_ = fVar251 * auVar199._24_4_;
          auVar91._28_4_ = auVar307._28_4_;
          auVar218 = vsubps_avx(auVar90,auVar91);
          auVar92._4_4_ = auVar217._4_4_ * fVar279;
          auVar92._0_4_ = auVar217._0_4_ * fVar309;
          auVar92._8_4_ = auVar217._8_4_ * fVar212;
          auVar92._12_4_ = auVar217._12_4_ * fVar153;
          auVar92._16_4_ = auVar217._16_4_ * fVar209;
          auVar92._20_4_ = auVar217._20_4_ * fVar223;
          auVar92._24_4_ = auVar217._24_4_ * fVar254;
          auVar92._28_4_ = auVar217._28_4_;
          auVar93._4_4_ = fVar311 * auVar199._4_4_;
          auVar93._0_4_ = fVar249 * auVar199._0_4_;
          auVar93._8_4_ = fVar276 * auVar199._8_4_;
          auVar93._12_4_ = fVar149 * auVar199._12_4_;
          auVar93._16_4_ = fVar207 * auVar199._16_4_;
          auVar93._20_4_ = fVar250 * auVar199._20_4_;
          auVar93._24_4_ = fVar248 * auVar199._24_4_;
          auVar93._28_4_ = auVar199._28_4_;
          auVar199 = vsubps_avx(auVar93,auVar92);
          auVar140._0_4_ = auVar15._0_4_ * 0.0 + auVar199._0_4_ + auVar218._0_4_ * 0.0;
          auVar140._4_4_ = auVar15._4_4_ * 0.0 + auVar199._4_4_ + auVar218._4_4_ * 0.0;
          auVar140._8_4_ = auVar15._8_4_ * 0.0 + auVar199._8_4_ + auVar218._8_4_ * 0.0;
          auVar140._12_4_ = auVar15._12_4_ * 0.0 + auVar199._12_4_ + auVar218._12_4_ * 0.0;
          auVar140._16_4_ = auVar15._16_4_ * 0.0 + auVar199._16_4_ + auVar218._16_4_ * 0.0;
          auVar140._20_4_ = auVar15._20_4_ * 0.0 + auVar199._20_4_ + auVar218._20_4_ * 0.0;
          auVar140._24_4_ = auVar15._24_4_ * 0.0 + auVar199._24_4_ + auVar218._24_4_ * 0.0;
          auVar140._28_4_ = auVar218._28_4_ + auVar199._28_4_ + auVar218._28_4_;
          auVar141 = ZEXT3264(auVar140);
          auVar199 = vmaxps_avx(local_760,auVar140);
          auVar199 = vcmpps_avx(auVar199,ZEXT432(0) << 0x20,2);
          auVar217 = auVar170 & auVar199;
          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar217 >> 0x7f,0) == '\0') &&
                (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar217 >> 0xbf,0) == '\0') &&
              (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar217[0x1f]) {
LAB_0093da1b:
            auVar293 = auVar31._4_12_;
            auVar171 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar308._4_4_ = fVar144;
            auVar308._0_4_ = fVar129;
            auVar308._8_4_ = fVar147;
            auVar308._12_4_ = fVar150;
            auVar308._16_4_ = fVar152;
            auVar308._20_4_ = fVar154;
            auVar308._24_4_ = fVar156;
            auVar308._28_4_ = fVar157;
          }
          else {
            auVar217 = vandps_avx(auVar199,auVar170);
            auVar94._4_4_ = fVar313 * fVar234;
            auVar94._0_4_ = fVar252 * fVar304;
            auVar94._8_4_ = fVar277 * fVar270;
            auVar94._12_4_ = fVar151 * fVar172;
            auVar94._16_4_ = fVar208 * fVar155;
            auVar94._20_4_ = fVar253 * fVar211;
            auVar94._24_4_ = fVar251 * fVar224;
            auVar94._28_4_ = auVar170._28_4_;
            auVar95._4_4_ = fVar311 * fVar292;
            auVar95._0_4_ = fVar249 * fVar283;
            auVar95._8_4_ = fVar276 * fVar295;
            auVar95._12_4_ = fVar149 * fVar297;
            auVar95._16_4_ = fVar207 * fVar298;
            auVar95._20_4_ = fVar250 * fVar299;
            auVar95._24_4_ = fVar248 * fVar300;
            auVar95._28_4_ = auVar199._28_4_;
            auVar199 = vsubps_avx(auVar95,auVar94);
            auVar96._4_4_ = fVar279 * fVar292;
            auVar96._0_4_ = fVar309 * fVar283;
            auVar96._8_4_ = fVar212 * fVar295;
            auVar96._12_4_ = fVar153 * fVar297;
            auVar96._16_4_ = fVar209 * fVar298;
            auVar96._20_4_ = fVar223 * fVar299;
            auVar96._24_4_ = fVar254 * fVar300;
            auVar96._28_4_ = auVar31._28_4_;
            auVar97._4_4_ = fVar313 * fVar312;
            auVar97._0_4_ = fVar252 * fVar246;
            auVar97._8_4_ = fVar277 * fVar280;
            auVar97._12_4_ = fVar151 * fVar146;
            auVar97._16_4_ = fVar208 * fVar206;
            auVar97._20_4_ = fVar253 * fVar247;
            auVar97._24_4_ = fVar251 * fVar238;
            auVar97._28_4_ = auVar32._28_4_;
            auVar31 = vsubps_avx(auVar97,auVar96);
            auVar293 = auVar31._4_12_;
            auVar98._4_4_ = fVar311 * fVar312;
            auVar98._0_4_ = fVar249 * fVar246;
            auVar98._8_4_ = fVar276 * fVar280;
            auVar98._12_4_ = fVar149 * fVar146;
            auVar98._16_4_ = fVar207 * fVar206;
            auVar98._20_4_ = fVar250 * fVar247;
            auVar98._24_4_ = fVar248 * fVar238;
            auVar98._28_4_ = auVar261._28_4_;
            auVar99._4_4_ = fVar279 * fVar234;
            auVar99._0_4_ = fVar309 * fVar304;
            auVar99._8_4_ = fVar212 * fVar270;
            auVar99._12_4_ = fVar153 * fVar172;
            auVar99._16_4_ = fVar209 * fVar155;
            auVar99._20_4_ = fVar223 * fVar211;
            auVar99._24_4_ = fVar254 * fVar224;
            auVar99._28_4_ = auVar30._28_4_;
            auVar218 = vsubps_avx(auVar99,auVar98);
            auVar169._0_4_ = auVar199._0_4_ * 0.0 + auVar218._0_4_ + auVar31._0_4_ * 0.0;
            auVar169._4_4_ = auVar199._4_4_ * 0.0 + auVar218._4_4_ + auVar31._4_4_ * 0.0;
            auVar169._8_4_ = auVar199._8_4_ * 0.0 + auVar218._8_4_ + auVar31._8_4_ * 0.0;
            auVar169._12_4_ = auVar199._12_4_ * 0.0 + auVar218._12_4_ + auVar31._12_4_ * 0.0;
            auVar169._16_4_ = auVar199._16_4_ * 0.0 + auVar218._16_4_ + auVar31._16_4_ * 0.0;
            auVar169._20_4_ = auVar199._20_4_ * 0.0 + auVar218._20_4_ + auVar31._20_4_ * 0.0;
            auVar169._24_4_ = auVar199._24_4_ * 0.0 + auVar218._24_4_ + auVar31._24_4_ * 0.0;
            auVar169._28_4_ = auVar30._28_4_ + auVar218._28_4_ + auVar261._28_4_;
            auVar170 = vrcpps_avx(auVar169);
            fVar304 = auVar170._0_4_;
            fVar246 = auVar170._4_4_;
            auVar100._4_4_ = auVar169._4_4_ * fVar246;
            auVar100._0_4_ = auVar169._0_4_ * fVar304;
            fVar249 = auVar170._8_4_;
            auVar100._8_4_ = auVar169._8_4_ * fVar249;
            fVar252 = auVar170._12_4_;
            auVar100._12_4_ = auVar169._12_4_ * fVar252;
            fVar309 = auVar170._16_4_;
            auVar100._16_4_ = auVar169._16_4_ * fVar309;
            fVar234 = auVar170._20_4_;
            auVar100._20_4_ = auVar169._20_4_ * fVar234;
            fVar312 = auVar170._24_4_;
            auVar100._24_4_ = auVar169._24_4_ * fVar312;
            auVar100._28_4_ = auVar32._28_4_;
            auVar318._8_4_ = 0x3f800000;
            auVar318._0_8_ = 0x3f8000003f800000;
            auVar318._12_4_ = 0x3f800000;
            auVar318._16_4_ = 0x3f800000;
            auVar318._20_4_ = 0x3f800000;
            auVar318._24_4_ = 0x3f800000;
            auVar318._28_4_ = 0x3f800000;
            auVar170 = vsubps_avx(auVar318,auVar100);
            fVar304 = auVar170._0_4_ * fVar304 + fVar304;
            fVar246 = auVar170._4_4_ * fVar246 + fVar246;
            fVar249 = auVar170._8_4_ * fVar249 + fVar249;
            fVar252 = auVar170._12_4_ * fVar252 + fVar252;
            fVar309 = auVar170._16_4_ * fVar309 + fVar309;
            fVar234 = auVar170._20_4_ * fVar234 + fVar234;
            fVar312 = auVar170._24_4_ * fVar312 + fVar312;
            auVar101._4_4_ =
                 (fVar278 * auVar199._4_4_ + auVar31._4_4_ * fVar310 + auVar218._4_4_ * fVar256) *
                 fVar246;
            auVar101._0_4_ =
                 (fVar236 * auVar199._0_4_ + auVar31._0_4_ * fVar205 + auVar218._0_4_ * fVar255) *
                 fVar304;
            auVar101._8_4_ =
                 (fVar210 * auVar199._8_4_ + auVar31._8_4_ * fVar271 + auVar218._8_4_ * fVar257) *
                 fVar249;
            auVar101._12_4_ =
                 (fVar143 * auVar199._12_4_ + auVar31._12_4_ * fVar281 + auVar218._12_4_ * fVar266)
                 * fVar252;
            auVar101._16_4_ =
                 (fVar204 * auVar199._16_4_ + auVar31._16_4_ * fVar192 + auVar218._16_4_ * fVar267)
                 * fVar309;
            auVar101._20_4_ =
                 (fVar237 * auVar199._20_4_ + auVar31._20_4_ * fVar235 + auVar218._20_4_ * fVar268)
                 * fVar234;
            auVar101._24_4_ =
                 (fVar173 * auVar199._24_4_ + auVar31._24_4_ * fVar225 + auVar218._24_4_ * fVar269)
                 * fVar312;
            auVar101._28_4_ = auVar26._28_4_ + auVar33._28_4_ + auVar27._28_4_;
            auVar203 = ZEXT3264(auVar101);
            uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar222._4_4_ = uVar126;
            auVar222._0_4_ = uVar126;
            auVar222._8_4_ = uVar126;
            auVar222._12_4_ = uVar126;
            auVar222._16_4_ = uVar126;
            auVar222._20_4_ = uVar126;
            auVar222._24_4_ = uVar126;
            auVar222._28_4_ = uVar126;
            auVar170 = vcmpps_avx(local_340,auVar101,2);
            auVar26 = vcmpps_avx(auVar101,auVar222,2);
            auVar170 = vandps_avx(auVar170,auVar26);
            auVar33 = auVar217 & auVar170;
            if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar33 >> 0x7f,0) == '\0') &&
                  (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0xbf,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar33[0x1f]) goto LAB_0093da1b;
            auVar170 = vandps_avx(auVar217,auVar170);
            auVar33 = vcmpps_avx(ZEXT432(0) << 0x20,auVar169,4);
            auVar27 = auVar170 & auVar33;
            auVar171 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar308._4_4_ = fVar144;
            auVar308._0_4_ = fVar129;
            auVar308._8_4_ = fVar147;
            auVar308._12_4_ = fVar150;
            auVar308._16_4_ = fVar152;
            auVar308._20_4_ = fVar154;
            auVar308._24_4_ = fVar156;
            auVar308._28_4_ = fVar157;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar170 = vandps_avx(auVar33,auVar170);
              auVar171 = ZEXT3264(auVar170);
              auVar102._4_4_ = fVar246 * local_760._4_4_;
              auVar102._0_4_ = fVar304 * (float)local_760._0_4_;
              auVar102._8_4_ = fVar249 * local_760._8_4_;
              auVar102._12_4_ = fVar252 * local_760._12_4_;
              auVar102._16_4_ = fVar309 * local_760._16_4_;
              auVar102._20_4_ = fVar234 * local_760._20_4_;
              auVar102._24_4_ = fVar312 * local_760._24_4_;
              auVar102._28_4_ = auVar26._28_4_;
              auVar103._4_4_ = auVar140._4_4_ * fVar246;
              auVar103._0_4_ = auVar140._0_4_ * fVar304;
              auVar103._8_4_ = auVar140._8_4_ * fVar249;
              auVar103._12_4_ = auVar140._12_4_ * fVar252;
              auVar103._16_4_ = auVar140._16_4_ * fVar309;
              auVar103._20_4_ = auVar140._20_4_ * fVar234;
              auVar103._24_4_ = auVar140._24_4_ * fVar312;
              auVar103._28_4_ = auVar140._28_4_;
              auVar245._8_4_ = 0x3f800000;
              auVar245._0_8_ = 0x3f8000003f800000;
              auVar245._12_4_ = 0x3f800000;
              auVar245._16_4_ = 0x3f800000;
              auVar245._20_4_ = 0x3f800000;
              auVar245._24_4_ = 0x3f800000;
              auVar245._28_4_ = 0x3f800000;
              auVar170 = vsubps_avx(auVar245,auVar102);
              local_180 = vblendvps_avx(auVar170,auVar102,auVar16);
              auVar170 = vsubps_avx(auVar245,auVar103);
              _local_380 = vblendvps_avx(auVar170,auVar103,auVar16);
              auVar141 = ZEXT3264(_local_380);
              local_1a0 = auVar101;
            }
          }
          auVar170 = auVar171._0_32_;
          auVar319 = ZEXT3264(_local_7a0);
          if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar170 >> 0x7f,0) == '\0') &&
                (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar170 >> 0xbf,0) == '\0') &&
              (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar171[0x1f]) {
            auVar233 = ZEXT3264(auVar186);
          }
          else {
            auVar26 = vsubps_avx(_local_5a0,auVar308);
            auVar203 = ZEXT3264(local_180);
            fVar205 = auVar308._0_4_ + auVar26._0_4_ * local_180._0_4_;
            fVar236 = auVar308._4_4_ + auVar26._4_4_ * local_180._4_4_;
            fVar246 = auVar308._8_4_ + auVar26._8_4_ * local_180._8_4_;
            fVar249 = auVar308._12_4_ + auVar26._12_4_ * local_180._12_4_;
            fVar252 = auVar308._16_4_ + auVar26._16_4_ * local_180._16_4_;
            fVar309 = auVar308._20_4_ + auVar26._20_4_ * local_180._20_4_;
            fVar234 = auVar308._24_4_ + auVar26._24_4_ * local_180._24_4_;
            fVar310 = auVar308._28_4_ + auVar26._28_4_;
            fVar304 = *(float *)((long)local_7b0->ray_space + k * 4 + -0x10);
            auVar104._4_4_ = (fVar236 + fVar236) * fVar304;
            auVar104._0_4_ = (fVar205 + fVar205) * fVar304;
            auVar104._8_4_ = (fVar246 + fVar246) * fVar304;
            auVar104._12_4_ = (fVar249 + fVar249) * fVar304;
            auVar104._16_4_ = (fVar252 + fVar252) * fVar304;
            auVar104._20_4_ = (fVar309 + fVar309) * fVar304;
            auVar104._24_4_ = (fVar234 + fVar234) * fVar304;
            auVar104._28_4_ = fVar310 + fVar310;
            auVar26 = vcmpps_avx(local_1a0,auVar104,6);
            auVar141 = ZEXT3264(auVar26);
            auVar33 = auVar170 & auVar26;
            auVar233 = ZEXT3264(auVar186);
            if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0x7f,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0xbf,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar33[0x1f] < '\0') {
              local_220 = vandps_avx(auVar26,auVar170);
              auVar141 = ZEXT3264(local_220);
              auVar163._0_8_ =
                   CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                            (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
              auVar163._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
              auVar163._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
              auVar165._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
              auVar165._0_16_ = auVar163;
              auVar165._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
              fStack_2a8 = (float)uStack_368 + (float)uStack_368 + -1.0;
              _local_2c0 = auVar165;
              fStack_2a4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
              auVar171 = ZEXT3264(_local_2c0);
              local_2e0 = local_180;
              local_2a0 = local_1a0;
              local_270 = local_6d0;
              uStack_268 = uStack_6c8;
              local_260 = local_6e0;
              uStack_258 = uStack_6d8;
              local_250 = local_5b0;
              uStack_248 = uStack_5a8;
              local_240 = local_5c0;
              uStack_238 = uStack_5b8;
              pGVar125 = (context->scene->geometries).items[local_7a8].ptr;
              _local_380 = _local_2c0;
              if ((pGVar125->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar119 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar119 = context->args;
                if ((pRVar119->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar119 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar119 >> 8),1),
                   pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780._4_28_ = auVar231._4_28_;
                  local_780._0_4_ = (int)uVar124;
                  auVar182._0_4_ = (float)(int)local_280;
                  auVar182._4_12_ = auVar293;
                  auVar183 = vshufps_avx(auVar182,auVar182,0);
                  local_200[0] = (auVar183._0_4_ + local_180._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_200[1] = (auVar183._4_4_ + local_180._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_200[2] = (auVar183._8_4_ + local_180._8_4_ + 2.0) * fStack_118;
                  local_200[3] = (auVar183._12_4_ + local_180._12_4_ + 3.0) * fStack_114;
                  fStack_1f0 = (auVar183._0_4_ + local_180._16_4_ + 4.0) * fStack_110;
                  fStack_1ec = (auVar183._4_4_ + local_180._20_4_ + 5.0) * fStack_10c;
                  fStack_1e8 = (auVar183._8_4_ + local_180._24_4_ + 6.0) * fStack_108;
                  fStack_1e4 = auVar183._12_4_ + (float)local_180._28_4_ + 7.0;
                  uStack_378 = auVar163._8_8_;
                  uStack_370 = auVar165._16_8_;
                  uStack_368 = local_2c0._24_8_;
                  local_1e0 = auVar163._0_8_;
                  uStack_1d8 = uStack_378;
                  uStack_1d0 = uStack_370;
                  uStack_1c8 = uStack_368;
                  auVar171 = ZEXT3264(local_1a0);
                  local_1c0 = local_1a0;
                  uVar126 = vmovmskps_avx(local_220);
                  uVar124 = CONCAT44((int)((ulong)pRVar119 >> 0x20),uVar126);
                  uVar121 = 0;
                  if (uVar124 != 0) {
                    for (; (uVar124 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                    }
                  }
                  local_660._0_8_ = pGVar125;
                  _local_620 = auVar25;
                  local_27c = uVar11;
                  while (uVar124 != 0) {
                    local_760._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3e0 = local_200[uVar121];
                    local_3d0 = *(undefined4 *)((long)&local_1e0 + uVar121 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar121 * 4);
                    fVar282 = 1.0 - local_3e0;
                    fVar258 = local_3e0 * 3.0;
                    auVar183 = ZEXT416((uint)((fVar282 * -2.0 * local_3e0 + local_3e0 * local_3e0) *
                                             0.5));
                    auVar183 = vshufps_avx(auVar183,auVar183,0);
                    auVar196 = ZEXT416((uint)(((fVar282 + fVar282) * (fVar258 + 2.0) +
                                              fVar282 * fVar282 * -3.0) * 0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar197 = ZEXT416((uint)(((local_3e0 + local_3e0) * (fVar258 + -5.0) +
                                              local_3e0 * fVar258) * 0.5));
                    auVar197 = vshufps_avx(auVar197,auVar197,0);
                    local_6b0.context = context->user;
                    auVar198 = ZEXT416((uint)((local_3e0 * (fVar282 + fVar282) - fVar282 * fVar282)
                                             * 0.5));
                    auVar198 = vshufps_avx(auVar198,auVar198,0);
                    auVar184._0_4_ =
                         auVar198._0_4_ * (float)local_6d0._0_4_ +
                         auVar197._0_4_ * (float)local_6e0._0_4_ +
                         auVar183._0_4_ * (float)local_5c0._0_4_ +
                         auVar196._0_4_ * (float)local_5b0._0_4_;
                    auVar184._4_4_ =
                         auVar198._4_4_ * (float)local_6d0._4_4_ +
                         auVar197._4_4_ * (float)local_6e0._4_4_ +
                         auVar183._4_4_ * (float)local_5c0._4_4_ +
                         auVar196._4_4_ * (float)local_5b0._4_4_;
                    auVar184._8_4_ =
                         auVar198._8_4_ * (float)uStack_6c8 +
                         auVar197._8_4_ * (float)uStack_6d8 +
                         auVar183._8_4_ * (float)uStack_5b8 + auVar196._8_4_ * (float)uStack_5a8;
                    auVar184._12_4_ =
                         auVar198._12_4_ * uStack_6c8._4_4_ +
                         auVar197._12_4_ * uStack_6d8._4_4_ +
                         auVar183._12_4_ * uStack_5b8._4_4_ + auVar196._12_4_ * uStack_5a8._4_4_;
                    local_410 = (RTCHitN  [16])vshufps_avx(auVar184,auVar184,0);
                    local_400 = vshufps_avx(auVar184,auVar184,0x55);
                    auVar203 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar184,auVar184,0xaa);
                    local_3c0 = local_300._0_8_;
                    uStack_3b8 = local_300._8_8_;
                    local_3b0 = local_5d0;
                    vcmpps_avx(ZEXT1632(local_5d0),ZEXT1632(local_5d0),0xf);
                    uStack_39c = (local_6b0.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_6b0.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_7c0 = *local_6b8;
                    local_6b0.valid = (int *)local_7c0;
                    local_6b0.geometryUserPtr = pGVar125->userPtr;
                    local_6b0.hit = local_410;
                    local_6b0.N = 4;
                    local_6b0.ray = (RTCRayN *)ray;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    if (pGVar125->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar203 = ZEXT1664(local_400);
                      (*pGVar125->occlusionFilterN)(&local_6b0);
                    }
                    if (local_7c0 == (undefined1  [16])0x0) {
                      auVar183 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar183 = auVar183 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar203 = ZEXT1664(auVar203._0_16_);
                        (*p_Var14)(&local_6b0);
                      }
                      auVar196 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                      auVar183 = auVar196 ^ _DAT_01f46b70;
                      auVar185._8_4_ = 0xff800000;
                      auVar185._0_8_ = 0xff800000ff800000;
                      auVar185._12_4_ = 0xff800000;
                      auVar196 = vblendvps_avx(auVar185,*(undefined1 (*) [16])(local_6b0.ray + 0x80)
                                               ,auVar196);
                      *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar196;
                    }
                    auVar141 = ZEXT1664(auVar183);
                    auVar164._8_8_ = 0x100000001;
                    auVar164._0_8_ = 0x100000001;
                    auVar171 = ZEXT1664(auVar164);
                    if ((auVar164 & auVar183) != (undefined1  [16])0x0) {
                      pRVar119 = (RTCIntersectArguments *)0x1;
                      goto LAB_0093da3e;
                    }
                    auVar141 = ZEXT464((uint)local_760._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_760._0_4_;
                    uVar124 = uVar124 ^ 1L << (uVar121 & 0x3f);
                    uVar121 = 0;
                    pGVar125 = (Geometry *)local_660._0_8_;
                    if (uVar124 != 0) {
                      for (; (uVar124 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                      }
                    }
                  }
                  pRVar119 = (RTCIntersectArguments *)0x0;
LAB_0093da3e:
                  auVar319 = ZEXT3264(_local_7a0);
                  uVar124 = (ulong)(uint)local_780._0_4_;
                  fVar291 = (float)local_600._0_4_;
                  fVar264 = (float)local_600._4_4_;
                  fVar294 = fStack_5f8;
                  fVar265 = fStack_5f4;
                  fVar296 = fStack_5f0;
                  fVar323 = fStack_5ec;
                  fVar191 = fStack_5e8;
                  fVar128 = (float)local_700._0_4_;
                  fVar142 = (float)local_700._4_4_;
                  fVar145 = fStack_6f8;
                  fVar148 = fStack_6f4;
                  fVar258 = fStack_6f0;
                  fVar282 = fStack_6ec;
                  fVar263 = fStack_6e8;
                }
              }
              auVar233 = ZEXT3264(auVar186);
              uVar124 = CONCAT71((int7)(uVar124 >> 8),(byte)uVar124 | (byte)pRVar119);
            }
          }
        }
      }
    }
    if ((uVar124 & 1) != 0) break;
    uVar126 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar133._4_4_ = uVar126;
    auVar133._0_4_ = uVar126;
    auVar133._8_4_ = uVar126;
    auVar133._12_4_ = uVar126;
    auVar183 = vcmpps_avx(local_2f0,auVar133,2);
    uVar120 = vmovmskps_avx(auVar183);
  }
  return uVar118 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }